

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_opt.c
# Opt level: O1

size_t ZSTD_compressBlock_btultra2
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  BYTE **ppBVar1;
  ulong *puVar2;
  seqDef *psVar3;
  ZSTD_match_t *pZVar4;
  ulong uVar5;
  ulong uVar6;
  undefined8 uVar7;
  optState_t *poVar8;
  uint uVar9;
  U32 UVar10;
  U32 UVar11;
  U32 UVar12;
  U32 UVar13;
  BYTE *op;
  ulong uVar14;
  ulong *puVar15;
  ZSTD_optimal_t *pZVar16;
  uint uVar17;
  uint uVar18;
  int iVar19;
  int iVar20;
  long lVar21;
  uint uVar22;
  uint *puVar23;
  bool bVar24;
  int iVar25;
  BYTE *base;
  ulong uVar26;
  uint uVar27;
  ulong uVar28;
  ZSTD_matchState_t *pZVar29;
  ulong *puVar30;
  int iVar31;
  ulong uVar32;
  BYTE *pBVar33;
  ulong uVar34;
  uint uVar35;
  BYTE *pBVar36;
  ulong *puVar37;
  U32 *pUVar38;
  uint uVar39;
  uint uVar40;
  BYTE *pStart;
  ulong *puVar41;
  ZSTD_optimal_t *pZVar42;
  BYTE *pStart_3;
  ulong *puVar43;
  ZSTD_optimal_t *pZVar44;
  ulong *puVar45;
  ulong *puVar46;
  U32 UVar47;
  BYTE *pStart_11;
  ulong uVar48;
  BYTE *pBVar49;
  BYTE *pBVar50;
  ulong *puVar51;
  ZSTD_matchState_t *pZVar52;
  ZSTD_matchState_t *pZVar53;
  BYTE *pBVar54;
  uint uVar55;
  ulong *puVar56;
  ulong uVar57;
  BYTE *pBVar58;
  U32 *pUVar59;
  ulong *puVar60;
  bool bVar61;
  bool bVar62;
  repcodes_t rVar63;
  BYTE *pInLoopLimit;
  U32 dummy32;
  U32 dummy32_5;
  ulong *local_1f0;
  ulong *local_1e8;
  ulong *local_1e0;
  ulong *local_1c0;
  BYTE *local_1b8;
  ulong *local_1b0;
  uint *local_1a8;
  ulong *local_1a0;
  uint *local_198;
  uint *local_190;
  uint *local_180;
  ulong *local_178;
  BYTE *local_168;
  ZSTD_optimal_t *local_150;
  U32 *local_148;
  ulong *local_138;
  ulong *local_128;
  undefined1 local_11c [4];
  undefined8 local_118;
  ZSTD_optimal_t *local_110;
  undefined8 local_108;
  undefined8 local_100;
  U32 local_f8;
  ulong *local_f0;
  ulong *local_e8;
  ulong *local_e0;
  U32 local_d4;
  U32 *local_d0;
  U32 *local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  U32 *local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  optState_t *local_98;
  ZSTD_optimal_t *local_90;
  ZSTD_optimal_t *local_88;
  ulong *local_80;
  int local_74;
  U32 *local_70;
  U32 *local_68;
  U32 *local_60;
  ulong *local_58;
  undefined8 local_50;
  U32 local_48;
  U32 *local_40;
  size_t local_38;
  
  local_b0 = rep;
  local_80 = (ulong *)src;
  if (((ms->opt).litLengthSum == 0) && (seqStore->sequences == seqStore->sequencesStart)) {
    uVar17 = (ms->window).dictLimit;
    if ((uVar17 == (ms->window).lowLimit) &&
       ((0x400 < srcSize && (pBVar36 = (ms->window).base, uVar17 == (int)src - (int)pBVar36)))) {
      local_f8 = rep[2];
      local_100 = *(undefined8 *)rep;
      local_98 = &ms->opt;
      puVar56 = (ulong *)((long)src + (srcSize - 8));
      uVar55 = (ms->cParams).targetLength;
      if (0xffe < uVar55) {
        uVar55 = 0xfff;
      }
      local_a8 = CONCAT44(local_a8._4_4_,uVar55);
      uVar55 = (ms->cParams).minMatch;
      local_110 = (ZSTD_optimal_t *)(ms->opt).matchTable;
      pZVar44 = (ms->opt).priceTable;
      ms->nextToUpdate3 = ms->nextToUpdate;
      local_38 = srcSize;
      ZSTD_rescaleFreqs(local_98,(BYTE *)src,srcSize,2);
      local_1e0 = (ulong *)((ulong)(pBVar36 + uVar17 == (BYTE *)src) + (long)src);
      if (local_1e0 < puVar56) {
        puVar2 = (ulong *)((long)local_80 + local_38);
        uVar55 = (uint)(uVar55 != 3);
        uVar17 = uVar55 + 3;
        local_f0 = (ulong *)(ulong)(uVar55 + 2);
        puVar37 = (ulong *)((long)puVar2 + -7);
        puVar51 = (ulong *)((long)puVar2 + -3);
        local_e8 = (ulong *)((long)puVar2 + -1);
        local_68 = pZVar44->rep;
        local_e0 = (ulong *)(ulong)uVar17;
        local_70 = (U32 *)(ulong)uVar17;
        local_90 = pZVar44 + 1;
        local_128 = local_80;
        local_88 = (ZSTD_optimal_t *)local_80;
        local_138 = local_80;
        local_108 = pZVar44;
        do {
          iVar31 = (int)local_1e0;
          uVar9 = iVar31 - (int)local_128;
          pBVar36 = (ms->window).base;
          uVar17 = ms->nextToUpdate;
          uVar14 = (ulong)uVar17;
          uVar55 = 0;
          if (pBVar36 + uVar14 <= local_1e0) {
            uVar55 = (ms->cParams).minMatch;
            uVar32 = (ulong)uVar55;
            uVar27 = iVar31 - (int)pBVar36;
            while (uVar17 < uVar27) {
              UVar10 = ZSTD_insertBt1(ms,pBVar36 + uVar14,(BYTE *)puVar2,uVar55,0);
              uVar17 = (int)uVar14 + UVar10;
              uVar14 = (ulong)uVar17;
            }
            ms->nextToUpdate = uVar27;
            local_c0._4_4_ = (undefined4)(local_c0 >> 0x20);
            if (uVar55 - 6 < 2) {
              uVar14 = (ulong)(uVar9 == 0);
              uVar17 = (ms->cParams).targetLength;
              if (0xffe < uVar17) {
                uVar17 = 0xfff;
              }
              local_118 = (ulong *)(ms->window).base;
              uVar18 = iVar31 - (int)local_118;
              local_c8 = (U32 *)(*local_1e0 * -0x30e4432340650000 >>
                                (-(char)(ms->cParams).hashLog & 0x3fU));
              pUVar59 = ms->chainTable;
              uVar35 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
              uVar22 = uVar18 - uVar35;
              uVar27 = 0;
              if (uVar18 < uVar35) {
                uVar22 = 0;
              }
              UVar10 = (ms->window).lowLimit;
              uVar32 = (ulong)((uVar35 & uVar18) * 2);
              local_1a8 = pUVar59 + uVar32;
              local_1a0 = (ulong *)(pUVar59 + uVar32 + 1);
              uVar55 = uVar18 - (ms->window).dictLimit;
              local_c0 = CONCAT44(local_c0._4_4_,uVar55);
              iVar19 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
              bVar61 = true;
              local_d0 = ms->hashTable;
              uVar34 = (ulong)local_d0[(long)local_c8];
              iVar31 = uVar18 + 9;
              uVar32 = uVar14 + 3;
              puVar60 = (ulong *)((long)local_1e0 + 4);
              puVar15 = local_f0;
              local_1f0 = (ulong *)((long)local_1e0 + 0xc);
              do {
                uVar40 = (U32)local_100 - 1;
                if (uVar14 != 3) {
                  uVar40 = *(uint *)((long)&local_100 + uVar14 * 4);
                }
                uVar39 = 0;
                if ((uVar40 - 1 < uVar55) &&
                   (uVar39 = 0, (uint)*local_1e0 == *(uint *)((long)local_1e0 - (ulong)uVar40))) {
                  puVar43 = (ulong *)((long)puVar60 - (ulong)uVar40);
                  puVar46 = puVar60;
                  if (puVar60 < puVar37) {
                    uVar57 = *puVar60 ^ *puVar43;
                    uVar26 = 0;
                    if (uVar57 != 0) {
                      for (; (uVar57 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
                      }
                    }
                    uVar26 = uVar26 >> 3 & 0x1fffffff;
                    iVar20 = (int)uVar26;
                    puVar46 = (ulong *)((long)local_1e0 + 0xc);
                    if (*puVar43 == *puVar60) {
                      do {
                        puVar43 = puVar43 + 1;
                        if (puVar37 <= puVar46) goto LAB_0043ca64;
                        uVar57 = *puVar43;
                        uVar48 = *puVar46;
                        uVar28 = 0;
                        if ((uVar48 ^ uVar57) != 0) {
                          for (; ((uVar48 ^ uVar57) >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
                          }
                        }
                        puVar41 = (ulong *)((uVar28 >> 3 & 0x1fffffff) + (long)puVar46);
                        puVar46 = puVar46 + 1;
                        if (uVar57 != uVar48) {
                          uVar26 = (long)puVar41 - (long)puVar60;
                          puVar46 = puVar41;
                        }
                        iVar20 = (int)uVar26;
                      } while (uVar57 == uVar48);
                    }
                  }
                  else {
LAB_0043ca64:
                    if ((puVar46 < puVar51) && ((uint)*puVar43 == (uint)*puVar46)) {
                      puVar46 = (ulong *)((long)puVar46 + 4);
                      puVar43 = (ulong *)((long)puVar43 + 4);
                    }
                    if ((puVar46 < local_e8) && ((short)*puVar43 == (short)*puVar46)) {
                      puVar46 = (ulong *)((long)puVar46 + 2);
                      puVar43 = (ulong *)((long)puVar43 + 2);
                    }
                    if (puVar46 < puVar2) {
                      puVar46 = (ulong *)((long)puVar46 + (ulong)((BYTE)*puVar43 == (BYTE)*puVar46))
                      ;
                    }
                    iVar20 = (int)puVar46 - (int)puVar60;
                  }
                  uVar39 = iVar20 + 4;
                }
                puVar46 = (ulong *)(ulong)uVar39;
                bVar24 = true;
                if (puVar15 < puVar46) {
                  ((ZSTD_match_t *)((long)local_110 + (ulong)uVar27 * 8))->off =
                       (int)uVar14 - (uint)(uVar9 == 0);
                  uVar40 = uVar27 + 1;
                  ((ZSTD_match_t *)((long)local_110 + (ulong)uVar27 * 8))->len = uVar39;
                  bVar62 = (ulong *)((long)local_1e0 + (long)puVar46) != puVar2;
                  bVar24 = bVar62 && uVar39 <= uVar17;
                  local_1f0 = (ulong *)((ulong)local_1f0 & 0xffffffff);
                  puVar15 = puVar46;
                  uVar27 = uVar40;
                  if (!bVar62 || uVar39 > uVar17) {
                    local_1f0 = (ulong *)(ulong)uVar40;
                  }
                }
                if (!bVar24) break;
                uVar14 = uVar14 + 1;
                bVar61 = uVar14 < uVar32;
              } while (bVar61);
              uVar55 = (uint)local_1f0;
              if (!bVar61) {
                local_d0[(long)local_c8] = uVar18;
                local_1f0 = (ulong *)0x0;
                puVar60 = (ulong *)0x0;
                do {
                  bVar61 = iVar19 == 0;
                  iVar19 = iVar19 + -1;
                  uVar55 = uVar27;
                  if ((bVar61) || (uVar17 = (uint)uVar34, uVar17 < UVar10 + (UVar10 == 0))) break;
                  puVar46 = local_1f0;
                  if (puVar60 < local_1f0) {
                    puVar46 = puVar60;
                  }
                  puVar43 = (ulong *)((long)local_1e0 + (long)puVar46);
                  puVar41 = (ulong *)((BYTE *)(uVar34 + (long)local_118) + (long)puVar46);
                  puVar45 = puVar43;
                  if (puVar43 < puVar37) {
                    uVar32 = *puVar43 ^ *puVar41;
                    uVar14 = 0;
                    if (uVar32 != 0) {
                      for (; (uVar32 >> uVar14 & 1) == 0; uVar14 = uVar14 + 1) {
                      }
                    }
                    pBVar36 = (BYTE *)(uVar14 >> 3 & 0x1fffffff);
                    if (*puVar41 == *puVar43) {
                      do {
                        puVar45 = puVar45 + 1;
                        puVar41 = puVar41 + 1;
                        if (puVar37 <= puVar45) goto LAB_0043cc26;
                        uVar32 = *puVar45 ^ *puVar41;
                        uVar14 = 0;
                        if (uVar32 != 0) {
                          for (; (uVar32 >> uVar14 & 1) == 0; uVar14 = uVar14 + 1) {
                          }
                        }
                        pBVar36 = (BYTE *)((long)puVar45 +
                                          ((uVar14 >> 3 & 0x1fffffff) - (long)puVar43));
                      } while (*puVar41 == *puVar45);
                    }
                  }
                  else {
LAB_0043cc26:
                    if ((puVar45 < puVar51) && ((uint)*puVar41 == (uint)*puVar45)) {
                      puVar45 = (ulong *)((long)puVar45 + 4);
                      puVar41 = (ulong *)((long)puVar41 + 4);
                    }
                    if ((puVar45 < local_e8) && ((short)*puVar41 == (short)*puVar45)) {
                      puVar45 = (ulong *)((long)puVar45 + 2);
                      puVar41 = (ulong *)((long)puVar41 + 2);
                    }
                    if (puVar45 < puVar2) {
                      puVar45 = (ulong *)((long)puVar45 + (ulong)((BYTE)*puVar41 == (BYTE)*puVar45))
                      ;
                    }
                    pBVar36 = (BYTE *)((long)puVar45 - (long)puVar43);
                  }
                  puVar46 = (ulong *)(pBVar36 + (long)puVar46);
                  if (puVar15 < puVar46) {
                    iVar20 = uVar17 + (U32)puVar46;
                    if (puVar46 <= (ulong *)(ulong)(iVar31 - uVar17)) {
                      iVar20 = iVar31;
                    }
                    ((ZSTD_match_t *)((long)local_110 + (ulong)uVar27 * 8))->off =
                         (uVar18 + 2) - uVar17;
                    ((ZSTD_match_t *)((long)local_110 + (ulong)uVar27 * 8))->len = (U32)puVar46;
                    uVar27 = uVar27 + 1;
                    bVar61 = false;
                    puVar15 = puVar46;
                    iVar31 = iVar20;
                    if ((puVar46 < (ulong *)0x1001) &&
                       ((ulong *)((long)local_1e0 + (long)puVar46) != puVar2)) goto LAB_0043cce6;
                  }
                  else {
LAB_0043cce6:
                    puVar23 = pUVar59 + (uVar17 & uVar35) * 2;
                    if (((BYTE *)(uVar34 + (long)local_118))[(long)puVar46] <
                        *(byte *)((long)local_1e0 + (long)puVar46)) {
                      *local_1a8 = uVar17;
                      puVar60 = puVar46;
                      if (uVar22 < uVar17) {
                        puVar23 = puVar23 + 1;
                        local_1a8 = puVar23;
LAB_0043cd46:
                        uVar34 = (ulong)*puVar23;
                        bVar61 = true;
                      }
                      else {
                        bVar61 = false;
                        local_1a8 = (uint *)local_11c;
                      }
                    }
                    else {
                      *(uint *)local_1a0 = uVar17;
                      local_1f0 = puVar46;
                      local_1a0 = (ulong *)puVar23;
                      if (uVar22 < uVar17) goto LAB_0043cd46;
                      bVar61 = false;
                      local_1a0 = (ulong *)local_11c;
                    }
                  }
                  uVar55 = uVar27;
                } while (bVar61);
LAB_0043d793:
                *(uint *)local_1a0 = 0;
                *local_1a8 = 0;
                ms->nextToUpdate = iVar31 - 8;
              }
            }
            else if (uVar55 == 5) {
              uVar14 = (ulong)(uVar9 == 0);
              uVar17 = (ms->cParams).targetLength;
              if (0xffe < uVar17) {
                uVar17 = 0xfff;
              }
              local_118 = (ulong *)(ms->window).base;
              uVar35 = iVar31 - (int)local_118;
              local_c8 = (U32 *)(*local_1e0 * -0x30e4432345000000 >>
                                (-(char)(ms->cParams).hashLog & 0x3fU));
              pUVar59 = ms->chainTable;
              uVar22 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
              uVar27 = uVar35 - uVar22;
              if (uVar35 < uVar22) {
                uVar27 = 0;
              }
              UVar10 = (ms->window).lowLimit;
              uVar32 = (ulong)((uVar22 & uVar35) * 2);
              local_1a8 = pUVar59 + uVar32;
              local_1a0 = (ulong *)(pUVar59 + uVar32 + 1);
              uVar18 = uVar35 - (ms->window).dictLimit;
              local_c0 = CONCAT44(local_c0._4_4_,uVar18);
              iVar19 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
              bVar61 = true;
              local_d0 = ms->hashTable;
              uVar34 = (ulong)local_d0[(long)local_c8];
              iVar31 = uVar35 + 9;
              uVar32 = uVar14 + 3;
              puVar60 = (ulong *)((long)local_1e0 + 4);
              puVar15 = local_f0;
              local_1f0 = (ulong *)((long)local_1e0 + 0xc);
              uVar55 = 0;
              do {
                uVar40 = (U32)local_100 - 1;
                if (uVar14 != 3) {
                  uVar40 = *(uint *)((long)&local_100 + uVar14 * 4);
                }
                uVar39 = 0;
                if ((uVar40 - 1 < uVar18) &&
                   (uVar39 = 0, (uint)*local_1e0 == *(uint *)((long)local_1e0 - (ulong)uVar40))) {
                  puVar43 = (ulong *)((long)puVar60 - (ulong)uVar40);
                  puVar46 = puVar60;
                  if (puVar60 < puVar37) {
                    uVar57 = *puVar60 ^ *puVar43;
                    uVar26 = 0;
                    if (uVar57 != 0) {
                      for (; (uVar57 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
                      }
                    }
                    uVar26 = uVar26 >> 3 & 0x1fffffff;
                    iVar20 = (int)uVar26;
                    puVar46 = (ulong *)((long)local_1e0 + 0xc);
                    if (*puVar43 == *puVar60) {
                      do {
                        puVar43 = puVar43 + 1;
                        if (puVar37 <= puVar46) goto LAB_0043cf7a;
                        uVar57 = *puVar43;
                        uVar48 = *puVar46;
                        uVar28 = 0;
                        if ((uVar48 ^ uVar57) != 0) {
                          for (; ((uVar48 ^ uVar57) >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
                          }
                        }
                        puVar41 = (ulong *)((uVar28 >> 3 & 0x1fffffff) + (long)puVar46);
                        puVar46 = puVar46 + 1;
                        if (uVar57 != uVar48) {
                          uVar26 = (long)puVar41 - (long)puVar60;
                          puVar46 = puVar41;
                        }
                        iVar20 = (int)uVar26;
                      } while (uVar57 == uVar48);
                    }
                  }
                  else {
LAB_0043cf7a:
                    if ((puVar46 < puVar51) && ((uint)*puVar43 == (uint)*puVar46)) {
                      puVar46 = (ulong *)((long)puVar46 + 4);
                      puVar43 = (ulong *)((long)puVar43 + 4);
                    }
                    if ((puVar46 < local_e8) && ((short)*puVar43 == (short)*puVar46)) {
                      puVar46 = (ulong *)((long)puVar46 + 2);
                      puVar43 = (ulong *)((long)puVar43 + 2);
                    }
                    if (puVar46 < puVar2) {
                      puVar46 = (ulong *)((long)puVar46 + (ulong)((BYTE)*puVar43 == (BYTE)*puVar46))
                      ;
                    }
                    iVar20 = (int)puVar46 - (int)puVar60;
                  }
                  uVar39 = iVar20 + 4;
                }
                puVar46 = (ulong *)(ulong)uVar39;
                bVar24 = true;
                uVar40 = uVar55;
                if (puVar15 < puVar46) {
                  ((ZSTD_match_t *)((long)local_110 + (ulong)uVar55 * 8))->off =
                       (int)uVar14 - (uint)(uVar9 == 0);
                  uVar40 = uVar55 + 1;
                  ((ZSTD_match_t *)((long)local_110 + (ulong)uVar55 * 8))->len = uVar39;
                  bVar62 = (ulong *)((long)local_1e0 + (long)puVar46) != puVar2;
                  bVar24 = bVar62 && uVar39 <= uVar17;
                  local_1f0 = (ulong *)((ulong)local_1f0 & 0xffffffff);
                  puVar15 = puVar46;
                  if (!bVar62 || uVar39 > uVar17) {
                    local_1f0 = (ulong *)(ulong)uVar40;
                  }
                }
                if (!bVar24) break;
                uVar14 = uVar14 + 1;
                bVar61 = uVar14 < uVar32;
                uVar55 = uVar40;
              } while (bVar61);
              uVar55 = (uint)local_1f0;
              if (!bVar61) {
                local_d0[(long)local_c8] = uVar35;
                local_1f0 = (ulong *)0x0;
                puVar60 = (ulong *)0x0;
                do {
                  bVar61 = iVar19 == 0;
                  iVar19 = iVar19 + -1;
                  uVar55 = uVar40;
                  if ((bVar61) || (uVar17 = (uint)uVar34, uVar17 < UVar10 + (UVar10 == 0))) break;
                  puVar46 = local_1f0;
                  if (puVar60 < local_1f0) {
                    puVar46 = puVar60;
                  }
                  puVar43 = (ulong *)((long)local_1e0 + (long)puVar46);
                  puVar41 = (ulong *)((BYTE *)(uVar34 + (long)local_118) + (long)puVar46);
                  puVar45 = puVar43;
                  if (puVar43 < puVar37) {
                    uVar32 = *puVar43 ^ *puVar41;
                    uVar14 = 0;
                    if (uVar32 != 0) {
                      for (; (uVar32 >> uVar14 & 1) == 0; uVar14 = uVar14 + 1) {
                      }
                    }
                    pBVar36 = (BYTE *)(uVar14 >> 3 & 0x1fffffff);
                    if (*puVar41 == *puVar43) {
                      do {
                        puVar45 = puVar45 + 1;
                        puVar41 = puVar41 + 1;
                        if (puVar37 <= puVar45) goto LAB_0043d12c;
                        uVar32 = *puVar45 ^ *puVar41;
                        uVar14 = 0;
                        if (uVar32 != 0) {
                          for (; (uVar32 >> uVar14 & 1) == 0; uVar14 = uVar14 + 1) {
                          }
                        }
                        pBVar36 = (BYTE *)((long)puVar45 +
                                          ((uVar14 >> 3 & 0x1fffffff) - (long)puVar43));
                      } while (*puVar41 == *puVar45);
                    }
                  }
                  else {
LAB_0043d12c:
                    if ((puVar45 < puVar51) && ((uint)*puVar41 == (uint)*puVar45)) {
                      puVar45 = (ulong *)((long)puVar45 + 4);
                      puVar41 = (ulong *)((long)puVar41 + 4);
                    }
                    if ((puVar45 < local_e8) && ((short)*puVar41 == (short)*puVar45)) {
                      puVar45 = (ulong *)((long)puVar45 + 2);
                      puVar41 = (ulong *)((long)puVar41 + 2);
                    }
                    if (puVar45 < puVar2) {
                      puVar45 = (ulong *)((long)puVar45 + (ulong)((BYTE)*puVar41 == (BYTE)*puVar45))
                      ;
                    }
                    pBVar36 = (BYTE *)((long)puVar45 - (long)puVar43);
                  }
                  puVar46 = (ulong *)(pBVar36 + (long)puVar46);
                  if (puVar15 < puVar46) {
                    iVar20 = uVar17 + (U32)puVar46;
                    if (puVar46 <= (ulong *)(ulong)(iVar31 - uVar17)) {
                      iVar20 = iVar31;
                    }
                    ((ZSTD_match_t *)((long)local_110 + (ulong)uVar40 * 8))->off =
                         (uVar35 + 2) - uVar17;
                    ((ZSTD_match_t *)((long)local_110 + (ulong)uVar40 * 8))->len = (U32)puVar46;
                    uVar40 = uVar40 + 1;
                    bVar61 = false;
                    puVar15 = puVar46;
                    iVar31 = iVar20;
                    if ((puVar46 < (ulong *)0x1001) &&
                       ((ulong *)((long)local_1e0 + (long)puVar46) != puVar2)) goto LAB_0043d1ec;
                  }
                  else {
LAB_0043d1ec:
                    puVar23 = pUVar59 + (uVar17 & uVar22) * 2;
                    if (((BYTE *)(uVar34 + (long)local_118))[(long)puVar46] <
                        *(byte *)((long)local_1e0 + (long)puVar46)) {
                      *local_1a8 = uVar17;
                      puVar60 = puVar46;
                      if (uVar27 < uVar17) {
                        puVar23 = puVar23 + 1;
                        local_1a8 = puVar23;
LAB_0043d24c:
                        uVar34 = (ulong)*puVar23;
                        bVar61 = true;
                      }
                      else {
                        bVar61 = false;
                        local_1a8 = (uint *)local_11c;
                      }
                    }
                    else {
                      *(uint *)local_1a0 = uVar17;
                      local_1f0 = puVar46;
                      local_1a0 = (ulong *)puVar23;
                      if (uVar27 < uVar17) goto LAB_0043d24c;
                      bVar61 = false;
                      local_1a0 = (ulong *)local_11c;
                    }
                  }
                  uVar55 = uVar40;
                } while (bVar61);
                goto LAB_0043d793;
              }
            }
            else if (uVar55 == 3) {
              uVar14 = (ulong)(uVar9 == 0);
              uVar17 = (ms->cParams).targetLength;
              if (0xffe < uVar17) {
                uVar17 = 0xfff;
              }
              pBVar36 = (ms->window).base;
              uVar35 = iVar31 - (int)pBVar36;
              local_c8 = (U32 *)(ulong)((uint)*local_1e0 * -0x61c8864f >>
                                       (-(char)(ms->cParams).hashLog & 0x1fU));
              pUVar59 = ms->chainTable;
              uVar22 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
              uVar27 = uVar35 - uVar22;
              if (uVar35 < uVar22) {
                uVar27 = 0;
              }
              UVar10 = (ms->window).lowLimit;
              uVar18 = UVar10 + (UVar10 == 0);
              uVar34 = (ulong)((uVar22 & uVar35) * 2);
              local_1a0 = (ulong *)(pUVar59 + uVar34);
              local_118 = (ulong *)(pUVar59 + uVar34 + 1);
              UVar10 = (ms->window).dictLimit;
              iVar31 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
              bVar61 = true;
              local_d0 = ms->hashTable;
              UVar11 = ms->hashTable[(long)local_c8];
              local_c0 = CONCAT44(local_c0._4_4_,uVar35 + 9);
              uVar34 = uVar14 + 3;
              puVar60 = (ulong *)((long)local_1e0 + 3);
              uVar26 = 0;
              local_1c0 = local_f0;
              do {
                uVar55 = (U32)local_100 - 1;
                if (uVar14 != 3) {
                  uVar55 = *(uint *)((long)&local_100 + uVar14 * 4);
                }
                puVar15 = (ulong *)0x0;
                if ((uVar55 - 1 < uVar35 - UVar10) &&
                   (((*(uint *)((long)local_1e0 - (ulong)uVar55) ^ (uint)*local_1e0) & 0xffffff) ==
                    0)) {
                  puVar46 = (ulong *)((long)puVar60 - (ulong)uVar55);
                  puVar15 = puVar60;
                  if (puVar60 < puVar37) {
                    uVar48 = *puVar60 ^ *puVar46;
                    uVar57 = 0;
                    if (uVar48 != 0) {
                      for (; (uVar48 >> uVar57 & 1) == 0; uVar57 = uVar57 + 1) {
                      }
                    }
                    uVar57 = uVar57 >> 3 & 0x1fffffff;
                    iVar19 = (int)uVar57;
                    puVar15 = (ulong *)((long)local_1e0 + 0xb);
                    if (*puVar46 == *puVar60) {
                      do {
                        puVar46 = puVar46 + 1;
                        if (puVar37 <= puVar15) goto LAB_0043c6e5;
                        uVar48 = *puVar46;
                        uVar28 = *puVar15;
                        uVar5 = 0;
                        if ((uVar28 ^ uVar48) != 0) {
                          for (; ((uVar28 ^ uVar48) >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
                          }
                        }
                        puVar43 = (ulong *)((uVar5 >> 3 & 0x1fffffff) + (long)puVar15);
                        puVar15 = puVar15 + 1;
                        if (uVar48 != uVar28) {
                          uVar57 = (long)puVar43 - (long)puVar60;
                          puVar15 = puVar43;
                        }
                        iVar19 = (int)uVar57;
                      } while (uVar48 == uVar28);
                    }
                  }
                  else {
LAB_0043c6e5:
                    if ((puVar15 < puVar51) && ((uint)*puVar46 == (uint)*puVar15)) {
                      puVar15 = (ulong *)((long)puVar15 + 4);
                      puVar46 = (ulong *)((long)puVar46 + 4);
                    }
                    if ((puVar15 < local_e8) && ((short)*puVar46 == (short)*puVar15)) {
                      puVar15 = (ulong *)((long)puVar15 + 2);
                      puVar46 = (ulong *)((long)puVar46 + 2);
                    }
                    if (puVar15 < puVar2) {
                      puVar15 = (ulong *)((long)puVar15 + (ulong)((BYTE)*puVar46 == (BYTE)*puVar15))
                      ;
                    }
                    iVar19 = (int)puVar15 - (int)puVar60;
                  }
                  puVar15 = (ulong *)(ulong)(iVar19 + 3);
                }
                uVar55 = (uint)puVar15;
                bVar24 = true;
                uVar57 = uVar26;
                if (local_1c0 < puVar15) {
                  ((ZSTD_match_t *)((long)local_110 + uVar26 * 8))->off =
                       (int)uVar14 - (uint)(uVar9 == 0);
                  uVar57 = (ulong)((int)uVar26 + 1);
                  ((ZSTD_match_t *)((long)local_110 + uVar26 * 8))->len = uVar55;
                  bVar62 = (ulong *)((long)local_1e0 + (long)puVar15) != puVar2;
                  bVar24 = bVar62 && uVar55 <= uVar17;
                  local_1c0 = puVar15;
                  if (!bVar62 || uVar55 > uVar17) {
                    uVar32 = uVar57;
                  }
                }
                uVar55 = (uint)uVar32;
                if (!bVar24) break;
                uVar14 = uVar14 + 1;
                bVar61 = uVar14 < uVar34;
                uVar26 = uVar57;
              } while (bVar61);
              if (!bVar61) {
                if (local_1c0 < (ulong *)0x3) {
                  UVar10 = ZSTD_insertAndFindFirstIndexHash3(ms,(BYTE *)local_1e0);
                  bVar61 = true;
                  if ((uVar18 <= UVar10) && (uVar35 - UVar10 < 0x40000)) {
                    puVar15 = (ulong *)(pBVar36 + UVar10);
                    puVar60 = local_1e0;
                    if (local_1e0 < puVar37) {
                      uVar32 = *local_1e0 ^ *puVar15;
                      uVar14 = 0;
                      if (uVar32 != 0) {
                        for (; (uVar32 >> uVar14 & 1) == 0; uVar14 = uVar14 + 1) {
                        }
                      }
                      puVar46 = (ulong *)(uVar14 >> 3 & 0x1fffffff);
                      if (*puVar15 == *local_1e0) {
                        do {
                          puVar60 = puVar60 + 1;
                          puVar15 = puVar15 + 1;
                          if (puVar37 <= puVar60) goto LAB_0043d7c7;
                          uVar32 = *puVar60 ^ *puVar15;
                          uVar14 = 0;
                          if (uVar32 != 0) {
                            for (; (uVar32 >> uVar14 & 1) == 0; uVar14 = uVar14 + 1) {
                            }
                          }
                          puVar46 = (ulong *)((long)puVar60 +
                                             ((uVar14 >> 3 & 0x1fffffff) - (long)local_1e0));
                        } while (*puVar15 == *puVar60);
                      }
                    }
                    else {
LAB_0043d7c7:
                      if ((puVar60 < puVar51) && ((uint)*puVar15 == (uint)*puVar60)) {
                        puVar60 = (ulong *)((long)puVar60 + 4);
                        puVar15 = (ulong *)((long)puVar15 + 4);
                      }
                      if ((puVar60 < local_e8) && ((short)*puVar15 == (short)*puVar60)) {
                        puVar60 = (ulong *)((long)puVar60 + 2);
                        puVar15 = (ulong *)((long)puVar15 + 2);
                      }
                      if (puVar60 < puVar2) {
                        puVar60 = (ulong *)((long)puVar60 +
                                           (ulong)((BYTE)*puVar15 == (BYTE)*puVar60));
                      }
                      puVar46 = (ulong *)((long)puVar60 - (long)local_1e0);
                    }
                    if ((ulong *)0x2 < puVar46) {
                      local_110->price = (uVar35 - UVar10) + 2;
                      local_110->off = (U32)puVar46;
                      local_1c0 = puVar46;
                      if (((ulong *)(ulong)uVar17 < puVar46) ||
                         (uVar57 = 1, (ulong *)((long)local_1e0 + (long)puVar46) == puVar2)) {
                        ms->nextToUpdate = uVar35 + 1;
                        uVar57 = 1;
                        bVar61 = false;
                        uVar55 = 1;
                      }
                    }
                  }
                  if (!bVar61) goto LAB_0043db16;
                }
                local_d0[(long)local_c8] = uVar35;
                puVar60 = (ulong *)0x0;
                puVar15 = (ulong *)0x0;
                do {
                  uVar55 = (uint)uVar57;
                  bVar61 = iVar31 == 0;
                  iVar31 = iVar31 + -1;
                  iVar19 = (U32)local_c0;
                  if ((bVar61) || (UVar11 < uVar18)) break;
                  puVar46 = puVar60;
                  if (puVar15 < puVar60) {
                    puVar46 = puVar15;
                  }
                  puVar43 = (ulong *)((long)local_1e0 + (long)puVar46);
                  puVar41 = (ulong *)(pBVar36 + UVar11 + (long)puVar46);
                  puVar45 = puVar43;
                  if (puVar43 < puVar37) {
                    uVar32 = *puVar43 ^ *puVar41;
                    uVar14 = 0;
                    if (uVar32 != 0) {
                      for (; (uVar32 >> uVar14 & 1) == 0; uVar14 = uVar14 + 1) {
                      }
                    }
                    pBVar58 = (BYTE *)(uVar14 >> 3 & 0x1fffffff);
                    if (*puVar41 == *puVar43) {
                      do {
                        puVar45 = puVar45 + 1;
                        puVar41 = puVar41 + 1;
                        if (puVar37 <= puVar45) goto LAB_0043d971;
                        uVar32 = *puVar45 ^ *puVar41;
                        uVar14 = 0;
                        if (uVar32 != 0) {
                          for (; (uVar32 >> uVar14 & 1) == 0; uVar14 = uVar14 + 1) {
                          }
                        }
                        pBVar58 = (BYTE *)((long)puVar45 +
                                          ((uVar14 >> 3 & 0x1fffffff) - (long)puVar43));
                      } while (*puVar41 == *puVar45);
                    }
                  }
                  else {
LAB_0043d971:
                    if ((puVar45 < puVar51) && ((uint)*puVar41 == (uint)*puVar45)) {
                      puVar45 = (ulong *)((long)puVar45 + 4);
                      puVar41 = (ulong *)((long)puVar41 + 4);
                    }
                    if ((puVar45 < local_e8) && ((short)*puVar41 == (short)*puVar45)) {
                      puVar45 = (ulong *)((long)puVar45 + 2);
                      puVar41 = (ulong *)((long)puVar41 + 2);
                    }
                    if (puVar45 < puVar2) {
                      puVar45 = (ulong *)((long)puVar45 + (ulong)((BYTE)*puVar41 == (BYTE)*puVar45))
                      ;
                    }
                    pBVar58 = (BYTE *)((long)puVar45 - (long)puVar43);
                  }
                  puVar46 = (ulong *)(pBVar58 + (long)puVar46);
                  if (local_1c0 < puVar46) {
                    iVar19 = (U32)puVar46 + UVar11;
                    if (puVar46 <= (ulong *)(ulong)((U32)local_c0 - UVar11)) {
                      iVar19 = (U32)local_c0;
                    }
                    ((ZSTD_match_t *)((long)local_110 + uVar57 * 8))->off = (uVar35 + 2) - UVar11;
                    ((ZSTD_match_t *)((long)local_110 + uVar57 * 8))->len = (U32)puVar46;
                    uVar57 = (ulong)(uVar55 + 1);
                    bVar61 = false;
                    local_1c0 = puVar46;
                    if ((puVar46 < (ulong *)0x1001) &&
                       ((ulong *)((long)local_1e0 + (long)puVar46) != puVar2)) goto LAB_0043da35;
                  }
                  else {
LAB_0043da35:
                    puVar43 = (ulong *)(pUVar59 + (UVar11 & uVar22) * 2);
                    if ((pBVar36 + UVar11)[(long)puVar46] <
                        *(byte *)((long)local_1e0 + (long)puVar46)) {
                      *(U32 *)local_1a0 = UVar11;
                      puVar15 = puVar46;
                      if (uVar27 < UVar11) {
                        puVar43 = (ulong *)((long)puVar43 + 4);
                        local_1a0 = puVar43;
LAB_0043da8d:
                        UVar11 = (U32)*puVar43;
                        bVar61 = true;
                      }
                      else {
                        bVar61 = false;
                        local_1a0 = (ulong *)local_11c;
                      }
                    }
                    else {
                      *(U32 *)local_118 = UVar11;
                      puVar60 = puVar46;
                      local_118 = puVar43;
                      if (uVar27 < UVar11) goto LAB_0043da8d;
                      bVar61 = false;
                      local_118 = (ulong *)local_11c;
                    }
                  }
                  uVar55 = (uint)uVar57;
                  local_c0 = CONCAT44(local_c0._4_4_,iVar19);
                } while (bVar61);
                *(uint *)local_118 = 0;
                *(uint *)local_1a0 = 0;
                ms->nextToUpdate = iVar19 - 8;
              }
            }
            else {
              uVar14 = (ulong)(uVar9 == 0);
              uVar17 = (ms->cParams).targetLength;
              if (0xffe < uVar17) {
                uVar17 = 0xfff;
              }
              local_118 = (ulong *)(ms->window).base;
              uVar22 = iVar31 - (int)local_118;
              local_c8 = (U32 *)(ulong)((uint)*local_1e0 * -0x61c8864f >>
                                       (-(char)(ms->cParams).hashLog & 0x1fU));
              pUVar59 = ms->chainTable;
              uVar35 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
              uVar27 = uVar22 - uVar35;
              if (uVar22 < uVar35) {
                uVar27 = 0;
              }
              UVar10 = (ms->window).lowLimit;
              uVar32 = (ulong)((uVar35 & uVar22) * 2);
              local_1a8 = pUVar59 + uVar32;
              local_1a0 = (ulong *)(pUVar59 + uVar32 + 1);
              uVar18 = uVar22 - (ms->window).dictLimit;
              local_c0 = CONCAT44(local_c0._4_4_,uVar18);
              iVar19 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
              bVar61 = true;
              local_d0 = ms->hashTable;
              uVar34 = (ulong)local_d0[(long)local_c8];
              iVar31 = uVar22 + 9;
              uVar32 = uVar14 + 3;
              puVar60 = (ulong *)((long)local_1e0 + 4);
              puVar15 = local_f0;
              local_1f0 = (ulong *)((long)local_1e0 + 0xc);
              uVar55 = 0;
              do {
                uVar40 = (U32)local_100 - 1;
                if (uVar14 != 3) {
                  uVar40 = *(uint *)((long)&local_100 + uVar14 * 4);
                }
                uVar39 = 0;
                if ((uVar40 - 1 < uVar18) &&
                   (uVar39 = 0, (uint)*local_1e0 == *(uint *)((long)local_1e0 - (ulong)uVar40))) {
                  puVar43 = (ulong *)((long)puVar60 - (ulong)uVar40);
                  puVar46 = puVar60;
                  if (puVar60 < puVar37) {
                    uVar57 = *puVar60 ^ *puVar43;
                    uVar26 = 0;
                    if (uVar57 != 0) {
                      for (; (uVar57 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
                      }
                    }
                    uVar26 = uVar26 >> 3 & 0x1fffffff;
                    iVar20 = (int)uVar26;
                    puVar46 = (ulong *)((long)local_1e0 + 0xc);
                    if (*puVar43 == *puVar60) {
                      do {
                        puVar43 = puVar43 + 1;
                        if (puVar37 <= puVar46) goto LAB_0043d47a;
                        uVar57 = *puVar43;
                        uVar48 = *puVar46;
                        uVar28 = 0;
                        if ((uVar48 ^ uVar57) != 0) {
                          for (; ((uVar48 ^ uVar57) >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
                          }
                        }
                        puVar41 = (ulong *)((uVar28 >> 3 & 0x1fffffff) + (long)puVar46);
                        puVar46 = puVar46 + 1;
                        if (uVar57 != uVar48) {
                          uVar26 = (long)puVar41 - (long)puVar60;
                          puVar46 = puVar41;
                        }
                        iVar20 = (int)uVar26;
                      } while (uVar57 == uVar48);
                    }
                  }
                  else {
LAB_0043d47a:
                    if ((puVar46 < puVar51) && ((uint)*puVar43 == (uint)*puVar46)) {
                      puVar46 = (ulong *)((long)puVar46 + 4);
                      puVar43 = (ulong *)((long)puVar43 + 4);
                    }
                    if ((puVar46 < local_e8) && ((short)*puVar43 == (short)*puVar46)) {
                      puVar46 = (ulong *)((long)puVar46 + 2);
                      puVar43 = (ulong *)((long)puVar43 + 2);
                    }
                    if (puVar46 < puVar2) {
                      puVar46 = (ulong *)((long)puVar46 + (ulong)((BYTE)*puVar43 == (BYTE)*puVar46))
                      ;
                    }
                    iVar20 = (int)puVar46 - (int)puVar60;
                  }
                  uVar39 = iVar20 + 4;
                }
                puVar46 = (ulong *)(ulong)uVar39;
                bVar24 = true;
                uVar40 = uVar55;
                if (puVar15 < puVar46) {
                  ((ZSTD_match_t *)((long)local_110 + (ulong)uVar55 * 8))->off =
                       (int)uVar14 - (uint)(uVar9 == 0);
                  uVar40 = uVar55 + 1;
                  ((ZSTD_match_t *)((long)local_110 + (ulong)uVar55 * 8))->len = uVar39;
                  bVar62 = (ulong *)((long)local_1e0 + (long)puVar46) != puVar2;
                  bVar24 = bVar62 && uVar39 <= uVar17;
                  local_1f0 = (ulong *)((ulong)local_1f0 & 0xffffffff);
                  puVar15 = puVar46;
                  if (!bVar62 || uVar39 > uVar17) {
                    local_1f0 = (ulong *)(ulong)uVar40;
                  }
                }
                if (!bVar24) break;
                uVar14 = uVar14 + 1;
                bVar61 = uVar14 < uVar32;
                uVar55 = uVar40;
              } while (bVar61);
              uVar55 = (uint)local_1f0;
              if (!bVar61) {
                local_d0[(long)local_c8] = uVar22;
                local_1f0 = (ulong *)0x0;
                puVar60 = (ulong *)0x0;
                uVar55 = uVar40;
                do {
                  bVar61 = iVar19 == 0;
                  iVar19 = iVar19 + -1;
                  if ((bVar61) || (uVar17 = (uint)uVar34, uVar17 < UVar10 + (UVar10 == 0))) break;
                  puVar46 = local_1f0;
                  if (puVar60 < local_1f0) {
                    puVar46 = puVar60;
                  }
                  puVar43 = (ulong *)((long)local_1e0 + (long)puVar46);
                  puVar41 = (ulong *)((BYTE *)(uVar34 + (long)local_118) + (long)puVar46);
                  puVar45 = puVar43;
                  if (puVar43 < puVar37) {
                    uVar32 = *puVar43 ^ *puVar41;
                    uVar14 = 0;
                    if (uVar32 != 0) {
                      for (; (uVar32 >> uVar14 & 1) == 0; uVar14 = uVar14 + 1) {
                      }
                    }
                    pBVar36 = (BYTE *)(uVar14 >> 3 & 0x1fffffff);
                    if (*puVar41 == *puVar43) {
                      do {
                        puVar45 = puVar45 + 1;
                        puVar41 = puVar41 + 1;
                        if (puVar37 <= puVar45) goto LAB_0043d62d;
                        uVar32 = *puVar45 ^ *puVar41;
                        uVar14 = 0;
                        if (uVar32 != 0) {
                          for (; (uVar32 >> uVar14 & 1) == 0; uVar14 = uVar14 + 1) {
                          }
                        }
                        pBVar36 = (BYTE *)((long)puVar45 +
                                          ((uVar14 >> 3 & 0x1fffffff) - (long)puVar43));
                      } while (*puVar41 == *puVar45);
                    }
                  }
                  else {
LAB_0043d62d:
                    if ((puVar45 < puVar51) && ((uint)*puVar41 == (uint)*puVar45)) {
                      puVar45 = (ulong *)((long)puVar45 + 4);
                      puVar41 = (ulong *)((long)puVar41 + 4);
                    }
                    if ((puVar45 < local_e8) && ((short)*puVar41 == (short)*puVar45)) {
                      puVar45 = (ulong *)((long)puVar45 + 2);
                      puVar41 = (ulong *)((long)puVar41 + 2);
                    }
                    if (puVar45 < puVar2) {
                      puVar45 = (ulong *)((long)puVar45 + (ulong)((BYTE)*puVar41 == (BYTE)*puVar45))
                      ;
                    }
                    pBVar36 = (BYTE *)((long)puVar45 - (long)puVar43);
                  }
                  puVar46 = (ulong *)(pBVar36 + (long)puVar46);
                  if (puVar15 < puVar46) {
                    iVar20 = uVar17 + (U32)puVar46;
                    if (puVar46 <= (ulong *)(ulong)(iVar31 - uVar17)) {
                      iVar20 = iVar31;
                    }
                    ((ZSTD_match_t *)((long)local_110 + (ulong)uVar55 * 8))->off =
                         (uVar22 + 2) - uVar17;
                    ((ZSTD_match_t *)((long)local_110 + (ulong)uVar55 * 8))->len = (U32)puVar46;
                    uVar55 = uVar55 + 1;
                    bVar61 = false;
                    puVar15 = puVar46;
                    iVar31 = iVar20;
                    if ((puVar46 < (ulong *)0x1001) &&
                       ((ulong *)((long)local_1e0 + (long)puVar46) != puVar2)) goto LAB_0043d6ed;
                  }
                  else {
LAB_0043d6ed:
                    puVar23 = pUVar59 + (uVar17 & uVar35) * 2;
                    if (((BYTE *)(uVar34 + (long)local_118))[(long)puVar46] <
                        *(byte *)((long)local_1e0 + (long)puVar46)) {
                      *local_1a8 = uVar17;
                      puVar60 = puVar46;
                      if (uVar27 < uVar17) {
                        puVar23 = puVar23 + 1;
                        local_1a8 = puVar23;
LAB_0043d74d:
                        uVar34 = (ulong)*puVar23;
                        bVar61 = true;
                      }
                      else {
                        bVar61 = false;
                        local_1a8 = (uint *)local_11c;
                      }
                    }
                    else {
                      *(uint *)local_1a0 = uVar17;
                      local_1f0 = puVar46;
                      local_1a0 = (ulong *)puVar23;
                      if (uVar27 < uVar17) goto LAB_0043d74d;
                      bVar61 = false;
                      local_1a0 = (ulong *)local_11c;
                    }
                  }
                } while (bVar61);
                goto LAB_0043d793;
              }
            }
          }
LAB_0043db16:
          pZVar44 = local_108;
          local_168 = (BYTE *)srcSize;
          if (uVar55 == 0) {
            local_1e0 = (ulong *)((long)local_1e0 + 1);
            uVar14 = 0;
            iVar31 = 2;
          }
          else {
            local_68[2] = local_f8;
            *(undefined8 *)local_68 = local_100;
            local_108->mlen = 0;
            local_108->litlen = uVar9;
            iVar31 = ZSTD_literalsContribution((BYTE *)local_128,uVar9,local_98,2);
            pZVar44->price = iVar31;
            uVar17 = ((ZSTD_match_t *)((long)local_110 + (ulong)(uVar55 - 1) * 8))->len;
            if ((uint)local_a8 < uVar17) {
              local_d4 = ((ZSTD_match_t *)((long)local_110 + (ulong)(uVar55 - 1) * 8))->off;
              uVar55 = uVar17 + uVar9;
              local_168 = (BYTE *)0x0;
              iVar31 = 7;
              local_138 = (ulong *)(ulong)uVar17;
              local_88 = (ZSTD_optimal_t *)(ulong)uVar9;
            }
            else {
              UVar10 = ZSTD_litLengthPrice(0,local_98,2);
              pUVar59 = (U32 *)0x1;
              pZVar16 = local_90;
              do {
                pZVar16->price = 0x40000000;
                pUVar59 = (U32 *)((long)pUVar59 + 1);
                pZVar16 = pZVar16 + 1;
              } while (local_70 != pUVar59);
              uVar14 = 0;
              do {
                UVar11 = ((ZSTD_match_t *)((long)local_110 + uVar14 * 8))->off;
                uVar17 = ((ZSTD_match_t *)((long)local_110 + uVar14 * 8))->len;
                rVar63 = ZSTD_updateRep((U32 *)&local_100,UVar11,(uint)(uVar9 == 0));
                if ((uint)pUVar59 <= uVar17) {
                  uVar27 = 0x1f;
                  if (UVar11 + 1 != 0) {
                    for (; UVar11 + 1 >> uVar27 == 0; uVar27 = uVar27 - 1) {
                    }
                  }
                  uVar22 = (uint)pUVar59 * 0x100 - 0x200;
                  do {
                    UVar12 = (U32)pUVar59;
                    if ((ms->opt).priceType == zop_predef) {
                      iVar19 = 0x1f;
                      if (UVar12 - 2 != 0) {
                        for (; UVar12 - 2 >> iVar19 == 0; iVar19 = iVar19 + -1) {
                        }
                      }
                      iVar19 = (iVar19 + uVar27) * 0x100 + (uVar22 >> ((byte)iVar19 & 0x1f)) +
                               0x1000;
                    }
                    else {
                      uVar18 = UVar12 - 3;
                      uVar35 = (ms->opt).offCodeFreq[uVar27] + 1;
                      iVar19 = 0x1f;
                      if (uVar35 != 0) {
                        for (; uVar35 >> iVar19 == 0; iVar19 = iVar19 + -1) {
                        }
                      }
                      if (uVar18 < 0x80) {
                        uVar18 = (uint)(byte)(&ZSTD_MLcode_ML_Code)[uVar18];
                      }
                      else {
                        uVar40 = 0x1f;
                        if (uVar18 != 0) {
                          for (; uVar18 >> uVar40 == 0; uVar40 = uVar40 - 1) {
                          }
                        }
                        uVar18 = (uVar40 ^ 0xffffffe0) + 0x44;
                      }
                      uVar40 = (ms->opt).matchLengthFreq[uVar18] + 1;
                      iVar20 = 0x1f;
                      if (uVar40 != 0) {
                        for (; uVar40 >> iVar20 == 0; iVar20 = iVar20 + -1) {
                        }
                      }
                      iVar19 = (((ms->opt).offCodeSumBasePrice + (ms->opt).matchLengthSumBasePrice)
                               - ((uVar35 * 0x100 >> ((byte)iVar19 & 0x1f)) +
                                 (uVar40 * 0x100 >> ((byte)iVar20 & 0x1f)))) +
                               ((ML_bits[uVar18] + uVar27) - (iVar19 + iVar20)) * 0x100 + 0x33;
                      pZVar44 = local_108;
                    }
                    uVar32 = (ulong)pUVar59 & 0xffffffff;
                    pZVar44[uVar32].mlen = UVar12;
                    pZVar44[uVar32].off = UVar11;
                    pZVar44[uVar32].litlen = uVar9;
                    pZVar44[uVar32].price = iVar19 + UVar10 + iVar31;
                    *(long *)pZVar44[uVar32].rep = rVar63.rep._0_8_;
                    pZVar44[uVar32].rep[2] = rVar63.rep[2];
                    pUVar59 = (U32 *)(ulong)(UVar12 + 1);
                    uVar22 = uVar22 + 0x100;
                  } while (UVar12 + 1 <= uVar17);
                }
                uVar14 = uVar14 + 1;
              } while (uVar14 != uVar55 + (uVar55 == 0));
              uVar55 = (int)pUVar59 - 1;
              iVar31 = 0;
            }
            uVar14 = (ulong)uVar55;
          }
          if (iVar31 == 7) {
LAB_0043fa65:
            uVar55 = (int)local_168 + 1;
            pZVar44[uVar55].price = local_74;
            pZVar44[uVar55].off = local_d4;
            pZVar44[uVar55].mlen = (U32)local_138;
            pZVar44[uVar55].litlen = (U32)local_88;
            *(undefined8 *)pZVar44[uVar55].rep = local_50;
            pZVar44[uVar55].rep[2] = local_48;
            uVar14 = (ulong)local_168 & 0xffffffff;
            uVar32 = (ulong)local_168 & 0xffffffff;
            uVar17 = uVar55;
            if ((int)local_168 != 0) {
              do {
                uVar9 = (uint)uVar32;
                uVar27 = pZVar44[uVar32].litlen + pZVar44[uVar32].mlen;
                uVar17 = (uint)uVar14;
                pZVar16 = pZVar44 + uVar32;
                iVar31 = pZVar16->price;
                UVar11 = pZVar16->off;
                UVar12 = pZVar16->mlen;
                UVar13 = pZVar16->litlen;
                pZVar16 = pZVar44 + uVar32;
                UVar10 = pZVar16->rep[0];
                uVar7 = *(undefined8 *)(&pZVar16->litlen + 2);
                pZVar42 = pZVar44 + uVar14;
                pZVar42->litlen = pZVar16->litlen;
                pZVar42->rep[0] = UVar10;
                *(undefined8 *)(&pZVar42->litlen + 2) = uVar7;
                pZVar16 = pZVar44 + uVar14;
                pZVar16->price = iVar31;
                pZVar16->off = UVar11;
                pZVar16->mlen = UVar12;
                pZVar16->litlen = UVar13;
                uVar14 = (ulong)(uVar17 - 1);
                uVar32 = (ulong)(uVar9 - uVar27);
                if (uVar27 > uVar9) {
                  uVar32 = 0;
                }
              } while (uVar27 <= uVar9 && uVar9 - uVar27 != 0);
            }
            puVar60 = local_1e0;
            if (uVar17 <= uVar55) {
              local_1e0._0_4_ = local_100._4_4_;
              UVar10 = (U32)local_100;
              do {
                uVar9 = pZVar44[uVar17].litlen;
                uVar14 = (ulong)uVar9;
                UVar11 = pZVar44[uVar17].mlen;
                if (UVar11 == 0) {
                  puVar60 = (ulong *)(uVar14 + (long)local_128);
                }
                else {
                  uVar27 = pZVar44[uVar17].off;
                  if (uVar27 < 3) {
                    uVar22 = (uVar14 == 0) + uVar27;
                    UVar12 = UVar10;
                    if (uVar22 != 0) {
                      if (uVar22 == 3) {
                        UVar12 = UVar10 - 1;
                      }
                      else {
                        UVar12 = *(U32 *)((long)&local_100 + (ulong)uVar22 * 4);
                      }
                      if (uVar22 != 1) {
                        local_f8 = (U32)local_1e0;
                      }
                      goto LAB_0043fbd1;
                    }
                  }
                  else {
                    local_f8 = (U32)local_1e0;
                    UVar12 = uVar27 - 2;
LAB_0043fbd1:
                    local_100 = CONCAT44(UVar10,UVar12);
                    local_1e0._0_4_ = UVar10;
                  }
                  UVar10 = UVar12;
                  ZSTD_updateStats(local_98,uVar9,(BYTE *)local_128,uVar27,UVar11);
                  puVar15 = (ulong *)seqStore->lit;
                  puVar60 = (ulong *)((long)puVar15 + uVar14);
                  puVar46 = local_128;
                  do {
                    *puVar15 = *puVar46;
                    puVar15 = puVar15 + 1;
                    puVar46 = puVar46 + 1;
                  } while (puVar15 < puVar60);
                  seqStore->lit = seqStore->lit + uVar14;
                  if (0xffff < uVar9) {
                    seqStore->longLengthID = 1;
                    seqStore->longLengthPos =
                         (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart)
                              >> 3);
                  }
                  psVar3 = seqStore->sequences;
                  psVar3->litLength = (U16)uVar9;
                  psVar3->offset = uVar27 + 1;
                  if (0xffff < UVar11 - 3) {
                    seqStore->longLengthID = 2;
                    seqStore->longLengthPos =
                         (U32)((ulong)((long)psVar3 - (long)seqStore->sequencesStart) >> 3);
                  }
                  psVar3->matchLength = (U16)(UVar11 - 3);
                  seqStore->sequences = psVar3 + 1;
                  puVar60 = (ulong *)((long)local_128 + (ulong)(UVar11 + uVar9));
                  pZVar44 = local_108;
                  local_128 = puVar60;
                }
                uVar17 = uVar17 + 1;
              } while (uVar17 <= uVar55);
            }
            ZSTD_setBasePrices(local_98,2);
            local_1e0 = puVar60;
          }
          else if (iVar31 == 0) {
            if ((int)uVar14 != 0) {
              local_168 = (BYTE *)0x1;
              do {
                poVar8 = local_98;
                iVar31 = (int)local_168;
                pZVar16 = pZVar44 + (iVar31 - 1U);
                UVar10 = 1;
                if (pZVar44[iVar31 - 1U].mlen == 0) {
                  UVar10 = pZVar16->litlen + 1;
                }
                puVar60 = (ulong *)((long)local_1e0 + (long)local_168);
                iVar19 = 0x600;
                if ((ms->opt).priceType != zop_predef) {
                  uVar17 = (ms->opt).litFreq[*(byte *)((long)puVar60 + -1)] + 1;
                  iVar19 = 0x1f;
                  if (uVar17 != 0) {
                    for (; uVar17 >> iVar19 == 0; iVar19 = iVar19 + -1) {
                    }
                  }
                  iVar19 = (ms->opt).litSumBasePrice -
                           (iVar19 * 0x100 + (uVar17 * 0x100 >> ((byte)iVar19 & 0x1f)));
                }
                iVar20 = pZVar16->price;
                UVar11 = ZSTD_litLengthPrice(UVar10,local_98,2);
                UVar12 = ZSTD_litLengthPrice(UVar10 - 1,poVar8,2);
                iVar19 = (UVar11 + iVar19 + iVar20) - UVar12;
                pZVar42 = local_108 + (long)local_168;
                if (iVar19 <= local_108[(long)local_168].price) {
                  pZVar42->off = 0;
                  pZVar42->mlen = 0;
                  pZVar42->litlen = UVar10;
                  pZVar42->price = iVar19;
                  *(undefined8 *)pZVar42->rep = *(undefined8 *)pZVar16->rep;
                  pZVar42->rep[2] = pZVar16->rep[2];
                }
                uVar17 = 0x13;
                pZVar44 = local_108;
                if (puVar60 <= puVar56) {
                  if (iVar31 == (int)uVar14) {
                    uVar17 = 0x11;
                  }
                  else {
                    UVar10 = pZVar42->mlen;
                    local_c0 = local_c0 & 0xffffffff00000000;
                    local_1c0 = (ulong *)0x0;
                    local_c8 = (U32 *)CONCAT71(local_c8._1_7_,UVar10 != 0);
                    if (UVar10 == 0) {
                      local_1c0 = (ulong *)(ulong)pZVar42->litlen;
                    }
                    local_d0 = (U32 *)CONCAT44(local_d0._4_4_,pZVar42->price);
                    UVar11 = ZSTD_litLengthPrice(0,local_98,2);
                    pBVar36 = (ms->window).base;
                    uVar17 = ms->nextToUpdate;
                    uVar32 = (ulong)uVar17;
                    uVar55 = 0;
                    if (pBVar36 + uVar32 <= puVar60) {
                      UVar12 = (ms->cParams).minMatch;
                      iVar19 = (int)puVar60;
                      uVar55 = iVar19 - (int)pBVar36;
                      while (uVar17 < uVar55) {
                        UVar13 = ZSTD_insertBt1(ms,pBVar36 + uVar32,(BYTE *)puVar2,UVar12,0);
                        uVar17 = (int)uVar32 + UVar13;
                        uVar32 = (ulong)uVar17;
                      }
                      ms->nextToUpdate = uVar55;
                      local_118._4_4_ = (undefined4)((ulong)local_118 >> 0x20);
                      local_1e8 = local_f0;
                      if (UVar12 - 6 < 2) {
                        uVar32 = (ulong)(UVar10 != 0);
                        uVar17 = (ms->cParams).targetLength;
                        if (0xffe < uVar17) {
                          uVar17 = 0xfff;
                        }
                        local_118 = (ulong *)CONCAT44(local_118._4_4_,uVar17);
                        pBVar36 = (ms->window).base;
                        uVar35 = iVar19 - (int)pBVar36;
                        local_60 = (U32 *)(*puVar60 * -0x30e4432340650000 >>
                                          (-(char)(ms->cParams).hashLog & 0x3fU));
                        pUVar59 = ms->chainTable;
                        uVar22 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
                        uVar27 = uVar35 - uVar22;
                        uVar9 = 0;
                        if (uVar35 < uVar22) {
                          uVar27 = 0;
                        }
                        UVar12 = (ms->window).lowLimit;
                        uVar34 = (ulong)((uVar22 & uVar35) * 2);
                        local_180 = pUVar59 + uVar34;
                        local_198 = pUVar59 + uVar34 + 1;
                        iVar20 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
                        uVar18 = uVar35 - (ms->window).dictLimit;
                        bVar61 = true;
                        local_40 = ms->hashTable;
                        uVar57 = (ulong)local_40[(long)local_60];
                        local_a0 = (ulong)uVar35;
                        iVar19 = uVar35 + 9;
                        uVar34 = uVar32 + 3;
                        puVar15 = (ulong *)((long)puVar60 + 4);
                        local_58 = (ulong *)((long)puVar60 + 0xc);
                        uVar26 = (ulong)local_b8 >> 0x20;
                        local_b8 = (ulong *)CONCAT44((int)uVar26,uVar18);
                        do {
                          if (uVar32 == 3) {
                            UVar13 = pZVar42->rep[0] - 1;
                          }
                          else {
                            UVar13 = pZVar42->rep[uVar32];
                          }
                          uVar40 = 0;
                          if ((UVar13 - 1 < uVar18) &&
                             (uVar40 = 0, (uint)*puVar60 == *(uint *)((long)puVar60 - (ulong)UVar13)
                             )) {
                            puVar43 = (ulong *)((long)puVar15 - (ulong)UVar13);
                            puVar46 = puVar15;
                            if (puVar15 < puVar37) {
                              uVar48 = *puVar15 ^ *puVar43;
                              uVar26 = 0;
                              if (uVar48 != 0) {
                                for (; (uVar48 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
                                }
                              }
                              uVar26 = uVar26 >> 3 & 0x1fffffff;
                              iVar25 = (int)uVar26;
                              puVar46 = (ulong *)((long)puVar60 + 0xc);
                              if (*puVar43 == *puVar15) {
                                do {
                                  puVar43 = puVar43 + 1;
                                  if (puVar37 <= puVar46) goto LAB_0043e5ba;
                                  uVar48 = *puVar43;
                                  uVar28 = *puVar46;
                                  uVar5 = 0;
                                  if ((uVar28 ^ uVar48) != 0) {
                                    for (; ((uVar28 ^ uVar48) >> uVar5 & 1) == 0; uVar5 = uVar5 + 1)
                                    {
                                    }
                                  }
                                  puVar41 = (ulong *)((uVar5 >> 3 & 0x1fffffff) + (long)puVar46);
                                  puVar46 = puVar46 + 1;
                                  if (uVar48 != uVar28) {
                                    uVar26 = (long)puVar41 - (long)puVar15;
                                    puVar46 = puVar41;
                                  }
                                  iVar25 = (int)uVar26;
                                } while (uVar48 == uVar28);
                              }
                            }
                            else {
LAB_0043e5ba:
                              if ((puVar46 < puVar51) && ((uint)*puVar43 == (uint)*puVar46)) {
                                puVar46 = (ulong *)((long)puVar46 + 4);
                                puVar43 = (ulong *)((long)puVar43 + 4);
                              }
                              if ((puVar46 < local_e8) && ((short)*puVar43 == (short)*puVar46)) {
                                puVar46 = (ulong *)((long)puVar46 + 2);
                                puVar43 = (ulong *)((long)puVar43 + 2);
                              }
                              if (puVar46 < puVar2) {
                                puVar46 = (ulong *)((long)puVar46 +
                                                   (ulong)((BYTE)*puVar43 == (BYTE)*puVar46));
                              }
                              iVar25 = (int)puVar46 - (int)puVar15;
                            }
                            uVar40 = iVar25 + 4;
                          }
                          puVar46 = (ulong *)(ulong)uVar40;
                          bVar24 = true;
                          if (local_1e8 < puVar46) {
                            ((ZSTD_match_t *)((long)local_110 + (ulong)uVar9 * 8))->off =
                                 (int)uVar32 - (uint)(UVar10 != 0);
                            uVar39 = uVar9 + 1;
                            ((ZSTD_match_t *)((long)local_110 + (ulong)uVar9 * 8))->len = uVar40;
                            bVar62 = (ulong *)((long)puVar60 + (long)puVar46) != puVar2;
                            bVar24 = bVar62 && uVar40 <= uVar17;
                            local_1e8 = puVar46;
                            uVar9 = uVar39;
                            if (!bVar62 || uVar40 > uVar17) {
                              uVar55 = uVar39;
                            }
                          }
                          if (!bVar24) break;
                          uVar32 = uVar32 + 1;
                          bVar61 = uVar32 < uVar34;
                        } while (bVar61);
                        if (!bVar61) {
                          local_40[(long)local_60] = uVar35;
                          local_a0 = (ulong)(uVar35 + 2);
                          local_178 = (ulong *)0x0;
                          uVar32 = (ulong)uVar9;
                          puVar15 = (ulong *)0x0;
                          do {
                            uVar55 = (uint)uVar32;
                            bVar61 = iVar20 == 0;
                            iVar20 = iVar20 + -1;
                            if ((bVar61) || (uVar17 = (uint)uVar57, uVar17 < UVar12 + (UVar12 == 0))
                               ) break;
                            puVar46 = local_178;
                            if (puVar15 < local_178) {
                              puVar46 = puVar15;
                            }
                            pBVar58 = pBVar36 + uVar57;
                            puVar43 = (ulong *)((long)puVar60 + (long)puVar46);
                            puVar41 = (ulong *)(pBVar58 + (long)puVar46);
                            puVar45 = puVar43;
                            if (puVar43 < puVar37) {
                              uVar26 = *puVar43 ^ *puVar41;
                              uVar34 = 0;
                              if (uVar26 != 0) {
                                for (; (uVar26 >> uVar34 & 1) == 0; uVar34 = uVar34 + 1) {
                                }
                              }
                              pBVar50 = (BYTE *)(uVar34 >> 3 & 0x1fffffff);
                              if (*puVar41 == *puVar43) {
                                do {
                                  puVar45 = puVar45 + 1;
                                  puVar41 = puVar41 + 1;
                                  if (puVar37 <= puVar45) goto LAB_0043e77b;
                                  uVar26 = *puVar45 ^ *puVar41;
                                  uVar34 = 0;
                                  if (uVar26 != 0) {
                                    for (; (uVar26 >> uVar34 & 1) == 0; uVar34 = uVar34 + 1) {
                                    }
                                  }
                                  pBVar50 = (BYTE *)((long)puVar45 +
                                                    ((uVar34 >> 3 & 0x1fffffff) - (long)puVar43));
                                } while (*puVar41 == *puVar45);
                              }
                            }
                            else {
LAB_0043e77b:
                              if ((puVar45 < puVar51) && ((uint)*puVar41 == (uint)*puVar45)) {
                                puVar45 = (ulong *)((long)puVar45 + 4);
                                puVar41 = (ulong *)((long)puVar41 + 4);
                              }
                              if ((puVar45 < local_e8) && ((short)*puVar41 == (short)*puVar45)) {
                                puVar45 = (ulong *)((long)puVar45 + 2);
                                puVar41 = (ulong *)((long)puVar41 + 2);
                              }
                              if (puVar45 < puVar2) {
                                puVar45 = (ulong *)((long)puVar45 +
                                                   (ulong)((BYTE)*puVar41 == (BYTE)*puVar45));
                              }
                              pBVar50 = (BYTE *)((long)puVar45 - (long)puVar43);
                            }
                            puVar46 = (ulong *)(pBVar50 + (long)puVar46);
                            if (local_1e8 < puVar46) {
                              iVar25 = uVar17 + (U32)puVar46;
                              if (puVar46 <= (ulong *)(ulong)(iVar19 - uVar17)) {
                                iVar25 = iVar19;
                              }
                              ((ZSTD_match_t *)((long)local_110 + uVar32 * 8))->off =
                                   (int)local_a0 - uVar17;
                              ((ZSTD_match_t *)((long)local_110 + uVar32 * 8))->len = (U32)puVar46;
                              uVar32 = (ulong)(uVar55 + 1);
                              iVar19 = iVar25;
                              local_1e8 = puVar46;
                              if ((puVar46 < (ulong *)0x1001) &&
                                 ((ulong *)((long)puVar60 + (long)puVar46) != puVar2))
                              goto LAB_0043e842;
LAB_0043e8d0:
                              bVar61 = false;
                              puVar46 = puVar15;
                            }
                            else {
LAB_0043e842:
                              puVar23 = pUVar59 + (uVar17 & uVar22) * 2;
                              if (*(byte *)((long)puVar60 + (long)puVar46) <= pBVar58[(long)puVar46]
                                 ) {
                                *local_198 = uVar17;
                                local_198 = puVar23;
                                local_178 = puVar46;
                                if (uVar27 < uVar17) goto LAB_0043e89f;
                                local_198 = (uint *)local_11c;
                                goto LAB_0043e8d0;
                              }
                              *local_180 = uVar17;
                              if (uVar27 < uVar17) {
                                puVar23 = puVar23 + 1;
                                puVar15 = puVar46;
                                local_180 = puVar23;
LAB_0043e89f:
                                uVar57 = (ulong)*puVar23;
                                bVar61 = true;
                                puVar46 = puVar15;
                              }
                              else {
                                bVar61 = false;
                                local_180 = (uint *)local_11c;
                              }
                            }
                            uVar55 = (uint)uVar32;
                            puVar15 = puVar46;
                          } while (bVar61);
LAB_0043f306:
                          *local_198 = 0;
LAB_0043f329:
                          *local_180 = 0;
                          ms->nextToUpdate = iVar19 - 8;
                        }
                      }
                      else if (UVar12 == 5) {
                        uVar32 = (ulong)(UVar10 != 0);
                        uVar17 = (ms->cParams).targetLength;
                        if (0xffe < uVar17) {
                          uVar17 = 0xfff;
                        }
                        pBVar36 = (ms->window).base;
                        uVar35 = iVar19 - (int)pBVar36;
                        local_58 = (ulong *)(*puVar60 * -0x30e4432345000000 >>
                                            (-(char)(ms->cParams).hashLog & 0x3fU));
                        pUVar59 = ms->chainTable;
                        uVar22 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
                        uVar27 = uVar35 - uVar22;
                        uVar9 = 0;
                        if (uVar35 < uVar22) {
                          uVar27 = 0;
                        }
                        UVar10 = (ms->window).lowLimit;
                        uVar34 = (ulong)((uVar22 & uVar35) * 2);
                        local_198 = pUVar59 + uVar34;
                        local_190 = pUVar59 + uVar34 + 1;
                        iVar20 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
                        uVar55 = uVar35 - (ms->window).dictLimit;
                        local_118 = (ulong *)-uVar32;
                        bVar61 = true;
                        local_60 = ms->hashTable;
                        uVar57 = (ulong)local_60[(long)local_58];
                        iVar19 = uVar35 + 9;
                        uVar34 = uVar32 + 3;
                        puVar46 = (ulong *)((long)puVar60 + 4);
                        local_b8 = (ulong *)((long)puVar60 + 0xc);
                        uVar26 = local_a0 >> 0x20;
                        local_a0 = CONCAT44((int)uVar26,uVar55);
                        puVar15 = local_58;
                        do {
                          if (uVar32 == 3) {
                            UVar12 = pZVar42->rep[0] - 1;
                          }
                          else {
                            UVar12 = pZVar42->rep[uVar32];
                          }
                          uVar18 = 0;
                          if ((UVar12 - 1 < uVar55) &&
                             (uVar18 = 0, (uint)*puVar60 == *(uint *)((long)puVar60 - (ulong)UVar12)
                             )) {
                            puVar41 = (ulong *)((long)puVar46 - (ulong)UVar12);
                            puVar43 = puVar46;
                            if (puVar46 < puVar37) {
                              uVar48 = *puVar46 ^ *puVar41;
                              uVar26 = 0;
                              if (uVar48 != 0) {
                                for (; (uVar48 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
                                }
                              }
                              uVar26 = uVar26 >> 3 & 0x1fffffff;
                              iVar25 = (int)uVar26;
                              puVar43 = (ulong *)((long)puVar60 + 0xc);
                              if (*puVar41 == *puVar46) {
                                do {
                                  puVar41 = puVar41 + 1;
                                  if (puVar37 <= puVar43) goto LAB_0043eadf;
                                  uVar48 = *puVar41;
                                  uVar28 = *puVar43;
                                  uVar5 = 0;
                                  if ((uVar28 ^ uVar48) != 0) {
                                    for (; ((uVar28 ^ uVar48) >> uVar5 & 1) == 0; uVar5 = uVar5 + 1)
                                    {
                                    }
                                  }
                                  puVar45 = (ulong *)((uVar5 >> 3 & 0x1fffffff) + (long)puVar43);
                                  puVar43 = puVar43 + 1;
                                  if (uVar48 != uVar28) {
                                    uVar26 = (long)puVar45 - (long)puVar46;
                                    puVar43 = puVar45;
                                  }
                                  iVar25 = (int)uVar26;
                                } while (uVar48 == uVar28);
                              }
                            }
                            else {
LAB_0043eadf:
                              if ((puVar43 < puVar51) && ((uint)*puVar41 == (uint)*puVar43)) {
                                puVar43 = (ulong *)((long)puVar43 + 4);
                                puVar41 = (ulong *)((long)puVar41 + 4);
                              }
                              if ((puVar43 < local_e8) && ((short)*puVar41 == (short)*puVar43)) {
                                puVar43 = (ulong *)((long)puVar43 + 2);
                                puVar41 = (ulong *)((long)puVar41 + 2);
                              }
                              if (puVar43 < puVar2) {
                                puVar43 = (ulong *)((long)puVar43 +
                                                   (ulong)((BYTE)*puVar41 == (BYTE)*puVar43));
                              }
                              iVar25 = (int)puVar43 - (int)puVar46;
                            }
                            uVar18 = iVar25 + 4;
                          }
                          puVar43 = (ulong *)(ulong)uVar18;
                          bVar24 = true;
                          if (local_1e8 < puVar43) {
                            ((ZSTD_match_t *)((long)local_110 + (ulong)uVar9 * 8))->off =
                                 (int)local_118 + (int)uVar32;
                            uVar40 = uVar9 + 1;
                            ((ZSTD_match_t *)((long)local_110 + (ulong)uVar9 * 8))->len = uVar18;
                            bVar62 = (ulong *)((long)puVar60 + (long)puVar43) != puVar2;
                            bVar24 = bVar62 && uVar18 <= uVar17;
                            puVar15 = (ulong *)((ulong)puVar15 & 0xffffffff);
                            uVar9 = uVar40;
                            local_1e8 = puVar43;
                            if (!bVar62 || uVar18 > uVar17) {
                              puVar15 = (ulong *)(ulong)uVar40;
                            }
                          }
                          if (!bVar24) break;
                          uVar32 = uVar32 + 1;
                          bVar61 = uVar32 < uVar34;
                        } while (bVar61);
                        uVar55 = (uint)puVar15;
                        if (!bVar61) {
                          local_60[(long)local_58] = uVar35;
                          local_150 = (ZSTD_optimal_t *)0x0;
                          puVar15 = (ulong *)0x0;
                          uVar32 = (ulong)uVar9;
                          do {
                            uVar55 = (uint)uVar32;
                            bVar61 = iVar20 == 0;
                            iVar20 = iVar20 + -1;
                            if ((bVar61) || (uVar17 = (uint)uVar57, uVar17 < UVar10 + (UVar10 == 0))
                               ) break;
                            pZVar44 = local_150;
                            if (puVar15 < local_150) {
                              pZVar44 = (ZSTD_optimal_t *)puVar15;
                            }
                            pBVar58 = pBVar36 + uVar57;
                            puVar46 = (ulong *)((long)puVar60 + (long)pZVar44);
                            puVar43 = (ulong *)(pBVar58 + (long)pZVar44);
                            puVar41 = puVar46;
                            if (puVar46 < puVar37) {
                              uVar26 = *puVar46 ^ *puVar43;
                              uVar34 = 0;
                              if (uVar26 != 0) {
                                for (; (uVar26 >> uVar34 & 1) == 0; uVar34 = uVar34 + 1) {
                                }
                              }
                              pBVar50 = (BYTE *)(uVar34 >> 3 & 0x1fffffff);
                              if (*puVar43 == *puVar46) {
                                do {
                                  puVar41 = puVar41 + 1;
                                  puVar43 = puVar43 + 1;
                                  if (puVar37 <= puVar41) goto LAB_0043ec9b;
                                  uVar26 = *puVar41 ^ *puVar43;
                                  uVar34 = 0;
                                  if (uVar26 != 0) {
                                    for (; (uVar26 >> uVar34 & 1) == 0; uVar34 = uVar34 + 1) {
                                    }
                                  }
                                  pBVar50 = (BYTE *)((long)puVar41 +
                                                    ((uVar34 >> 3 & 0x1fffffff) - (long)puVar46));
                                } while (*puVar43 == *puVar41);
                              }
                            }
                            else {
LAB_0043ec9b:
                              if ((puVar41 < puVar51) && ((uint)*puVar43 == (uint)*puVar41)) {
                                puVar41 = (ulong *)((long)puVar41 + 4);
                                puVar43 = (ulong *)((long)puVar43 + 4);
                              }
                              if ((puVar41 < local_e8) && ((short)*puVar43 == (short)*puVar41)) {
                                puVar41 = (ulong *)((long)puVar41 + 2);
                                puVar43 = (ulong *)((long)puVar43 + 2);
                              }
                              if (puVar41 < puVar2) {
                                puVar41 = (ulong *)((long)puVar41 +
                                                   (ulong)((BYTE)*puVar43 == (BYTE)*puVar41));
                              }
                              pBVar50 = (BYTE *)((long)puVar41 - (long)puVar46);
                            }
                            puVar46 = (ulong *)(pBVar50 + (long)pZVar44);
                            if (local_1e8 < puVar46) {
                              iVar25 = uVar17 + (U32)puVar46;
                              if (puVar46 <= (ulong *)(ulong)(iVar19 - uVar17)) {
                                iVar25 = iVar19;
                              }
                              ((ZSTD_match_t *)((long)local_110 + uVar32 * 8))->off =
                                   (uVar35 + 2) - uVar17;
                              ((ZSTD_match_t *)((long)local_110 + uVar32 * 8))->len = (U32)puVar46;
                              uVar32 = (ulong)(uVar55 + 1);
                              iVar19 = iVar25;
                              local_1e8 = puVar46;
                              if ((puVar46 < (ulong *)0x1001) &&
                                 ((ulong *)((long)puVar60 + (long)puVar46) != puVar2))
                              goto LAB_0043ed5f;
LAB_0043edeb:
                              bVar61 = false;
                            }
                            else {
LAB_0043ed5f:
                              puVar23 = pUVar59 + (uVar17 & uVar22) * 2;
                              if (*(byte *)((long)puVar60 + (long)puVar46) <= pBVar58[(long)puVar46]
                                 ) {
                                *local_190 = uVar17;
                                local_190 = puVar23;
                                local_150 = (ZSTD_optimal_t *)puVar46;
                                if (uVar27 < uVar17) goto LAB_0043edba;
                                local_190 = (uint *)local_11c;
                                goto LAB_0043edeb;
                              }
                              *local_198 = uVar17;
                              puVar15 = puVar46;
                              if (uVar27 < uVar17) {
                                puVar23 = puVar23 + 1;
                                local_198 = puVar23;
LAB_0043edba:
                                uVar57 = (ulong)*puVar23;
                                bVar61 = true;
                              }
                              else {
                                bVar61 = false;
                                local_198 = (uint *)local_11c;
                              }
                            }
                            uVar55 = (uint)uVar32;
                          } while (bVar61);
                          *local_190 = 0;
                          local_180 = local_198;
                          goto LAB_0043f329;
                        }
                      }
                      else if (UVar12 == 3) {
                        uVar32 = (ulong)(UVar10 != 0);
                        uVar17 = (ms->cParams).targetLength;
                        if (0xffe < uVar17) {
                          uVar17 = 0xfff;
                        }
                        local_118 = (ulong *)CONCAT44(local_118._4_4_,uVar17);
                        pBVar36 = (ms->window).base;
                        uVar27 = iVar19 - (int)pBVar36;
                        local_60 = (U32 *)(ulong)((uint)*puVar60 * -0x61c8864f >>
                                                 (-(char)(ms->cParams).hashLog & 0x1fU));
                        pUVar59 = ms->chainTable;
                        uVar22 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
                        uVar9 = uVar27 - uVar22;
                        if (uVar27 < uVar22) {
                          uVar9 = 0;
                        }
                        UVar10 = (ms->window).lowLimit;
                        uVar35 = UVar10 + (UVar10 == 0);
                        uVar34 = (ulong)((uVar22 & uVar27) * 2);
                        local_198 = pUVar59 + uVar34;
                        local_190 = pUVar59 + uVar34 + 1;
                        iVar19 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
                        UVar10 = (ms->window).dictLimit;
                        local_a0 = -uVar32;
                        bVar61 = true;
                        local_40 = ms->hashTable;
                        local_58 = (ulong *)(ulong)ms->hashTable[(long)local_60];
                        iVar20 = uVar27 + 9;
                        uVar34 = uVar32 + 3;
                        puVar15 = (ulong *)((long)puVar60 + 3);
                        local_b8 = (ulong *)((long)puVar60 + 0xb);
                        puVar46 = (ulong *)0x0;
                        local_1e8 = local_b8;
                        local_1b0 = local_f0;
                        do {
                          if (uVar32 == 3) {
                            UVar12 = pZVar42->rep[0] - 1;
                          }
                          else {
                            UVar12 = pZVar42->rep[uVar32];
                          }
                          uVar55 = 0;
                          if ((UVar12 - 1 < uVar27 - UVar10) &&
                             (((*(uint *)((long)puVar60 - (ulong)UVar12) ^ (uint)*puVar60) &
                              0xffffff) == 0)) {
                            puVar41 = (ulong *)((long)puVar15 - (ulong)UVar12);
                            puVar43 = puVar15;
                            if (puVar15 < puVar37) {
                              uVar57 = *puVar15 ^ *puVar41;
                              uVar26 = 0;
                              if (uVar57 != 0) {
                                for (; (uVar57 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
                                }
                              }
                              uVar26 = uVar26 >> 3 & 0x1fffffff;
                              iVar25 = (int)uVar26;
                              puVar43 = local_b8;
                              if (*puVar41 == *puVar15) {
                                do {
                                  puVar41 = puVar41 + 1;
                                  if (puVar37 <= puVar43) goto LAB_0043e229;
                                  uVar57 = *puVar41;
                                  uVar48 = *puVar43;
                                  uVar28 = 0;
                                  if ((uVar48 ^ uVar57) != 0) {
                                    for (; ((uVar48 ^ uVar57) >> uVar28 & 1) == 0;
                                        uVar28 = uVar28 + 1) {
                                    }
                                  }
                                  puVar45 = (ulong *)((uVar28 >> 3 & 0x1fffffff) + (long)puVar43);
                                  puVar43 = puVar43 + 1;
                                  if (uVar57 != uVar48) {
                                    uVar26 = (long)puVar45 - (long)puVar15;
                                    puVar43 = puVar45;
                                  }
                                  iVar25 = (int)uVar26;
                                } while (uVar57 == uVar48);
                              }
                            }
                            else {
LAB_0043e229:
                              if ((puVar43 < puVar51) && ((uint)*puVar41 == (uint)*puVar43)) {
                                puVar43 = (ulong *)((long)puVar43 + 4);
                                puVar41 = (ulong *)((long)puVar41 + 4);
                              }
                              if ((puVar43 < local_e8) && ((short)*puVar41 == (short)*puVar43)) {
                                puVar43 = (ulong *)((long)puVar43 + 2);
                                puVar41 = (ulong *)((long)puVar41 + 2);
                              }
                              if (puVar43 < puVar2) {
                                puVar43 = (ulong *)((long)puVar43 +
                                                   (ulong)((BYTE)*puVar41 == (BYTE)*puVar43));
                              }
                              iVar25 = (int)puVar43 - (int)puVar15;
                            }
                            uVar55 = iVar25 + 3;
                          }
                          puVar41 = (ulong *)(ulong)uVar55;
                          bVar24 = true;
                          puVar43 = puVar46;
                          if (local_1b0 < puVar41) {
                            ((ZSTD_match_t *)((long)local_110 + puVar46 * 8))->off =
                                 (int)uVar32 + (int)local_a0;
                            puVar43 = (ulong *)(ulong)((int)puVar46 + 1);
                            ((ZSTD_match_t *)((long)local_110 + puVar46 * 8))->len = uVar55;
                            bVar62 = (ulong *)((long)puVar60 + (long)puVar41) != puVar2;
                            bVar24 = bVar62 && uVar55 <= uVar17;
                            local_1e8 = (ulong *)((ulong)local_1e8 & 0xffffffff);
                            local_1b0 = puVar41;
                            if (!bVar62 || uVar55 > uVar17) {
                              local_1e8 = puVar43;
                            }
                          }
                          if (!bVar24) break;
                          uVar32 = uVar32 + 1;
                          bVar61 = uVar32 < uVar34;
                          puVar46 = puVar43;
                        } while (bVar61);
                        uVar55 = (uint)local_1e8;
                        if (!bVar61) {
                          if (local_1b0 < (ulong *)0x3) {
                            UVar10 = ZSTD_insertAndFindFirstIndexHash3(ms,(BYTE *)puVar60);
                            bVar61 = true;
                            if ((uVar35 <= UVar10) && (uVar27 - UVar10 < 0x40000)) {
                              puVar46 = (ulong *)(pBVar36 + UVar10);
                              puVar15 = puVar60;
                              if (puVar60 < puVar37) {
                                uVar34 = *puVar60 ^ *puVar46;
                                uVar32 = 0;
                                if (uVar34 != 0) {
                                  for (; (uVar34 >> uVar32 & 1) == 0; uVar32 = uVar32 + 1) {
                                  }
                                }
                                puVar41 = (ulong *)(uVar32 >> 3 & 0x1fffffff);
                                if (*puVar46 == *puVar60) {
                                  do {
                                    puVar15 = puVar15 + 1;
                                    puVar46 = puVar46 + 1;
                                    if (puVar37 <= puVar15) goto LAB_0043f342;
                                    uVar34 = *puVar15 ^ *puVar46;
                                    uVar32 = 0;
                                    if (uVar34 != 0) {
                                      for (; (uVar34 >> uVar32 & 1) == 0; uVar32 = uVar32 + 1) {
                                      }
                                    }
                                    puVar41 = (ulong *)((long)puVar15 +
                                                       ((uVar32 >> 3 & 0x1fffffff) - (long)puVar60))
                                    ;
                                  } while (*puVar46 == *puVar15);
                                }
                              }
                              else {
LAB_0043f342:
                                if ((puVar15 < puVar51) && ((uint)*puVar46 == (uint)*puVar15)) {
                                  puVar15 = (ulong *)((long)puVar15 + 4);
                                  puVar46 = (ulong *)((long)puVar46 + 4);
                                }
                                if ((puVar15 < local_e8) && ((short)*puVar46 == (short)*puVar15)) {
                                  puVar15 = (ulong *)((long)puVar15 + 2);
                                  puVar46 = (ulong *)((long)puVar46 + 2);
                                }
                                if (puVar15 < puVar2) {
                                  puVar15 = (ulong *)((long)puVar15 +
                                                     (ulong)((BYTE)*puVar46 == (BYTE)*puVar15));
                                }
                                puVar41 = (ulong *)((long)puVar15 - (long)puVar60);
                              }
                              if ((ulong *)0x2 < puVar41) {
                                local_110->price = (uVar27 - UVar10) + 2;
                                local_110->off = (U32)puVar41;
                                local_1b0 = puVar41;
                                if (((ulong *)((ulong)local_118 & 0xffffffff) < puVar41) ||
                                   (puVar43 = (ulong *)0x1,
                                   (ulong *)((long)puVar60 + (long)puVar41) == puVar2)) {
                                  ms->nextToUpdate = uVar27 + 1;
                                  puVar43 = (ulong *)0x1;
                                  bVar61 = false;
                                  local_1e8._0_4_ = 1;
                                }
                              }
                            }
                            uVar55 = (uint)local_1e8;
                            if (!bVar61) goto LAB_0043f6b2;
                          }
                          local_40[(long)local_60] = uVar27;
                          local_118 = (ulong *)0x0;
                          puVar15 = (ulong *)0x0;
                          puVar46 = local_58;
                          local_1e8 = puVar43;
                          do {
                            bVar61 = iVar19 == 0;
                            iVar19 = iVar19 + -1;
                            if ((bVar61) || (uVar17 = (uint)puVar46, uVar17 < uVar35)) break;
                            puVar43 = local_118;
                            if (puVar15 < local_118) {
                              puVar43 = puVar15;
                            }
                            puVar41 = (ulong *)((long)puVar60 + (long)puVar43);
                            puVar45 = (ulong *)(pBVar36 + ((ulong)puVar46 & 0xffffffff) +
                                               (long)puVar43);
                            puVar30 = puVar41;
                            if (puVar41 < puVar37) {
                              uVar34 = *puVar41 ^ *puVar45;
                              uVar32 = 0;
                              if (uVar34 != 0) {
                                for (; (uVar34 >> uVar32 & 1) == 0; uVar32 = uVar32 + 1) {
                                }
                              }
                              pBVar58 = (BYTE *)(uVar32 >> 3 & 0x1fffffff);
                              if (*puVar45 == *puVar41) {
                                do {
                                  puVar30 = puVar30 + 1;
                                  puVar45 = puVar45 + 1;
                                  if (puVar37 <= puVar30) goto LAB_0043f504;
                                  uVar34 = *puVar30 ^ *puVar45;
                                  uVar32 = 0;
                                  if (uVar34 != 0) {
                                    for (; (uVar34 >> uVar32 & 1) == 0; uVar32 = uVar32 + 1) {
                                    }
                                  }
                                  pBVar58 = (BYTE *)((long)puVar30 +
                                                    ((uVar32 >> 3 & 0x1fffffff) - (long)puVar41));
                                } while (*puVar45 == *puVar30);
                              }
                            }
                            else {
LAB_0043f504:
                              if ((puVar30 < puVar51) && ((uint)*puVar45 == (uint)*puVar30)) {
                                puVar30 = (ulong *)((long)puVar30 + 4);
                                puVar45 = (ulong *)((long)puVar45 + 4);
                              }
                              if ((puVar30 < local_e8) && ((short)*puVar45 == (short)*puVar30)) {
                                puVar30 = (ulong *)((long)puVar30 + 2);
                                puVar45 = (ulong *)((long)puVar45 + 2);
                              }
                              if (puVar30 < puVar2) {
                                puVar30 = (ulong *)((long)puVar30 +
                                                   (ulong)((BYTE)*puVar45 == (BYTE)*puVar30));
                              }
                              pBVar58 = (BYTE *)((long)puVar30 - (long)puVar41);
                            }
                            puVar43 = (ulong *)(pBVar58 + (long)puVar43);
                            iVar25 = iVar20;
                            if (local_1b0 < puVar43) {
                              iVar25 = uVar17 + (U32)puVar43;
                              if (puVar43 <= (ulong *)(ulong)(iVar20 - uVar17)) {
                                iVar25 = iVar20;
                              }
                              ((ZSTD_match_t *)((long)local_110 + local_1e8 * 8))->off =
                                   (uVar27 + 2) - uVar17;
                              ((ZSTD_match_t *)((long)local_110 + local_1e8 * 8))->len =
                                   (U32)puVar43;
                              local_1e8 = (ulong *)(ulong)((uint)local_1e8 + 1);
                              bVar61 = false;
                              iVar20 = iVar25;
                              local_1b0 = puVar43;
                              if (puVar43 < (ulong *)0x1001) {
                                if ((ulong *)((long)puVar60 + (long)puVar43) != puVar2)
                                goto LAB_0043f5da;
LAB_0043f669:
                                bVar61 = false;
                                iVar20 = iVar25;
                              }
                            }
                            else {
LAB_0043f5da:
                              puVar23 = pUVar59 + (uVar17 & uVar22) * 2;
                              iVar20 = iVar25;
                              if ((pBVar36 + ((ulong)puVar46 & 0xffffffff))[(long)puVar43] <
                                  *(byte *)((long)puVar60 + (long)puVar43)) {
                                *local_198 = uVar17;
                                puVar15 = puVar43;
                                if (uVar17 <= uVar9) {
                                  bVar61 = false;
                                  local_198 = (uint *)local_11c;
                                  goto LAB_0043f67b;
                                }
                                puVar23 = puVar23 + 1;
                                local_198 = puVar23;
                              }
                              else {
                                *local_190 = uVar17;
                                local_190 = puVar23;
                                local_118 = puVar43;
                                if (uVar17 <= uVar9) {
                                  local_190 = (uint *)local_11c;
                                  goto LAB_0043f669;
                                }
                              }
                              puVar46 = (ulong *)(ulong)*puVar23;
                              bVar61 = true;
                            }
LAB_0043f67b:
                          } while (bVar61);
                          *local_190 = 0;
                          *local_198 = 0;
                          ms->nextToUpdate = iVar20 - 8;
                          uVar55 = (uint)local_1e8;
                        }
                      }
                      else {
                        uVar32 = (ulong)(UVar10 != 0);
                        uVar17 = (ms->cParams).targetLength;
                        if (0xffe < uVar17) {
                          uVar17 = 0xfff;
                        }
                        local_118 = (ulong *)CONCAT44(local_118._4_4_,uVar17);
                        pBVar36 = (ms->window).base;
                        uVar22 = iVar19 - (int)pBVar36;
                        local_58 = (ulong *)(ulong)((uint)*puVar60 * -0x61c8864f >>
                                                   (-(char)(ms->cParams).hashLog & 0x1fU));
                        pUVar59 = ms->chainTable;
                        uVar27 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
                        uVar9 = uVar22 - uVar27;
                        uVar34 = 0;
                        if (uVar22 < uVar27) {
                          uVar9 = 0;
                        }
                        UVar12 = (ms->window).lowLimit;
                        uVar26 = (ulong)((uVar27 & uVar22) * 2);
                        local_180 = pUVar59 + uVar26;
                        local_198 = pUVar59 + uVar26 + 1;
                        iVar20 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
                        UVar13 = (ms->window).dictLimit;
                        bVar61 = true;
                        local_60 = ms->hashTable;
                        uVar57 = (ulong)local_60[(long)local_58];
                        local_a0 = (ulong)uVar22;
                        iVar19 = uVar22 + 9;
                        uVar26 = uVar32 + 3;
                        puVar15 = (ulong *)((long)puVar60 + 4);
                        local_b8 = (ulong *)((long)puVar60 + 0xc);
                        puVar46 = local_58;
                        do {
                          if (uVar32 == 3) {
                            UVar47 = pZVar42->rep[0] - 1;
                          }
                          else {
                            UVar47 = pZVar42->rep[uVar32];
                          }
                          uVar55 = 0;
                          if ((UVar47 - 1 < uVar22 - UVar13) &&
                             (uVar55 = 0, (uint)*puVar60 == *(uint *)((long)puVar60 - (ulong)UVar47)
                             )) {
                            puVar41 = (ulong *)((long)puVar15 - (ulong)UVar47);
                            puVar43 = puVar15;
                            if (puVar15 < puVar37) {
                              uVar28 = *puVar15 ^ *puVar41;
                              uVar48 = 0;
                              if (uVar28 != 0) {
                                for (; (uVar28 >> uVar48 & 1) == 0; uVar48 = uVar48 + 1) {
                                }
                              }
                              uVar48 = uVar48 >> 3 & 0x1fffffff;
                              iVar25 = (int)uVar48;
                              puVar43 = (ulong *)((long)puVar60 + 0xc);
                              if (*puVar41 == *puVar15) {
                                do {
                                  puVar41 = puVar41 + 1;
                                  if (puVar37 <= puVar43) goto LAB_0043efed;
                                  uVar28 = *puVar41;
                                  uVar5 = *puVar43;
                                  uVar6 = 0;
                                  if ((uVar5 ^ uVar28) != 0) {
                                    for (; ((uVar5 ^ uVar28) >> uVar6 & 1) == 0; uVar6 = uVar6 + 1)
                                    {
                                    }
                                  }
                                  puVar45 = (ulong *)((uVar6 >> 3 & 0x1fffffff) + (long)puVar43);
                                  puVar43 = puVar43 + 1;
                                  if (uVar28 != uVar5) {
                                    uVar48 = (long)puVar45 - (long)puVar15;
                                    puVar43 = puVar45;
                                  }
                                  iVar25 = (int)uVar48;
                                } while (uVar28 == uVar5);
                              }
                            }
                            else {
LAB_0043efed:
                              if ((puVar43 < puVar51) && ((uint)*puVar41 == (uint)*puVar43)) {
                                puVar43 = (ulong *)((long)puVar43 + 4);
                                puVar41 = (ulong *)((long)puVar41 + 4);
                              }
                              if ((puVar43 < local_e8) && ((short)*puVar41 == (short)*puVar43)) {
                                puVar43 = (ulong *)((long)puVar43 + 2);
                                puVar41 = (ulong *)((long)puVar41 + 2);
                              }
                              if (puVar43 < puVar2) {
                                puVar43 = (ulong *)((long)puVar43 +
                                                   (ulong)((BYTE)*puVar41 == (BYTE)*puVar43));
                              }
                              iVar25 = (int)puVar43 - (int)puVar15;
                            }
                            uVar55 = iVar25 + 4;
                          }
                          puVar43 = (ulong *)(ulong)uVar55;
                          bVar24 = true;
                          if (local_1e8 < puVar43) {
                            ((ZSTD_match_t *)((long)local_110 + uVar34 * 8))->off =
                                 (int)uVar32 - (uint)(UVar10 != 0);
                            uVar35 = (int)uVar34 + 1;
                            ((ZSTD_match_t *)((long)local_110 + uVar34 * 8))->len = uVar55;
                            bVar62 = (ulong *)((long)puVar60 + (long)puVar43) != puVar2;
                            bVar24 = bVar62 && uVar55 <= uVar17;
                            uVar34 = (ulong)uVar35;
                            local_1e8 = puVar43;
                            if (!bVar62 || uVar55 > uVar17) {
                              puVar46 = (ulong *)(ulong)uVar35;
                            }
                          }
                          if (!bVar24) break;
                          uVar32 = uVar32 + 1;
                          bVar61 = uVar32 < uVar26;
                        } while (bVar61);
                        uVar55 = (uint)puVar46;
                        if (!bVar61) {
                          local_60[(long)local_58] = uVar22;
                          local_a0 = (ulong)(uVar22 + 2);
                          local_1b0 = (ulong *)0x0;
                          puVar15 = (ulong *)0x0;
                          do {
                            uVar55 = (uint)uVar34;
                            bVar61 = iVar20 == 0;
                            iVar20 = iVar20 + -1;
                            if ((bVar61) || (uVar17 = (uint)uVar57, uVar17 < UVar12 + (UVar12 == 0))
                               ) break;
                            puVar46 = local_1b0;
                            if (puVar15 < local_1b0) {
                              puVar46 = puVar15;
                            }
                            pBVar58 = pBVar36 + uVar57;
                            puVar43 = (ulong *)((long)puVar60 + (long)puVar46);
                            puVar41 = (ulong *)(pBVar58 + (long)puVar46);
                            puVar45 = puVar43;
                            if (puVar43 < puVar37) {
                              uVar26 = *puVar43 ^ *puVar41;
                              uVar32 = 0;
                              if (uVar26 != 0) {
                                for (; (uVar26 >> uVar32 & 1) == 0; uVar32 = uVar32 + 1) {
                                }
                              }
                              pBVar50 = (BYTE *)(uVar32 >> 3 & 0x1fffffff);
                              if (*puVar41 == *puVar43) {
                                do {
                                  puVar45 = puVar45 + 1;
                                  puVar41 = puVar41 + 1;
                                  if (puVar37 <= puVar45) goto LAB_0043f199;
                                  uVar26 = *puVar45 ^ *puVar41;
                                  uVar32 = 0;
                                  if (uVar26 != 0) {
                                    for (; (uVar26 >> uVar32 & 1) == 0; uVar32 = uVar32 + 1) {
                                    }
                                  }
                                  pBVar50 = (BYTE *)((long)puVar45 +
                                                    ((uVar32 >> 3 & 0x1fffffff) - (long)puVar43));
                                } while (*puVar41 == *puVar45);
                              }
                            }
                            else {
LAB_0043f199:
                              if ((puVar45 < puVar51) && ((uint)*puVar41 == (uint)*puVar45)) {
                                puVar45 = (ulong *)((long)puVar45 + 4);
                                puVar41 = (ulong *)((long)puVar41 + 4);
                              }
                              if ((puVar45 < local_e8) && ((short)*puVar41 == (short)*puVar45)) {
                                puVar45 = (ulong *)((long)puVar45 + 2);
                                puVar41 = (ulong *)((long)puVar41 + 2);
                              }
                              if (puVar45 < puVar2) {
                                puVar45 = (ulong *)((long)puVar45 +
                                                   (ulong)((BYTE)*puVar41 == (BYTE)*puVar45));
                              }
                              pBVar50 = (BYTE *)((long)puVar45 - (long)puVar43);
                            }
                            puVar46 = (ulong *)(pBVar50 + (long)puVar46);
                            if (local_1e8 < puVar46) {
                              iVar25 = uVar17 + (U32)puVar46;
                              if (puVar46 <= (ulong *)(ulong)(iVar19 - uVar17)) {
                                iVar25 = iVar19;
                              }
                              ((ZSTD_match_t *)((long)local_110 + uVar34 * 8))->off =
                                   (int)local_a0 - uVar17;
                              ((ZSTD_match_t *)((long)local_110 + uVar34 * 8))->len = (U32)puVar46;
                              uVar34 = (ulong)(uVar55 + 1);
                              iVar19 = iVar25;
                              local_1e8 = puVar46;
                              if ((puVar46 < (ulong *)0x1001) &&
                                 ((ulong *)((long)puVar60 + (long)puVar46) != puVar2))
                              goto LAB_0043f25e;
LAB_0043f2e5:
                              bVar61 = false;
                            }
                            else {
LAB_0043f25e:
                              puVar23 = pUVar59 + (uVar17 & uVar27) * 2;
                              if (*(byte *)((long)puVar60 + (long)puVar46) <= pBVar58[(long)puVar46]
                                 ) {
                                *local_198 = uVar17;
                                local_1b0 = puVar46;
                                local_198 = puVar23;
                                if (uVar9 < uVar17) goto LAB_0043f2b9;
                                local_198 = (uint *)local_11c;
                                goto LAB_0043f2e5;
                              }
                              *local_180 = uVar17;
                              puVar15 = puVar46;
                              if (uVar9 < uVar17) {
                                puVar23 = puVar23 + 1;
                                local_180 = puVar23;
LAB_0043f2b9:
                                uVar57 = (ulong)*puVar23;
                                bVar61 = true;
                              }
                              else {
                                bVar61 = false;
                                local_180 = (uint *)local_11c;
                              }
                            }
                            uVar55 = (uint)uVar34;
                          } while (bVar61);
                          goto LAB_0043f306;
                        }
                      }
                    }
LAB_0043f6b2:
                    pZVar44 = local_108;
                    if (uVar55 == 0) {
                      uVar17 = 0x13;
                    }
                    else {
                      uVar9 = ((ZSTD_match_t *)((long)local_110 + (ulong)(uVar55 - 1) * 8))->len;
                      bVar61 = 0xfff < uVar9 + iVar31;
                      uVar17 = 0;
                      if (bVar61 || (uint)local_a8 < uVar9) {
                        UVar10 = 0;
                        if (pZVar42->mlen == 0) {
                          UVar10 = pZVar42->litlen;
                        }
                        local_d4 = ((ZSTD_match_t *)((long)local_110 + (ulong)(uVar55 - 1) * 8))->
                                   off;
                        uVar17 = iVar31 - UVar10;
                        uVar14 = (ulong)(uVar9 + (U32)local_1c0 + uVar17);
                        if (0x1000 < uVar17) {
                          uVar17 = 0;
                        }
                        local_168 = (BYTE *)(ulong)uVar17;
                        uVar17 = 7;
                        local_88 = (ZSTD_optimal_t *)local_1c0;
                        local_138 = (ulong *)(ulong)uVar9;
                      }
                      else {
                        local_138 = (ulong *)((ulong)local_138 & 0xffffffff);
                      }
                      if (!bVar61 && (uint)local_a8 >= uVar9) {
                        local_c0 = CONCAT44(local_c0._4_4_,
                                            CONCAT31((int3)(local_c0 >> 8),local_c8._0_1_));
                        iVar31 = UVar11 + (int)local_d0;
                        pZVar16 = local_108 + (long)local_168;
                        uVar32 = 0;
                        do {
                          pZVar42 = local_110;
                          UVar10 = ((ZSTD_match_t *)((long)local_110 + uVar32 * 8))->off;
                          rVar63 = ZSTD_updateRep(pZVar16->rep,UVar10,(U32)local_c0);
                          uVar17 = (uint)local_e0;
                          if (uVar32 != 0) {
                            uVar17 = ((ZSTD_match_t *)((long)pZVar42 + (uVar32 - 1) * 8))->len + 1;
                          }
                          uVar9 = ((ZSTD_match_t *)((long)pZVar42 + uVar32 * 8))->len;
                          if (uVar17 <= uVar9) {
                            uVar27 = 0x1f;
                            if (UVar10 + 1 != 0) {
                              for (; UVar10 + 1 >> uVar27 == 0; uVar27 = uVar27 - 1) {
                              }
                            }
                            do {
                              if ((ms->opt).priceType == zop_predef) {
                                uVar22 = uVar9 - 2;
                                iVar19 = 0x1f;
                                if (uVar22 != 0) {
                                  for (; uVar22 >> iVar19 == 0; iVar19 = iVar19 + -1) {
                                  }
                                }
                                iVar19 = (iVar19 + uVar27) * 0x100 +
                                         (uVar22 * 0x100 >> ((byte)iVar19 & 0x1f)) + 0x1000;
                              }
                              else {
                                uVar35 = uVar9 - 3;
                                uVar22 = (ms->opt).offCodeFreq[uVar27] + 1;
                                iVar19 = 0x1f;
                                if (uVar22 != 0) {
                                  for (; uVar22 >> iVar19 == 0; iVar19 = iVar19 + -1) {
                                  }
                                }
                                if (uVar35 < 0x80) {
                                  uVar35 = (uint)(byte)(&ZSTD_MLcode_ML_Code)[uVar35];
                                }
                                else {
                                  uVar18 = 0x1f;
                                  if (uVar35 != 0) {
                                    for (; uVar35 >> uVar18 == 0; uVar18 = uVar18 - 1) {
                                    }
                                  }
                                  uVar35 = (uVar18 ^ 0xffffffe0) + 0x44;
                                }
                                uVar18 = (ms->opt).matchLengthFreq[uVar35] + 1;
                                iVar20 = 0x1f;
                                if (uVar18 != 0) {
                                  for (; uVar18 >> iVar20 == 0; iVar20 = iVar20 + -1) {
                                  }
                                }
                                iVar19 = (((ms->opt).offCodeSumBasePrice +
                                          (ms->opt).matchLengthSumBasePrice) -
                                         ((uVar22 * 0x100 >> ((byte)iVar19 & 0x1f)) +
                                         (uVar18 * 0x100 >> ((byte)iVar20 & 0x1f)))) +
                                         ((ML_bits[uVar35] + uVar27) - (iVar19 + iVar20)) * 0x100 +
                                         0x33;
                                pZVar44 = local_108;
                              }
                              iVar19 = iVar19 + iVar31;
                              uVar22 = uVar9 + (int)local_168;
                              uVar34 = (ulong)uVar22;
                              if ((uint)uVar14 < uVar22) {
LAB_0043f911:
                                uVar14 = uVar14 & 0xffffffff;
                                pZVar42 = local_90 + uVar14;
                                do {
                                  uVar14 = uVar14 + 1;
                                  pZVar42->price = 0x40000000;
                                  pZVar42 = pZVar42 + 1;
                                } while (uVar14 < uVar34);
LAB_0043f93d:
                                pZVar44[uVar34].mlen = uVar9;
                                pZVar44[uVar34].off = UVar10;
                                pZVar44[uVar34].litlen = (U32)local_1c0;
                                pZVar44[uVar34].price = iVar19;
                                *(long *)pZVar44[uVar34].rep = rVar63.rep._0_8_;
                                pZVar44[uVar34].rep[2] = rVar63.rep[2];
                              }
                              else if (iVar19 < pZVar44[uVar34].price) {
                                if ((uint)uVar14 < uVar22) goto LAB_0043f911;
                                goto LAB_0043f93d;
                              }
                              uVar9 = uVar9 - 1;
                            } while (uVar17 <= uVar9);
                          }
                          uVar32 = uVar32 + 1;
                        } while (uVar32 != uVar55 + (uVar55 == 0));
                        uVar17 = 0;
                      }
                    }
                  }
                }
                if (uVar17 < 0x11) {
                  if (uVar17 != 0) {
                    if (uVar17 == 7) goto LAB_0043fa65;
                    goto LAB_0043fce8;
                  }
                }
                else if (uVar17 != 0x13) {
                  if (uVar17 != 0x11) goto LAB_0043fce8;
                  break;
                }
                uVar17 = (int)local_168 + 1;
                local_168 = (BYTE *)(ulong)uVar17;
              } while (uVar17 <= (uint)uVar14);
            }
            uVar32 = uVar14 & 0xffffffff;
            local_74 = pZVar44[uVar32].price;
            local_d4 = pZVar44[uVar32].off;
            local_138 = (ulong *)(ulong)pZVar44[uVar32].mlen;
            local_88 = (ZSTD_optimal_t *)(ulong)pZVar44[uVar32].litlen;
            local_48 = pZVar44[uVar32].rep[2];
            local_50 = *(undefined8 *)pZVar44[uVar32].rep;
            uVar55 = pZVar44[uVar32].litlen + pZVar44[uVar32].mlen;
            uVar17 = (uint)uVar14 - uVar55;
            if ((uint)uVar14 < uVar55) {
              uVar17 = 0;
            }
            local_168 = (BYTE *)(ulong)uVar17;
            goto LAB_0043fa65;
          }
LAB_0043fce8:
          srcSize = (size_t)local_168;
        } while (local_1e0 < puVar56);
      }
      ZSTD_resetSeqStore(seqStore);
      ppBVar1 = &(ms->window).base;
      *ppBVar1 = *ppBVar1 + -local_38;
      UVar10 = (ms->window).dictLimit + (int)local_38;
      (ms->window).dictLimit = UVar10;
      (ms->window).lowLimit = UVar10;
      ms->nextToUpdate = UVar10;
      ms->nextToUpdate3 = UVar10;
      puVar23 = (ms->opt).litFreq;
      lVar21 = 0;
      UVar10 = 0;
      do {
        iVar31 = puVar23[lVar21] * 0x10;
        puVar23[lVar21] = iVar31 - 1;
        UVar10 = (UVar10 + iVar31) - 1;
        lVar21 = lVar21 + 1;
      } while (lVar21 != 0x100);
      (ms->opt).litSum = UVar10;
      puVar23 = (ms->opt).litLengthFreq;
      lVar21 = 0;
      UVar10 = 0;
      do {
        iVar31 = puVar23[lVar21] * 0x10;
        puVar23[lVar21] = iVar31 - 1;
        UVar10 = (UVar10 + iVar31) - 1;
        lVar21 = lVar21 + 1;
      } while (lVar21 != 0x24);
      (ms->opt).litLengthSum = UVar10;
      puVar23 = (ms->opt).matchLengthFreq;
      lVar21 = 0;
      UVar10 = 0;
      do {
        iVar31 = puVar23[lVar21] * 0x10;
        puVar23[lVar21] = iVar31 - 1;
        UVar10 = (UVar10 + iVar31) - 1;
        lVar21 = lVar21 + 1;
      } while (lVar21 != 0x35);
      (ms->opt).matchLengthSum = UVar10;
      puVar23 = (ms->opt).offCodeFreq;
      lVar21 = 0;
      UVar10 = 0;
      do {
        iVar31 = puVar23[lVar21] * 0x10;
        puVar23[lVar21] = iVar31 - 1;
        UVar10 = (UVar10 + iVar31) - 1;
        lVar21 = lVar21 + 1;
      } while (lVar21 != 0x20);
      (ms->opt).offCodeSum = UVar10;
      srcSize = local_38;
    }
  }
  puVar37 = local_80;
  local_98 = &ms->opt;
  puVar56 = (ulong *)((long)local_80 + srcSize);
  puVar51 = (ulong *)((long)local_80 + (srcSize - 8));
  uVar17 = (ms->window).dictLimit;
  pBVar36 = (ms->window).base;
  uVar55 = (ms->cParams).targetLength;
  if (0xffe < uVar55) {
    uVar55 = 0xfff;
  }
  local_118 = (ulong *)CONCAT44(local_118._4_4_,uVar55);
  local_108 = (ZSTD_optimal_t *)CONCAT71(local_108._1_7_,(ms->cParams).minMatch != 3);
  pZVar44 = (ms->opt).priceTable;
  pZVar4 = (ms->opt).matchTable;
  ms->nextToUpdate3 = ms->nextToUpdate;
  ZSTD_rescaleFreqs(local_98,(BYTE *)local_80,srcSize,2);
  puVar37 = (ulong *)((ulong)((ulong *)(pBVar36 + uVar17) == puVar37) + (long)puVar37);
  if (puVar37 < puVar51) {
    local_c0 = (ulong)((byte)local_108 + 3);
    local_d0 = (U32 *)(ulong)((byte)local_108 + 2);
    puVar2 = (ulong *)((long)puVar56 + -7);
    local_e0 = (ulong *)((long)puVar56 + -3);
    puVar60 = (ulong *)((long)puVar56 + -1);
    local_150 = pZVar44 + 1;
    puVar15 = puVar56;
    local_110 = local_150;
    local_e8 = puVar51;
    local_a0 = local_c0;
    local_88 = local_150;
    do {
      local_90 = (ZSTD_optimal_t *)((ulong)local_90 & 0xffffffff00000000);
      iVar19 = (int)puVar37;
      local_108 = (ZSTD_optimal_t *)(ulong)(uint)(iVar19 - (int)local_80);
      local_a8 = CONCAT71(local_a8._1_7_,iVar19 - (int)local_80 == 0);
      pBVar36 = (ms->window).base;
      uVar17 = ms->nextToUpdate;
      uVar14 = (ulong)uVar17;
      iVar31 = 0;
      if (pBVar36 + uVar14 <= puVar37) {
        UVar10 = (ms->cParams).minMatch;
        uVar55 = iVar19 - (int)pBVar36;
        while (uVar17 < uVar55) {
          UVar11 = ZSTD_insertBt1(ms,pBVar36 + uVar14,(BYTE *)puVar56,UVar10,0);
          uVar17 = (int)uVar14 + UVar11;
          uVar14 = (ulong)uVar17;
        }
        ms->nextToUpdate = uVar55;
        local_1f0 = (ulong *)local_d0;
        if (UVar10 - 6 < 2) {
          uVar14 = (ulong)((U32)local_108 == 0);
          uVar17 = (ms->cParams).targetLength;
          if (0xffe < uVar17) {
            uVar17 = 0xfff;
          }
          pBVar36 = (ms->window).base;
          uVar22 = iVar19 - (int)pBVar36;
          uVar32 = *puVar37 * -0x30e4432340650000 >> (-(char)(ms->cParams).hashLog & 0x3fU);
          pUVar59 = ms->chainTable;
          uVar27 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
          uVar9 = uVar22 - uVar27;
          uVar55 = 0;
          if (uVar22 < uVar27) {
            uVar9 = 0;
          }
          UVar10 = (ms->window).lowLimit;
          uVar34 = (ulong)((uVar27 & uVar22) * 2);
          local_1a8 = pUVar59 + uVar34;
          local_1a0 = (ulong *)(pUVar59 + uVar34 + 1);
          iVar20 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
          UVar11 = (ms->window).dictLimit;
          bVar61 = true;
          local_c8 = ms->hashTable;
          uVar26 = (ulong)local_c8[uVar32];
          iVar19 = uVar22 + 9;
          uVar34 = uVar14 + 3;
          puVar51 = (ulong *)((long)puVar37 + 4);
          pZVar29 = ms;
          do {
            if (uVar14 == 3) {
              UVar12 = *local_b0 - 1;
            }
            else {
              UVar12 = local_b0[uVar14];
            }
            pBVar58 = (BYTE *)0x0;
            if ((UVar12 - 1 < uVar22 - UVar11) &&
               ((uint)*puVar37 == *(uint *)((long)puVar37 - (ulong)UVar12))) {
              puVar43 = (ulong *)((long)puVar51 - (ulong)UVar12);
              puVar46 = puVar51;
              if (puVar51 < puVar2) {
                uVar48 = *puVar51 ^ *puVar43;
                uVar57 = 0;
                if (uVar48 != 0) {
                  for (; (uVar48 >> uVar57 & 1) == 0; uVar57 = uVar57 + 1) {
                  }
                }
                uVar57 = uVar57 >> 3 & 0x1fffffff;
                iVar31 = (int)uVar57;
                puVar46 = (ulong *)((long)puVar37 + 0xc);
                if (*puVar43 == *puVar51) {
                  do {
                    puVar43 = puVar43 + 1;
                    if (puVar2 <= puVar46) goto LAB_00440426;
                    uVar48 = *puVar43;
                    uVar28 = *puVar46;
                    uVar5 = 0;
                    if ((uVar28 ^ uVar48) != 0) {
                      for (; ((uVar28 ^ uVar48) >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
                      }
                    }
                    puVar41 = (ulong *)((uVar5 >> 3 & 0x1fffffff) + (long)puVar46);
                    puVar46 = puVar46 + 1;
                    if (uVar48 != uVar28) {
                      uVar57 = (long)puVar41 - (long)puVar51;
                      puVar46 = puVar41;
                    }
                    iVar31 = (int)uVar57;
                  } while (uVar48 == uVar28);
                }
              }
              else {
LAB_00440426:
                if ((puVar46 < local_e0) && ((uint)*puVar43 == (uint)*puVar46)) {
                  puVar46 = (ulong *)((long)puVar46 + 4);
                  puVar43 = (ulong *)((long)puVar43 + 4);
                }
                if ((puVar46 < puVar60) && ((short)*puVar43 == (short)*puVar46)) {
                  puVar46 = (ulong *)((long)puVar46 + 2);
                  puVar43 = (ulong *)((long)puVar43 + 2);
                }
                if (puVar46 < puVar56) {
                  puVar46 = (ulong *)((long)puVar46 + (ulong)((BYTE)*puVar43 == (BYTE)*puVar46));
                }
                iVar31 = (int)puVar46 - (int)puVar51;
              }
              pBVar58 = (BYTE *)(ulong)(iVar31 + 4);
            }
            uVar35 = (uint)pBVar58;
            bVar24 = true;
            if (local_1f0 < pBVar58) {
              pZVar4[uVar55].off = (int)uVar14 - (uint)((U32)local_108 == 0);
              uVar18 = uVar55 + 1;
              pZVar4[uVar55].len = uVar35;
              bVar62 = (ulong *)((long)puVar37 + (long)pBVar58) != puVar56;
              bVar24 = bVar62 && uVar35 <= uVar17;
              pZVar29 = (ZSTD_matchState_t *)((ulong)pZVar29 & 0xffffffff);
              local_1f0 = (ulong *)pBVar58;
              uVar55 = uVar18;
              if (!bVar62 || uVar35 > uVar17) {
                pZVar29 = (ZSTD_matchState_t *)(ulong)uVar18;
              }
            }
            iVar31 = (int)pZVar29;
            if (!bVar24) break;
            uVar14 = uVar14 + 1;
            bVar61 = uVar14 < uVar34;
          } while (bVar61);
          if (!bVar61) {
            local_c8[uVar32] = uVar22;
            local_168 = (BYTE *)0x0;
            pBVar58 = (BYTE *)0x0;
            uVar14 = (ulong)uVar55;
            do {
              iVar31 = (int)uVar14;
              bVar61 = iVar20 == 0;
              iVar20 = iVar20 + -1;
              if ((bVar61) || (uVar17 = (uint)uVar26, uVar17 < UVar10 + (UVar10 == 0))) break;
              pBVar50 = local_168;
              if (pBVar58 < local_168) {
                pBVar50 = pBVar58;
              }
              puVar51 = (ulong *)((long)puVar37 + (long)pBVar50);
              puVar46 = (ulong *)(pBVar36 + (long)(pBVar50 + uVar26));
              puVar43 = puVar51;
              if (puVar51 < puVar2) {
                uVar34 = *puVar51 ^ *puVar46;
                uVar32 = 0;
                if (uVar34 != 0) {
                  for (; (uVar34 >> uVar32 & 1) == 0; uVar32 = uVar32 + 1) {
                  }
                }
                pBVar54 = (BYTE *)(uVar32 >> 3 & 0x1fffffff);
                if (*puVar46 == *puVar51) {
                  do {
                    puVar43 = puVar43 + 1;
                    puVar46 = puVar46 + 1;
                    if (puVar2 <= puVar43) goto LAB_004405e5;
                    uVar34 = *puVar43 ^ *puVar46;
                    uVar32 = 0;
                    if (uVar34 != 0) {
                      for (; (uVar34 >> uVar32 & 1) == 0; uVar32 = uVar32 + 1) {
                      }
                    }
                    pBVar54 = (BYTE *)((long)puVar43 + ((uVar32 >> 3 & 0x1fffffff) - (long)puVar51))
                    ;
                  } while (*puVar46 == *puVar43);
                }
              }
              else {
LAB_004405e5:
                if ((puVar43 < local_e0) && ((uint)*puVar46 == (uint)*puVar43)) {
                  puVar43 = (ulong *)((long)puVar43 + 4);
                  puVar46 = (ulong *)((long)puVar46 + 4);
                }
                if ((puVar43 < puVar60) && ((short)*puVar46 == (short)*puVar43)) {
                  puVar43 = (ulong *)((long)puVar43 + 2);
                  puVar46 = (ulong *)((long)puVar46 + 2);
                }
                if (puVar43 < puVar56) {
                  puVar43 = (ulong *)((long)puVar43 + (ulong)((BYTE)*puVar46 == (BYTE)*puVar43));
                }
                pBVar54 = (BYTE *)((long)puVar43 - (long)puVar51);
              }
              pBVar54 = pBVar54 + (long)pBVar50;
              if (local_1f0 < pBVar54) {
                iVar25 = uVar17 + (U32)pBVar54;
                if (pBVar54 <= (BYTE *)(ulong)(iVar19 - uVar17)) {
                  iVar25 = iVar19;
                }
                pZVar4[uVar14].off = (uVar22 + 2) - uVar17;
                pZVar4[uVar14].len = (U32)pBVar54;
                uVar14 = (ulong)(iVar31 + 1);
                bVar61 = false;
                iVar19 = iVar25;
                local_1f0 = (ulong *)pBVar54;
                if ((pBVar54 < (BYTE *)0x1001) &&
                   ((ulong *)((long)puVar37 + (long)pBVar54) != puVar56)) goto LAB_0044069f;
              }
              else {
LAB_0044069f:
                puVar23 = pUVar59 + (uVar17 & uVar27) * 2;
                if (pBVar36[(long)(pBVar54 + uVar26)] < *(byte *)((long)puVar37 + (long)pBVar54)) {
                  *local_1a8 = uVar17;
                  pBVar58 = pBVar54;
                  if (uVar9 < uVar17) {
                    puVar23 = puVar23 + 1;
                    local_1a8 = puVar23;
LAB_004406f4:
                    uVar26 = (ulong)*puVar23;
                    bVar61 = true;
                  }
                  else {
                    bVar61 = false;
                    local_1a8 = (uint *)&local_100;
                  }
                }
                else {
                  *(uint *)local_1a0 = uVar17;
                  local_1a0 = (ulong *)puVar23;
                  local_168 = pBVar54;
                  if (uVar9 < uVar17) goto LAB_004406f4;
                  bVar61 = false;
                  local_1a0 = &local_100;
                }
              }
              iVar31 = (int)uVar14;
            } while (bVar61);
LAB_0044113b:
            *(uint *)local_1a0 = 0;
            *local_1a8 = 0;
            ms->nextToUpdate = iVar19 - 8;
          }
        }
        else if (UVar10 == 5) {
          uVar14 = (ulong)((U32)local_108 == 0);
          uVar17 = (ms->cParams).targetLength;
          if (0xffe < uVar17) {
            uVar17 = 0xfff;
          }
          pBVar36 = (ms->window).base;
          uVar22 = iVar19 - (int)pBVar36;
          uVar32 = *puVar37 * -0x30e4432345000000 >> (-(char)(ms->cParams).hashLog & 0x3fU);
          pUVar59 = ms->chainTable;
          uVar27 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
          uVar9 = uVar22 - uVar27;
          uVar55 = 0;
          if (uVar22 < uVar27) {
            uVar9 = 0;
          }
          UVar10 = (ms->window).lowLimit;
          uVar34 = (ulong)((uVar27 & uVar22) * 2);
          local_1a8 = pUVar59 + uVar34;
          local_1a0 = (ulong *)(pUVar59 + uVar34 + 1);
          iVar20 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
          UVar11 = (ms->window).dictLimit;
          bVar61 = true;
          local_c8 = ms->hashTable;
          uVar26 = (ulong)local_c8[uVar32];
          iVar19 = uVar22 + 9;
          uVar34 = uVar14 + 3;
          puVar51 = (ulong *)((long)puVar37 + 4);
          pZVar29 = ms;
          do {
            if (uVar14 == 3) {
              UVar12 = *local_b0 - 1;
            }
            else {
              UVar12 = local_b0[uVar14];
            }
            pBVar58 = (BYTE *)0x0;
            if ((UVar12 - 1 < uVar22 - UVar11) &&
               ((uint)*puVar37 == *(uint *)((long)puVar37 - (ulong)UVar12))) {
              puVar43 = (ulong *)((long)puVar51 - (ulong)UVar12);
              puVar46 = puVar51;
              if (puVar51 < puVar2) {
                uVar48 = *puVar51 ^ *puVar43;
                uVar57 = 0;
                if (uVar48 != 0) {
                  for (; (uVar48 >> uVar57 & 1) == 0; uVar57 = uVar57 + 1) {
                  }
                }
                uVar57 = uVar57 >> 3 & 0x1fffffff;
                iVar31 = (int)uVar57;
                puVar46 = (ulong *)((long)puVar37 + 0xc);
                if (*puVar43 == *puVar51) {
                  do {
                    puVar43 = puVar43 + 1;
                    if (puVar2 <= puVar46) goto LAB_0044092a;
                    uVar48 = *puVar43;
                    uVar28 = *puVar46;
                    uVar5 = 0;
                    if ((uVar28 ^ uVar48) != 0) {
                      for (; ((uVar28 ^ uVar48) >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
                      }
                    }
                    puVar41 = (ulong *)((uVar5 >> 3 & 0x1fffffff) + (long)puVar46);
                    puVar46 = puVar46 + 1;
                    if (uVar48 != uVar28) {
                      uVar57 = (long)puVar41 - (long)puVar51;
                      puVar46 = puVar41;
                    }
                    iVar31 = (int)uVar57;
                  } while (uVar48 == uVar28);
                }
              }
              else {
LAB_0044092a:
                if ((puVar46 < local_e0) && ((uint)*puVar43 == (uint)*puVar46)) {
                  puVar46 = (ulong *)((long)puVar46 + 4);
                  puVar43 = (ulong *)((long)puVar43 + 4);
                }
                if ((puVar46 < puVar60) && ((short)*puVar43 == (short)*puVar46)) {
                  puVar46 = (ulong *)((long)puVar46 + 2);
                  puVar43 = (ulong *)((long)puVar43 + 2);
                }
                if (puVar46 < puVar56) {
                  puVar46 = (ulong *)((long)puVar46 + (ulong)((BYTE)*puVar43 == (BYTE)*puVar46));
                }
                iVar31 = (int)puVar46 - (int)puVar51;
              }
              pBVar58 = (BYTE *)(ulong)(iVar31 + 4);
            }
            uVar35 = (uint)pBVar58;
            bVar24 = true;
            if (local_1f0 < pBVar58) {
              pZVar4[uVar55].off = (int)uVar14 - (uint)((U32)local_108 == 0);
              uVar18 = uVar55 + 1;
              pZVar4[uVar55].len = uVar35;
              bVar62 = (ulong *)((long)puVar37 + (long)pBVar58) != puVar56;
              bVar24 = bVar62 && uVar35 <= uVar17;
              pZVar29 = (ZSTD_matchState_t *)((ulong)pZVar29 & 0xffffffff);
              local_1f0 = (ulong *)pBVar58;
              uVar55 = uVar18;
              if (!bVar62 || uVar35 > uVar17) {
                pZVar29 = (ZSTD_matchState_t *)(ulong)uVar18;
              }
            }
            iVar31 = (int)pZVar29;
            if (!bVar24) break;
            uVar14 = uVar14 + 1;
            bVar61 = uVar14 < uVar34;
          } while (bVar61);
          if (!bVar61) {
            local_c8[uVar32] = uVar22;
            local_168 = (BYTE *)0x0;
            pBVar58 = (BYTE *)0x0;
            uVar14 = (ulong)uVar55;
            do {
              iVar31 = (int)uVar14;
              bVar61 = iVar20 == 0;
              iVar20 = iVar20 + -1;
              if ((bVar61) || (uVar17 = (uint)uVar26, uVar17 < UVar10 + (UVar10 == 0))) break;
              pBVar50 = local_168;
              if (pBVar58 < local_168) {
                pBVar50 = pBVar58;
              }
              puVar51 = (ulong *)((long)puVar37 + (long)pBVar50);
              puVar46 = (ulong *)(pBVar36 + (long)(pBVar50 + uVar26));
              puVar43 = puVar51;
              if (puVar51 < puVar2) {
                uVar34 = *puVar51 ^ *puVar46;
                uVar32 = 0;
                if (uVar34 != 0) {
                  for (; (uVar34 >> uVar32 & 1) == 0; uVar32 = uVar32 + 1) {
                  }
                }
                pBVar54 = (BYTE *)(uVar32 >> 3 & 0x1fffffff);
                if (*puVar46 == *puVar51) {
                  do {
                    puVar43 = puVar43 + 1;
                    puVar46 = puVar46 + 1;
                    if (puVar2 <= puVar43) goto LAB_00440ae9;
                    uVar34 = *puVar43 ^ *puVar46;
                    uVar32 = 0;
                    if (uVar34 != 0) {
                      for (; (uVar34 >> uVar32 & 1) == 0; uVar32 = uVar32 + 1) {
                      }
                    }
                    pBVar54 = (BYTE *)((long)puVar43 + ((uVar32 >> 3 & 0x1fffffff) - (long)puVar51))
                    ;
                  } while (*puVar46 == *puVar43);
                }
              }
              else {
LAB_00440ae9:
                if ((puVar43 < local_e0) && ((uint)*puVar46 == (uint)*puVar43)) {
                  puVar43 = (ulong *)((long)puVar43 + 4);
                  puVar46 = (ulong *)((long)puVar46 + 4);
                }
                if ((puVar43 < puVar60) && ((short)*puVar46 == (short)*puVar43)) {
                  puVar43 = (ulong *)((long)puVar43 + 2);
                  puVar46 = (ulong *)((long)puVar46 + 2);
                }
                if (puVar43 < puVar56) {
                  puVar43 = (ulong *)((long)puVar43 + (ulong)((BYTE)*puVar46 == (BYTE)*puVar43));
                }
                pBVar54 = (BYTE *)((long)puVar43 - (long)puVar51);
              }
              pBVar54 = pBVar54 + (long)pBVar50;
              if (local_1f0 < pBVar54) {
                iVar25 = uVar17 + (U32)pBVar54;
                if (pBVar54 <= (BYTE *)(ulong)(iVar19 - uVar17)) {
                  iVar25 = iVar19;
                }
                pZVar4[uVar14].off = (uVar22 + 2) - uVar17;
                pZVar4[uVar14].len = (U32)pBVar54;
                uVar14 = (ulong)(iVar31 + 1);
                bVar61 = false;
                iVar19 = iVar25;
                local_1f0 = (ulong *)pBVar54;
                if ((pBVar54 < (BYTE *)0x1001) &&
                   ((ulong *)((long)puVar37 + (long)pBVar54) != puVar56)) goto LAB_00440ba3;
              }
              else {
LAB_00440ba3:
                puVar23 = pUVar59 + (uVar17 & uVar27) * 2;
                if (pBVar36[(long)(pBVar54 + uVar26)] < *(byte *)((long)puVar37 + (long)pBVar54)) {
                  *local_1a8 = uVar17;
                  pBVar58 = pBVar54;
                  if (uVar9 < uVar17) {
                    puVar23 = puVar23 + 1;
                    local_1a8 = puVar23;
LAB_00440bf8:
                    uVar26 = (ulong)*puVar23;
                    bVar61 = true;
                  }
                  else {
                    bVar61 = false;
                    local_1a8 = (uint *)&local_100;
                  }
                }
                else {
                  *(uint *)local_1a0 = uVar17;
                  local_1a0 = (ulong *)puVar23;
                  local_168 = pBVar54;
                  if (uVar9 < uVar17) goto LAB_00440bf8;
                  bVar61 = false;
                  local_1a0 = &local_100;
                }
              }
              iVar31 = (int)uVar14;
            } while (bVar61);
            goto LAB_0044113b;
          }
        }
        else if (UVar10 == 3) {
          uVar14 = (ulong)((U32)local_108 == 0);
          uVar17 = (ms->cParams).targetLength;
          if (0xffe < uVar17) {
            uVar17 = 0xfff;
          }
          pBVar36 = (ms->window).base;
          uVar27 = iVar19 - (int)pBVar36;
          uVar22 = (uint)*puVar37 * -0x61c8864f >> (-(char)(ms->cParams).hashLog & 0x1fU);
          pUVar59 = ms->chainTable;
          uVar9 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
          uVar55 = uVar27 - uVar9;
          if (uVar27 < uVar9) {
            uVar55 = 0;
          }
          UVar10 = (ms->window).lowLimit;
          uVar35 = UVar10 + (UVar10 == 0);
          uVar32 = (ulong)((uVar9 & uVar27) * 2);
          local_1b0 = (ulong *)(pUVar59 + uVar32);
          local_148 = pUVar59 + uVar32 + 1;
          iVar19 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
          UVar10 = (ms->window).dictLimit;
          bVar61 = true;
          pUVar38 = ms->hashTable;
          UVar11 = pUVar38[uVar22];
          iVar20 = uVar27 + 9;
          uVar32 = uVar14 + 3;
          puVar51 = (ulong *)((long)puVar37 + 3);
          pZVar29 = ms;
          pZVar52 = (ZSTD_matchState_t *)0x0;
          pBVar58 = (BYTE *)local_d0;
          do {
            if (uVar14 == 3) {
              UVar12 = *local_b0 - 1;
            }
            else {
              UVar12 = local_b0[uVar14];
            }
            pBVar50 = (BYTE *)0x0;
            if ((UVar12 - 1 < uVar27 - UVar10) &&
               (((*(uint *)((long)puVar37 - (ulong)UVar12) ^ (uint)*puVar37) & 0xffffff) == 0)) {
              puVar43 = (ulong *)((long)puVar51 - (ulong)UVar12);
              puVar46 = puVar51;
              if (puVar51 < puVar2) {
                uVar26 = *puVar51 ^ *puVar43;
                uVar34 = 0;
                if (uVar26 != 0) {
                  for (; (uVar26 >> uVar34 & 1) == 0; uVar34 = uVar34 + 1) {
                  }
                }
                uVar34 = uVar34 >> 3 & 0x1fffffff;
                iVar31 = (int)uVar34;
                puVar46 = (ulong *)((long)puVar37 + 0xb);
                if (*puVar43 == *puVar51) {
                  do {
                    puVar43 = puVar43 + 1;
                    if (puVar2 <= puVar46) goto LAB_00440159;
                    uVar26 = *puVar43;
                    uVar57 = *puVar46;
                    uVar48 = 0;
                    if ((uVar57 ^ uVar26) != 0) {
                      for (; ((uVar57 ^ uVar26) >> uVar48 & 1) == 0; uVar48 = uVar48 + 1) {
                      }
                    }
                    puVar41 = (ulong *)((uVar48 >> 3 & 0x1fffffff) + (long)puVar46);
                    puVar46 = puVar46 + 1;
                    if (uVar26 != uVar57) {
                      uVar34 = (long)puVar41 - (long)puVar51;
                      puVar46 = puVar41;
                    }
                    iVar31 = (int)uVar34;
                  } while (uVar26 == uVar57);
                }
              }
              else {
LAB_00440159:
                if ((puVar46 < local_e0) && ((uint)*puVar43 == (uint)*puVar46)) {
                  puVar46 = (ulong *)((long)puVar46 + 4);
                  puVar43 = (ulong *)((long)puVar43 + 4);
                }
                if ((puVar46 < puVar60) && ((short)*puVar43 == (short)*puVar46)) {
                  puVar46 = (ulong *)((long)puVar46 + 2);
                  puVar43 = (ulong *)((long)puVar43 + 2);
                }
                if (puVar46 < puVar56) {
                  puVar46 = (ulong *)((long)puVar46 + (ulong)((BYTE)*puVar43 == (BYTE)*puVar46));
                }
                iVar31 = (int)puVar46 - (int)puVar51;
              }
              pBVar50 = (BYTE *)(ulong)(iVar31 + 3);
            }
            uVar18 = (uint)pBVar50;
            bVar24 = true;
            pZVar53 = pZVar52;
            if (pBVar58 < pBVar50) {
              pZVar4[(long)pZVar52].off = (int)uVar14 - (uint)((U32)local_108 == 0);
              pZVar53 = (ZSTD_matchState_t *)(ulong)((int)pZVar52 + 1);
              pZVar4[(long)pZVar52].len = uVar18;
              bVar62 = (ulong *)((long)puVar37 + (long)pBVar50) != puVar56;
              bVar24 = bVar62 && uVar18 <= uVar17;
              pZVar29 = (ZSTD_matchState_t *)((ulong)pZVar29 & 0xffffffff);
              pBVar58 = pBVar50;
              if (!bVar62 || uVar18 > uVar17) {
                pZVar29 = pZVar53;
              }
            }
            iVar31 = (int)pZVar29;
            if (!bVar24) break;
            uVar14 = uVar14 + 1;
            bVar61 = uVar14 < uVar32;
            pZVar52 = pZVar53;
          } while (bVar61);
          if (!bVar61) {
            if (pBVar58 < (BYTE *)0x3) {
              UVar10 = ZSTD_insertAndFindFirstIndexHash3(ms,(BYTE *)puVar37);
              bVar61 = true;
              if ((uVar35 <= UVar10) && (uVar27 - UVar10 < 0x40000)) {
                puVar46 = (ulong *)(pBVar36 + UVar10);
                puVar51 = puVar37;
                if (puVar37 < puVar2) {
                  uVar32 = *puVar37 ^ *puVar46;
                  uVar14 = 0;
                  if (uVar32 != 0) {
                    for (; (uVar32 >> uVar14 & 1) == 0; uVar14 = uVar14 + 1) {
                    }
                  }
                  pBVar50 = (BYTE *)(uVar14 >> 3 & 0x1fffffff);
                  if (*puVar46 == *puVar37) {
                    do {
                      puVar51 = puVar51 + 1;
                      puVar46 = puVar46 + 1;
                      if (puVar2 <= puVar51) goto LAB_00441229;
                      uVar32 = *puVar51 ^ *puVar46;
                      uVar14 = 0;
                      if (uVar32 != 0) {
                        for (; (uVar32 >> uVar14 & 1) == 0; uVar14 = uVar14 + 1) {
                        }
                      }
                      pBVar50 = (BYTE *)((long)puVar51 +
                                        ((uVar14 >> 3 & 0x1fffffff) - (long)puVar37));
                    } while (*puVar46 == *puVar51);
                  }
                }
                else {
LAB_00441229:
                  if ((puVar51 < local_e0) && ((uint)*puVar46 == (uint)*puVar51)) {
                    puVar51 = (ulong *)((long)puVar51 + 4);
                    puVar46 = (ulong *)((long)puVar46 + 4);
                  }
                  if ((puVar51 < puVar60) && ((short)*puVar46 == (short)*puVar51)) {
                    puVar51 = (ulong *)((long)puVar51 + 2);
                    puVar46 = (ulong *)((long)puVar46 + 2);
                  }
                  if (puVar51 < puVar56) {
                    puVar51 = (ulong *)((long)puVar51 + (ulong)((BYTE)*puVar46 == (BYTE)*puVar51));
                  }
                  pBVar50 = (BYTE *)((long)puVar51 - (long)puVar37);
                }
                if ((BYTE *)0x2 < pBVar50) {
                  pZVar4->off = (uVar27 - UVar10) + 2;
                  pZVar4->len = (U32)pBVar50;
                  pBVar58 = pBVar50;
                  if (((BYTE *)(ulong)uVar17 < pBVar50) ||
                     (pZVar53 = (ZSTD_matchState_t *)0x1,
                     (ulong *)((long)puVar37 + (long)pBVar50) == puVar56)) {
                    ms->nextToUpdate = uVar27 + 1;
                    pZVar53 = (ZSTD_matchState_t *)0x1;
                    bVar61 = false;
                    iVar31 = 1;
                  }
                }
              }
              if (!bVar61) goto LAB_00441560;
            }
            pUVar38[uVar22] = uVar27;
            pBVar50 = (BYTE *)0x0;
            pBVar54 = (BYTE *)0x0;
            do {
              iVar31 = (int)pZVar53;
              bVar61 = iVar19 == 0;
              iVar19 = iVar19 + -1;
              if ((bVar61) || (UVar11 < uVar35)) break;
              pBVar33 = pBVar50;
              if (pBVar54 < pBVar50) {
                pBVar33 = pBVar54;
              }
              puVar43 = (ulong *)((long)puVar37 + (long)pBVar33);
              puVar51 = (ulong *)(pBVar36 + (long)(pBVar33 + UVar11));
              puVar46 = puVar43;
              if (puVar43 < puVar2) {
                uVar32 = *puVar43 ^ *puVar51;
                uVar14 = 0;
                if (uVar32 != 0) {
                  for (; (uVar32 >> uVar14 & 1) == 0; uVar14 = uVar14 + 1) {
                  }
                }
                pBVar49 = (BYTE *)(uVar14 >> 3 & 0x1fffffff);
                if (*puVar51 == *puVar43) {
                  do {
                    puVar46 = puVar46 + 1;
                    puVar51 = puVar51 + 1;
                    if (puVar2 <= puVar46) goto LAB_004413aa;
                    uVar32 = *puVar46 ^ *puVar51;
                    uVar14 = 0;
                    if (uVar32 != 0) {
                      for (; (uVar32 >> uVar14 & 1) == 0; uVar14 = uVar14 + 1) {
                      }
                    }
                    pBVar49 = (BYTE *)((long)puVar46 + ((uVar14 >> 3 & 0x1fffffff) - (long)puVar43))
                    ;
                  } while (*puVar51 == *puVar46);
                }
              }
              else {
LAB_004413aa:
                if ((puVar46 < local_e0) && ((uint)*puVar51 == (uint)*puVar46)) {
                  puVar46 = (ulong *)((long)puVar46 + 4);
                  puVar51 = (ulong *)((long)puVar51 + 4);
                }
                if ((puVar46 < puVar60) && ((short)*puVar51 == (short)*puVar46)) {
                  puVar46 = (ulong *)((long)puVar46 + 2);
                  puVar51 = (ulong *)((long)puVar51 + 2);
                }
                if (puVar46 < puVar56) {
                  puVar46 = (ulong *)((long)puVar46 + (ulong)((BYTE)*puVar51 == (BYTE)*puVar46));
                }
                pBVar49 = (BYTE *)((long)puVar46 - (long)puVar43);
              }
              pBVar49 = pBVar49 + (long)pBVar33;
              iVar25 = iVar20;
              if (pBVar58 < pBVar49) {
                iVar25 = (U32)pBVar49 + UVar11;
                if (pBVar49 <= (BYTE *)(ulong)(iVar20 - UVar11)) {
                  iVar25 = iVar20;
                }
                pZVar4[(long)pZVar53].off = (uVar27 + 2) - UVar11;
                pZVar4[(long)pZVar53].len = (U32)pBVar49;
                pZVar53 = (ZSTD_matchState_t *)(ulong)(iVar31 + 1);
                bVar61 = false;
                iVar20 = iVar25;
                if (pBVar49 < (BYTE *)0x1001) {
                  pBVar58 = pBVar49;
                  if ((ulong *)((long)puVar37 + (long)pBVar49) != puVar56) goto LAB_00441470;
LAB_00441509:
                  bVar61 = false;
                  iVar20 = iVar25;
                }
              }
              else {
LAB_00441470:
                pUVar38 = pUVar59 + (UVar11 & uVar9) * 2;
                iVar20 = iVar25;
                if (pBVar36[(long)(pBVar49 + UVar11)] < *(byte *)((long)puVar37 + (long)pBVar49)) {
                  *(U32 *)local_1b0 = UVar11;
                  pBVar54 = pBVar49;
                  if (UVar11 <= uVar55) {
                    bVar61 = false;
                    local_1b0 = &local_100;
                    pBVar49 = pBVar58;
                    goto LAB_00441517;
                  }
                  pUVar38 = pUVar38 + 1;
                  local_1b0 = (ulong *)pUVar38;
                }
                else {
                  *local_148 = UVar11;
                  pBVar50 = pBVar49;
                  local_148 = pUVar38;
                  if (UVar11 <= uVar55) {
                    local_148 = (U32 *)&local_100;
                    pBVar49 = pBVar58;
                    goto LAB_00441509;
                  }
                }
                UVar11 = *pUVar38;
                bVar61 = true;
                pBVar49 = pBVar58;
              }
LAB_00441517:
              iVar31 = (int)pZVar53;
              pBVar58 = pBVar49;
            } while (bVar61);
            *local_148 = 0;
            *(U32 *)local_1b0 = 0;
            ms->nextToUpdate = iVar20 - 8;
          }
        }
        else {
          uVar14 = (ulong)((U32)local_108 == 0);
          uVar17 = (ms->cParams).targetLength;
          if (0xffe < uVar17) {
            uVar17 = 0xfff;
          }
          pBVar36 = (ms->window).base;
          uVar27 = iVar19 - (int)pBVar36;
          uVar35 = (uint)*puVar37 * -0x61c8864f >> (-(char)(ms->cParams).hashLog & 0x1fU);
          pUVar59 = ms->chainTable;
          uVar22 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
          uVar9 = uVar27 - uVar22;
          uVar55 = 0;
          if (uVar27 < uVar22) {
            uVar9 = 0;
          }
          UVar10 = (ms->window).lowLimit;
          uVar32 = (ulong)((uVar22 & uVar27) * 2);
          local_1a8 = pUVar59 + uVar32;
          local_1a0 = (ulong *)(pUVar59 + uVar32 + 1);
          iVar20 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
          UVar11 = (ms->window).dictLimit;
          bVar61 = true;
          local_c8 = ms->hashTable;
          uVar34 = (ulong)local_c8[uVar35];
          iVar19 = uVar27 + 9;
          uVar32 = uVar14 + 3;
          puVar51 = (ulong *)((long)puVar37 + 4);
          pZVar29 = ms;
          do {
            if (uVar14 == 3) {
              UVar12 = *local_b0 - 1;
            }
            else {
              UVar12 = local_b0[uVar14];
            }
            pBVar58 = (BYTE *)0x0;
            if ((UVar12 - 1 < uVar27 - UVar11) &&
               ((uint)*puVar37 == *(uint *)((long)puVar37 - (ulong)UVar12))) {
              puVar43 = (ulong *)((long)puVar51 - (ulong)UVar12);
              puVar46 = puVar51;
              if (puVar51 < puVar2) {
                uVar57 = *puVar51 ^ *puVar43;
                uVar26 = 0;
                if (uVar57 != 0) {
                  for (; (uVar57 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
                  }
                }
                uVar26 = uVar26 >> 3 & 0x1fffffff;
                iVar31 = (int)uVar26;
                puVar46 = (ulong *)((long)puVar37 + 0xc);
                if (*puVar43 == *puVar51) {
                  do {
                    puVar43 = puVar43 + 1;
                    if (puVar2 <= puVar46) goto LAB_00440e26;
                    uVar57 = *puVar43;
                    uVar48 = *puVar46;
                    uVar28 = 0;
                    if ((uVar48 ^ uVar57) != 0) {
                      for (; ((uVar48 ^ uVar57) >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
                      }
                    }
                    puVar41 = (ulong *)((uVar28 >> 3 & 0x1fffffff) + (long)puVar46);
                    puVar46 = puVar46 + 1;
                    if (uVar57 != uVar48) {
                      uVar26 = (long)puVar41 - (long)puVar51;
                      puVar46 = puVar41;
                    }
                    iVar31 = (int)uVar26;
                  } while (uVar57 == uVar48);
                }
              }
              else {
LAB_00440e26:
                if ((puVar46 < local_e0) && ((uint)*puVar43 == (uint)*puVar46)) {
                  puVar46 = (ulong *)((long)puVar46 + 4);
                  puVar43 = (ulong *)((long)puVar43 + 4);
                }
                if ((puVar46 < puVar60) && ((short)*puVar43 == (short)*puVar46)) {
                  puVar46 = (ulong *)((long)puVar46 + 2);
                  puVar43 = (ulong *)((long)puVar43 + 2);
                }
                if (puVar46 < puVar56) {
                  puVar46 = (ulong *)((long)puVar46 + (ulong)((BYTE)*puVar43 == (BYTE)*puVar46));
                }
                iVar31 = (int)puVar46 - (int)puVar51;
              }
              pBVar58 = (BYTE *)(ulong)(iVar31 + 4);
            }
            uVar18 = (uint)pBVar58;
            bVar24 = true;
            if (local_1f0 < pBVar58) {
              pZVar4[uVar55].off = (int)uVar14 - (uint)((U32)local_108 == 0);
              uVar40 = uVar55 + 1;
              pZVar4[uVar55].len = uVar18;
              bVar62 = (ulong *)((long)puVar37 + (long)pBVar58) != puVar56;
              bVar24 = bVar62 && uVar18 <= uVar17;
              pZVar29 = (ZSTD_matchState_t *)((ulong)pZVar29 & 0xffffffff);
              local_1f0 = (ulong *)pBVar58;
              uVar55 = uVar40;
              if (!bVar62 || uVar18 > uVar17) {
                pZVar29 = (ZSTD_matchState_t *)(ulong)uVar40;
              }
            }
            iVar31 = (int)pZVar29;
            if (!bVar24) break;
            uVar14 = uVar14 + 1;
            bVar61 = uVar14 < uVar32;
          } while (bVar61);
          if (!bVar61) {
            local_c8[uVar35] = uVar27;
            local_168 = (BYTE *)0x0;
            pBVar58 = (BYTE *)0x0;
            uVar14 = (ulong)uVar55;
            do {
              iVar31 = (int)uVar14;
              bVar61 = iVar20 == 0;
              iVar20 = iVar20 + -1;
              if ((bVar61) || (uVar17 = (uint)uVar34, uVar17 < UVar10 + (UVar10 == 0))) break;
              pBVar50 = local_168;
              if (pBVar58 < local_168) {
                pBVar50 = pBVar58;
              }
              puVar51 = (ulong *)((long)puVar37 + (long)pBVar50);
              puVar46 = (ulong *)(pBVar36 + (long)(pBVar50 + uVar34));
              puVar43 = puVar51;
              if (puVar51 < puVar2) {
                uVar26 = *puVar51 ^ *puVar46;
                uVar32 = 0;
                if (uVar26 != 0) {
                  for (; (uVar26 >> uVar32 & 1) == 0; uVar32 = uVar32 + 1) {
                  }
                }
                pBVar54 = (BYTE *)(uVar32 >> 3 & 0x1fffffff);
                if (*puVar46 == *puVar51) {
                  do {
                    puVar43 = puVar43 + 1;
                    puVar46 = puVar46 + 1;
                    if (puVar2 <= puVar43) goto LAB_00440fe3;
                    uVar26 = *puVar43 ^ *puVar46;
                    uVar32 = 0;
                    if (uVar26 != 0) {
                      for (; (uVar26 >> uVar32 & 1) == 0; uVar32 = uVar32 + 1) {
                      }
                    }
                    pBVar54 = (BYTE *)((long)puVar43 + ((uVar32 >> 3 & 0x1fffffff) - (long)puVar51))
                    ;
                  } while (*puVar46 == *puVar43);
                }
              }
              else {
LAB_00440fe3:
                if ((puVar43 < local_e0) && ((uint)*puVar46 == (uint)*puVar43)) {
                  puVar43 = (ulong *)((long)puVar43 + 4);
                  puVar46 = (ulong *)((long)puVar46 + 4);
                }
                if ((puVar43 < puVar60) && ((short)*puVar46 == (short)*puVar43)) {
                  puVar43 = (ulong *)((long)puVar43 + 2);
                  puVar46 = (ulong *)((long)puVar46 + 2);
                }
                if (puVar43 < puVar56) {
                  puVar43 = (ulong *)((long)puVar43 + (ulong)((BYTE)*puVar46 == (BYTE)*puVar43));
                }
                pBVar54 = (BYTE *)((long)puVar43 - (long)puVar51);
              }
              pBVar54 = pBVar54 + (long)pBVar50;
              if (local_1f0 < pBVar54) {
                iVar25 = uVar17 + (U32)pBVar54;
                if (pBVar54 <= (BYTE *)(ulong)(iVar19 - uVar17)) {
                  iVar25 = iVar19;
                }
                pZVar4[uVar14].off = (uVar27 + 2) - uVar17;
                pZVar4[uVar14].len = (U32)pBVar54;
                uVar14 = (ulong)(iVar31 + 1);
                bVar61 = false;
                iVar19 = iVar25;
                local_1f0 = (ulong *)pBVar54;
                if ((pBVar54 < (BYTE *)0x1001) &&
                   ((ulong *)((long)puVar37 + (long)pBVar54) != puVar56)) goto LAB_0044109d;
              }
              else {
LAB_0044109d:
                puVar23 = pUVar59 + (uVar17 & uVar22) * 2;
                if (pBVar36[(long)(pBVar54 + uVar34)] < *(byte *)((long)puVar37 + (long)pBVar54)) {
                  *local_1a8 = uVar17;
                  pBVar58 = pBVar54;
                  if (uVar9 < uVar17) {
                    puVar23 = puVar23 + 1;
                    local_1a8 = puVar23;
LAB_004410f2:
                    uVar34 = (ulong)*puVar23;
                    bVar61 = true;
                  }
                  else {
                    bVar61 = false;
                    local_1a8 = (uint *)&local_100;
                  }
                }
                else {
                  *(uint *)local_1a0 = uVar17;
                  local_1a0 = (ulong *)puVar23;
                  local_168 = pBVar54;
                  if (uVar9 < uVar17) goto LAB_004410f2;
                  bVar61 = false;
                  local_1a0 = &local_100;
                }
              }
              iVar31 = (int)uVar14;
            } while (bVar61);
            goto LAB_0044113b;
          }
        }
      }
LAB_00441560:
      if (iVar31 == 0) {
        puVar37 = (ulong *)((long)puVar37 + 1);
        uVar14 = 0;
        iVar31 = 2;
      }
      else {
        local_90 = (ZSTD_optimal_t *)
                   CONCAT44(local_90._4_4_,
                            CONCAT31((int3)((ulong)local_90 >> 8),(undefined1)local_a8));
        lVar21 = 0;
        do {
          pZVar44->rep[lVar21] = local_b0[lVar21];
          lVar21 = lVar21 + 1;
        } while (lVar21 != 3);
        pZVar44->mlen = 0;
        pZVar44->litlen = (U32)local_108;
        iVar19 = ZSTD_literalsContribution((BYTE *)local_80,(U32)local_108,local_98,2);
        pZVar44->price = iVar19;
        uVar17 = pZVar4[iVar31 - 1U].len;
        if ((uint)local_118 < uVar17) {
          local_d4 = pZVar4[iVar31 - 1U].off;
          uVar14 = (ulong)(uVar17 + (int)local_108);
          puVar15 = (ulong *)0x0;
          iVar31 = 7;
          local_150 = (ZSTD_optimal_t *)(ulong)uVar17;
          local_88 = (ZSTD_optimal_t *)((ulong)local_108 & 0xffffffff);
        }
        else {
          UVar10 = ZSTD_litLengthPrice(0,local_98,2);
          uVar14 = 1;
          pZVar16 = local_110;
          do {
            pZVar16->price = 0x40000000;
            uVar14 = uVar14 + 1;
            pZVar16 = pZVar16 + 1;
          } while (local_a0 != uVar14);
          uVar32 = 0;
          do {
            UVar11 = pZVar4[uVar32].off;
            uVar17 = pZVar4[uVar32].len;
            rVar63 = ZSTD_updateRep(local_b0,UVar11,(U32)local_90);
            if ((uint)uVar14 <= uVar17) {
              uVar55 = 0x1f;
              if (UVar11 + 1 != 0) {
                for (; UVar11 + 1 >> uVar55 == 0; uVar55 = uVar55 - 1) {
                }
              }
              uVar9 = (uint)uVar14 * 0x100 - 0x200;
              do {
                UVar12 = (U32)uVar14;
                if ((ms->opt).priceType == zop_predef) {
                  iVar20 = 0x1f;
                  if (UVar12 - 2 != 0) {
                    for (; UVar12 - 2 >> iVar20 == 0; iVar20 = iVar20 + -1) {
                    }
                  }
                  iVar20 = (iVar20 + uVar55) * 0x100 + (uVar9 >> ((byte)iVar20 & 0x1f)) + 0x1000;
                }
                else {
                  uVar22 = UVar12 - 3;
                  uVar27 = (ms->opt).offCodeFreq[uVar55] + 1;
                  iVar20 = 0x1f;
                  if (uVar27 != 0) {
                    for (; uVar27 >> iVar20 == 0; iVar20 = iVar20 + -1) {
                    }
                  }
                  if (uVar22 < 0x80) {
                    uVar22 = (uint)(byte)(&ZSTD_MLcode_ML_Code)[uVar22];
                  }
                  else {
                    uVar35 = 0x1f;
                    if (uVar22 != 0) {
                      for (; uVar22 >> uVar35 == 0; uVar35 = uVar35 - 1) {
                      }
                    }
                    uVar22 = (uVar35 ^ 0xffffffe0) + 0x44;
                  }
                  uVar35 = (ms->opt).matchLengthFreq[uVar22] + 1;
                  iVar25 = 0x1f;
                  if (uVar35 != 0) {
                    for (; uVar35 >> iVar25 == 0; iVar25 = iVar25 + -1) {
                    }
                  }
                  iVar20 = ((ML_bits[uVar22] + uVar55) - (iVar20 + iVar25)) * 0x100 +
                           (((ms->opt).offCodeSumBasePrice + (ms->opt).matchLengthSumBasePrice) -
                           ((uVar27 * 0x100 >> ((byte)iVar20 & 0x1f)) +
                           (uVar35 * 0x100 >> ((byte)iVar25 & 0x1f)))) + 0x33;
                }
                uVar14 = uVar14 & 0xffffffff;
                pZVar44[uVar14].mlen = UVar12;
                pZVar44[uVar14].off = UVar11;
                pZVar44[uVar14].litlen = (U32)local_108;
                pZVar44[uVar14].price = iVar20 + UVar10 + iVar19;
                *(long *)pZVar44[uVar14].rep = rVar63.rep._0_8_;
                pZVar44[uVar14].rep[2] = rVar63.rep[2];
                uVar14 = (ulong)(UVar12 + 1);
                uVar9 = uVar9 + 0x100;
              } while (UVar12 + 1 <= uVar17);
            }
            uVar32 = uVar32 + 1;
          } while (uVar32 != iVar31 + (uint)(iVar31 == 0));
          uVar14 = (ulong)((int)uVar14 - 1);
          iVar31 = 0;
        }
      }
      if (iVar31 == 7) {
LAB_004434e0:
        uVar55 = (int)puVar15 + 1;
        local_108 = (ZSTD_optimal_t *)(ulong)uVar55;
        pZVar44[(long)local_108].price = local_74;
        pZVar44[(long)local_108].off = local_d4;
        pZVar44[(long)local_108].mlen = (U32)local_150;
        pZVar44[(long)local_108].litlen = (U32)local_88;
        *(undefined8 *)pZVar44[(long)local_108].rep = local_50;
        pZVar44[(long)local_108].rep[2] = local_48;
        uVar14 = (ulong)puVar15 & 0xffffffff;
        uVar32 = (ulong)puVar15 & 0xffffffff;
        uVar17 = uVar55;
        if ((int)puVar15 != 0) {
          do {
            uVar9 = (uint)uVar32;
            uVar27 = pZVar44[uVar32].litlen + pZVar44[uVar32].mlen;
            uVar17 = (uint)uVar14;
            pZVar16 = pZVar44 + uVar32;
            iVar31 = pZVar16->price;
            UVar11 = pZVar16->off;
            UVar12 = pZVar16->mlen;
            UVar13 = pZVar16->litlen;
            pZVar16 = pZVar44 + uVar32;
            UVar10 = pZVar16->rep[0];
            uVar7 = *(undefined8 *)(&pZVar16->litlen + 2);
            pZVar42 = pZVar44 + uVar14;
            pZVar42->litlen = pZVar16->litlen;
            pZVar42->rep[0] = UVar10;
            *(undefined8 *)(&pZVar42->litlen + 2) = uVar7;
            pZVar16 = pZVar44 + uVar14;
            pZVar16->price = iVar31;
            pZVar16->off = UVar11;
            pZVar16->mlen = UVar12;
            pZVar16->litlen = UVar13;
            uVar14 = (ulong)(uVar17 - 1);
            uVar32 = (ulong)(uVar9 - uVar27);
            if (uVar27 > uVar9) {
              uVar32 = 0;
            }
          } while (uVar27 <= uVar9 && uVar9 - uVar27 != 0);
        }
        if (uVar17 <= uVar55) {
          do {
            puVar37 = local_80;
            uVar55 = pZVar44[uVar17].litlen;
            uVar14 = (ulong)uVar55;
            UVar10 = pZVar44[uVar17].mlen;
            if (UVar10 == 0) {
              puVar37 = (ulong *)(uVar14 + (long)local_80);
            }
            else {
              uVar9 = pZVar44[uVar17].off;
              if (uVar9 < 3) {
                uVar27 = (uVar14 == 0) + uVar9;
                if (uVar27 != 0) {
                  if (uVar27 == 3) {
                    UVar11 = *local_b0 - 1;
                  }
                  else {
                    UVar11 = local_b0[uVar27];
                  }
                  if (uVar27 != 1) {
                    local_b0[2] = local_b0[1];
                  }
                  local_b0[1] = *local_b0;
                  goto LAB_00443658;
                }
              }
              else {
                *(undefined8 *)(local_b0 + 1) = *(undefined8 *)local_b0;
                UVar11 = uVar9 - 2;
LAB_00443658:
                *local_b0 = UVar11;
              }
              ZSTD_updateStats(local_98,uVar55,(BYTE *)local_80,uVar9,UVar10);
              puVar46 = (ulong *)seqStore->lit;
              puVar51 = (ulong *)((long)puVar46 + uVar14);
              do {
                *puVar46 = *puVar37;
                puVar46 = puVar46 + 1;
                puVar37 = puVar37 + 1;
              } while (puVar46 < puVar51);
              seqStore->lit = seqStore->lit + uVar14;
              if (0xffff < uVar55) {
                seqStore->longLengthID = 1;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3)
                ;
              }
              psVar3 = seqStore->sequences;
              psVar3->litLength = (U16)uVar55;
              psVar3->offset = uVar9 + 1;
              if (0xffff < UVar10 - 3) {
                seqStore->longLengthID = 2;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar3 - (long)seqStore->sequencesStart) >> 3);
              }
              psVar3->matchLength = (U16)(UVar10 - 3);
              seqStore->sequences = psVar3 + 1;
              puVar37 = (ulong *)((long)local_80 + (ulong)(UVar10 + uVar55));
              local_80 = puVar37;
            }
            uVar17 = uVar17 + 1;
          } while (uVar17 <= (U32)local_108);
        }
        ZSTD_setBasePrices(local_98,2);
      }
      else if (iVar31 == 0) {
        if ((int)uVar14 != 0) {
          puVar15 = (ulong *)0x1;
          do {
            poVar8 = local_98;
            iVar31 = (int)puVar15;
            local_90 = pZVar44 + (iVar31 - 1U);
            UVar10 = 1;
            if (pZVar44[iVar31 - 1U].mlen == 0) {
              UVar10 = local_90->litlen + 1;
            }
            puVar51 = (ulong *)((long)puVar37 + (long)puVar15);
            iVar19 = 0x600;
            if ((ms->opt).priceType != zop_predef) {
              uVar17 = (ms->opt).litFreq[*(byte *)((long)puVar51 + -1)] + 1;
              iVar19 = 0x1f;
              if (uVar17 != 0) {
                for (; uVar17 >> iVar19 == 0; iVar19 = iVar19 + -1) {
                }
              }
              iVar19 = (ms->opt).litSumBasePrice -
                       (iVar19 * 0x100 + (uVar17 * 0x100 >> ((byte)iVar19 & 0x1f)));
            }
            iVar20 = local_90->price;
            local_108 = (ZSTD_optimal_t *)puVar15;
            UVar11 = ZSTD_litLengthPrice(UVar10,local_98,2);
            UVar12 = ZSTD_litLengthPrice(UVar10 - 1,poVar8,2);
            iVar19 = (UVar11 + iVar19 + iVar20) - UVar12;
            pZVar16 = pZVar44 + (long)local_108;
            if (iVar19 <= pZVar44[(long)local_108].price) {
              pZVar16->off = 0;
              pZVar16->mlen = 0;
              pZVar16->litlen = UVar10;
              pZVar16->price = iVar19;
              *(undefined8 *)pZVar16->rep = *(undefined8 *)local_90->rep;
              pZVar16->rep[2] = local_90->rep[2];
            }
            uVar17 = 0x13;
            if (puVar51 <= local_e8) {
              if (iVar31 == (int)uVar14) {
                uVar17 = 0x11;
              }
              else {
                UVar10 = pZVar16->mlen;
                local_1e8._0_4_ = 0;
                local_90 = (ZSTD_optimal_t *)0x0;
                if (UVar10 == 0) {
                  local_90 = (ZSTD_optimal_t *)(ulong)pZVar16->litlen;
                }
                local_c8 = (U32 *)CONCAT44(local_c8._4_4_,pZVar16->price);
                UVar11 = ZSTD_litLengthPrice(0,local_98,2);
                pBVar36 = (ms->window).base;
                uVar17 = ms->nextToUpdate;
                uVar32 = (ulong)uVar17;
                local_108._0_4_ = UVar11;
                if (pBVar36 + uVar32 <= puVar51) {
                  UVar11 = (ms->cParams).minMatch;
                  iVar19 = (int)puVar51;
                  uVar55 = iVar19 - (int)pBVar36;
                  while (uVar17 < uVar55) {
                    UVar12 = ZSTD_insertBt1(ms,pBVar36 + uVar32,(BYTE *)puVar56,UVar11,0);
                    uVar17 = (int)uVar32 + UVar12;
                    uVar32 = (ulong)uVar17;
                  }
                  ms->nextToUpdate = uVar55;
                  if (UVar11 - 6 < 2) {
                    uVar32 = (ulong)(UVar10 != 0);
                    uVar17 = (ms->cParams).targetLength;
                    if (0xffe < uVar17) {
                      uVar17 = 0xfff;
                    }
                    pBVar36 = (ms->window).base;
                    uVar9 = iVar19 - (int)pBVar36;
                    local_f0 = (ulong *)(ulong)uVar9;
                    local_68 = (U32 *)(*puVar51 * -0x30e4432340650000 >>
                                      (-(char)(ms->cParams).hashLog & 0x3fU));
                    pUVar59 = ms->chainTable;
                    uVar27 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
                    uVar55 = uVar9 - uVar27;
                    local_1b8 = (BYTE *)0x0;
                    if (uVar9 < uVar27) {
                      uVar55 = 0;
                    }
                    UVar11 = (ms->window).lowLimit;
                    uVar34 = (ulong)((uVar27 & uVar9) * 2);
                    local_198 = pUVar59 + uVar34;
                    local_190 = pUVar59 + uVar34 + 1;
                    iVar20 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
                    UVar12 = (ms->window).dictLimit;
                    local_a8 = -uVar32;
                    bVar61 = true;
                    local_70 = ms->hashTable;
                    uVar26 = (ulong)local_70[(long)local_68];
                    iVar19 = uVar9 + 9;
                    uVar34 = uVar32 + 3;
                    puVar46 = (ulong *)((long)puVar51 + 4);
                    local_b8 = (ulong *)((long)puVar51 + 0xc);
                    pBVar58 = (BYTE *)local_d0;
                    local_1e8 = local_b8;
                    do {
                      if (uVar32 == 3) {
                        uVar22 = pZVar16->rep[0] - 1;
                      }
                      else {
                        uVar22 = pZVar16->rep[uVar32];
                      }
                      pBVar50 = (BYTE *)0x0;
                      if ((uVar22 - 1 < uVar9 - UVar12) &&
                         ((uint)*puVar51 == *(uint *)((long)puVar51 - (ulong)uVar22))) {
                        puVar41 = (ulong *)((long)puVar46 - (ulong)uVar22);
                        puVar43 = puVar46;
                        if (puVar46 < puVar2) {
                          uVar48 = *puVar46 ^ *puVar41;
                          uVar57 = 0;
                          if (uVar48 != 0) {
                            for (; (uVar48 >> uVar57 & 1) == 0; uVar57 = uVar57 + 1) {
                            }
                          }
                          uVar57 = uVar57 >> 3 & 0x1fffffff;
                          iVar25 = (int)uVar57;
                          puVar43 = local_b8;
                          if (*puVar41 == *puVar46) {
                            do {
                              puVar41 = puVar41 + 1;
                              if (puVar2 <= puVar43) goto LAB_0044201a;
                              uVar48 = *puVar41;
                              uVar28 = *puVar43;
                              uVar5 = 0;
                              if ((uVar28 ^ uVar48) != 0) {
                                for (; ((uVar28 ^ uVar48) >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
                                }
                              }
                              puVar45 = (ulong *)((uVar5 >> 3 & 0x1fffffff) + (long)puVar43);
                              puVar43 = puVar43 + 1;
                              if (uVar48 != uVar28) {
                                uVar57 = (long)puVar45 - (long)puVar46;
                                puVar43 = puVar45;
                              }
                              iVar25 = (int)uVar57;
                            } while (uVar48 == uVar28);
                          }
                        }
                        else {
LAB_0044201a:
                          if ((puVar43 < local_e0) && ((uint)*puVar41 == (uint)*puVar43)) {
                            puVar43 = (ulong *)((long)puVar43 + 4);
                            puVar41 = (ulong *)((long)puVar41 + 4);
                          }
                          if ((puVar43 < puVar60) && ((short)*puVar41 == (short)*puVar43)) {
                            puVar43 = (ulong *)((long)puVar43 + 2);
                            puVar41 = (ulong *)((long)puVar41 + 2);
                          }
                          if (puVar43 < puVar56) {
                            puVar43 = (ulong *)((long)puVar43 +
                                               (ulong)((BYTE)*puVar41 == (BYTE)*puVar43));
                          }
                          iVar25 = (int)puVar43 - (int)puVar46;
                        }
                        pBVar50 = (BYTE *)(ulong)(iVar25 + 4);
                      }
                      uVar22 = (uint)pBVar50;
                      bVar24 = true;
                      if (pBVar58 < pBVar50) {
                        pZVar4[(long)local_1b8].off = (int)local_a8 + (int)uVar32;
                        uVar35 = (int)local_1b8 + 1;
                        pZVar4[(long)local_1b8].len = uVar22;
                        bVar62 = (ulong *)((long)puVar51 + (long)pBVar50) != puVar56;
                        bVar24 = bVar62 && uVar22 <= uVar17;
                        local_1b8 = (BYTE *)(ulong)uVar35;
                        local_1e8 = (ulong *)((ulong)local_1e8 & 0xffffffff);
                        pBVar58 = pBVar50;
                        if (!bVar62 || uVar22 > uVar17) {
                          local_1e8 = (ulong *)(ulong)uVar35;
                        }
                      }
                      if (!bVar24) break;
                      uVar32 = uVar32 + 1;
                      bVar61 = uVar32 < uVar34;
                    } while (bVar61);
                    if (!bVar61) {
                      local_70[(long)local_68] = uVar9;
                      local_f0 = (ulong *)(ulong)(uVar9 + 2);
                      local_1e8 = (ulong *)0x0;
                      pBVar50 = (BYTE *)0x0;
                      do {
                        bVar61 = iVar20 == 0;
                        iVar20 = iVar20 + -1;
                        if ((bVar61) || (uVar17 = (uint)uVar26, uVar17 < UVar11 + (UVar11 == 0)))
                        break;
                        puVar46 = local_1e8;
                        if (pBVar50 < local_1e8) {
                          puVar46 = (ulong *)pBVar50;
                        }
                        puVar43 = (ulong *)((long)puVar51 + (long)puVar46);
                        puVar41 = (ulong *)(pBVar36 + (long)((long)puVar46 + uVar26));
                        puVar45 = puVar43;
                        if (puVar43 < puVar2) {
                          uVar34 = *puVar43 ^ *puVar41;
                          uVar32 = 0;
                          if (uVar34 != 0) {
                            for (; (uVar34 >> uVar32 & 1) == 0; uVar32 = uVar32 + 1) {
                            }
                          }
                          pBVar54 = (BYTE *)(uVar32 >> 3 & 0x1fffffff);
                          if (*puVar41 == *puVar43) {
                            do {
                              puVar45 = puVar45 + 1;
                              puVar41 = puVar41 + 1;
                              if (puVar2 <= puVar45) goto LAB_004421dd;
                              uVar34 = *puVar45 ^ *puVar41;
                              uVar32 = 0;
                              if (uVar34 != 0) {
                                for (; (uVar34 >> uVar32 & 1) == 0; uVar32 = uVar32 + 1) {
                                }
                              }
                              pBVar54 = (BYTE *)((long)puVar45 +
                                                ((uVar32 >> 3 & 0x1fffffff) - (long)puVar43));
                            } while (*puVar41 == *puVar45);
                          }
                        }
                        else {
LAB_004421dd:
                          if ((puVar45 < local_e0) && ((uint)*puVar41 == (uint)*puVar45)) {
                            puVar45 = (ulong *)((long)puVar45 + 4);
                            puVar41 = (ulong *)((long)puVar41 + 4);
                          }
                          if ((puVar45 < puVar60) && ((short)*puVar41 == (short)*puVar45)) {
                            puVar45 = (ulong *)((long)puVar45 + 2);
                            puVar41 = (ulong *)((long)puVar41 + 2);
                          }
                          if (puVar45 < puVar56) {
                            puVar45 = (ulong *)((long)puVar45 +
                                               (ulong)((BYTE)*puVar41 == (BYTE)*puVar45));
                          }
                          pBVar54 = (BYTE *)((long)puVar45 - (long)puVar43);
                        }
                        pBVar54 = pBVar54 + (long)puVar46;
                        if (pBVar58 < pBVar54) {
                          iVar25 = uVar17 + (U32)pBVar54;
                          if (pBVar54 <= (BYTE *)(ulong)(iVar19 - uVar17)) {
                            iVar25 = iVar19;
                          }
                          pZVar4[(long)local_1b8].off = (int)local_f0 - uVar17;
                          pZVar4[(long)local_1b8].len = (U32)pBVar54;
                          local_1b8 = (BYTE *)(ulong)((int)local_1b8 + 1);
                          bVar61 = false;
                          pBVar58 = pBVar54;
                          iVar19 = iVar25;
                          if ((pBVar54 < (BYTE *)0x1001) &&
                             ((ulong *)((long)puVar51 + (long)pBVar54) != puVar56))
                          goto LAB_004422a2;
                        }
                        else {
LAB_004422a2:
                          puVar23 = pUVar59 + (uVar17 & uVar27) * 2;
                          if (pBVar36[(long)(pBVar54 + uVar26)] <
                              *(byte *)((long)puVar51 + (long)pBVar54)) {
                            *local_198 = uVar17;
                            pBVar50 = pBVar54;
                            if (uVar55 < uVar17) {
                              puVar23 = puVar23 + 1;
                              local_198 = puVar23;
LAB_004422fd:
                              uVar26 = (ulong)*puVar23;
                              bVar61 = true;
                            }
                            else {
                              bVar61 = false;
                              local_198 = (uint *)&local_100;
                            }
                          }
                          else {
                            *local_190 = uVar17;
                            local_1e8 = (ulong *)pBVar54;
                            local_190 = puVar23;
                            if (uVar55 < uVar17) goto LAB_004422fd;
                            bVar61 = false;
                            local_190 = (uint *)&local_100;
                          }
                        }
                      } while (bVar61);
LAB_00442db5:
                      *local_190 = 0;
                      *local_198 = 0;
                      ms->nextToUpdate = iVar19 - 8;
                      local_1e8._0_4_ = (int)local_1b8;
                    }
                  }
                  else if (UVar11 == 5) {
                    uVar32 = (ulong)(UVar10 != 0);
                    uVar17 = (ms->cParams).targetLength;
                    if (0xffe < uVar17) {
                      uVar17 = 0xfff;
                    }
                    pBVar36 = (ms->window).base;
                    uVar27 = iVar19 - (int)pBVar36;
                    local_f0 = (ulong *)(ulong)uVar27;
                    local_68 = (U32 *)(*puVar51 * -0x30e4432345000000 >>
                                      (-(char)(ms->cParams).hashLog & 0x3fU));
                    pUVar59 = ms->chainTable;
                    uVar9 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
                    uVar55 = uVar27 - uVar9;
                    local_1b8 = (BYTE *)0x0;
                    if (uVar27 < uVar9) {
                      uVar55 = 0;
                    }
                    UVar11 = (ms->window).lowLimit;
                    uVar34 = (ulong)((uVar9 & uVar27) * 2);
                    local_198 = pUVar59 + uVar34;
                    local_190 = pUVar59 + uVar34 + 1;
                    iVar20 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
                    UVar12 = (ms->window).dictLimit;
                    local_a8 = -uVar32;
                    bVar61 = true;
                    local_70 = ms->hashTable;
                    uVar26 = (ulong)local_70[(long)local_68];
                    iVar19 = uVar27 + 9;
                    uVar34 = uVar32 + 3;
                    puVar46 = (ulong *)((long)puVar51 + 4);
                    local_b8 = (ulong *)((long)puVar51 + 0xc);
                    pBVar58 = (BYTE *)local_d0;
                    local_1e8 = local_b8;
                    do {
                      if (uVar32 == 3) {
                        uVar22 = pZVar16->rep[0] - 1;
                      }
                      else {
                        uVar22 = pZVar16->rep[uVar32];
                      }
                      pBVar50 = (BYTE *)0x0;
                      if ((uVar22 - 1 < uVar27 - UVar12) &&
                         ((uint)*puVar51 == *(uint *)((long)puVar51 - (ulong)uVar22))) {
                        puVar41 = (ulong *)((long)puVar46 - (ulong)uVar22);
                        puVar43 = puVar46;
                        if (puVar46 < puVar2) {
                          uVar48 = *puVar46 ^ *puVar41;
                          uVar57 = 0;
                          if (uVar48 != 0) {
                            for (; (uVar48 >> uVar57 & 1) == 0; uVar57 = uVar57 + 1) {
                            }
                          }
                          uVar57 = uVar57 >> 3 & 0x1fffffff;
                          iVar25 = (int)uVar57;
                          puVar43 = local_b8;
                          if (*puVar41 == *puVar46) {
                            do {
                              puVar41 = puVar41 + 1;
                              if (puVar2 <= puVar43) goto LAB_00442558;
                              uVar48 = *puVar41;
                              uVar28 = *puVar43;
                              uVar5 = 0;
                              if ((uVar28 ^ uVar48) != 0) {
                                for (; ((uVar28 ^ uVar48) >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
                                }
                              }
                              puVar45 = (ulong *)((uVar5 >> 3 & 0x1fffffff) + (long)puVar43);
                              puVar43 = puVar43 + 1;
                              if (uVar48 != uVar28) {
                                uVar57 = (long)puVar45 - (long)puVar46;
                                puVar43 = puVar45;
                              }
                              iVar25 = (int)uVar57;
                            } while (uVar48 == uVar28);
                          }
                        }
                        else {
LAB_00442558:
                          if ((puVar43 < local_e0) && ((uint)*puVar41 == (uint)*puVar43)) {
                            puVar43 = (ulong *)((long)puVar43 + 4);
                            puVar41 = (ulong *)((long)puVar41 + 4);
                          }
                          if ((puVar43 < puVar60) && ((short)*puVar41 == (short)*puVar43)) {
                            puVar43 = (ulong *)((long)puVar43 + 2);
                            puVar41 = (ulong *)((long)puVar41 + 2);
                          }
                          if (puVar43 < puVar56) {
                            puVar43 = (ulong *)((long)puVar43 +
                                               (ulong)((BYTE)*puVar41 == (BYTE)*puVar43));
                          }
                          iVar25 = (int)puVar43 - (int)puVar46;
                        }
                        pBVar50 = (BYTE *)(ulong)(iVar25 + 4);
                      }
                      uVar22 = (uint)pBVar50;
                      bVar24 = true;
                      if (pBVar58 < pBVar50) {
                        pZVar4[(long)local_1b8].off = (int)local_a8 + (int)uVar32;
                        uVar35 = (int)local_1b8 + 1;
                        pZVar4[(long)local_1b8].len = uVar22;
                        bVar62 = (ulong *)((long)puVar51 + (long)pBVar50) != puVar56;
                        bVar24 = bVar62 && uVar22 <= uVar17;
                        local_1b8 = (BYTE *)(ulong)uVar35;
                        local_1e8 = (ulong *)((ulong)local_1e8 & 0xffffffff);
                        pBVar58 = pBVar50;
                        if (!bVar62 || uVar22 > uVar17) {
                          local_1e8 = (ulong *)(ulong)uVar35;
                        }
                      }
                      if (!bVar24) break;
                      uVar32 = uVar32 + 1;
                      bVar61 = uVar32 < uVar34;
                    } while (bVar61);
                    if (!bVar61) {
                      local_70[(long)local_68] = uVar27;
                      local_f0 = (ulong *)(ulong)(uVar27 + 2);
                      local_1e8 = (ulong *)0x0;
                      pBVar50 = (BYTE *)0x0;
                      do {
                        bVar61 = iVar20 == 0;
                        iVar20 = iVar20 + -1;
                        if ((bVar61) || (uVar17 = (uint)uVar26, uVar17 < UVar11 + (UVar11 == 0)))
                        break;
                        puVar46 = local_1e8;
                        if (pBVar50 < local_1e8) {
                          puVar46 = (ulong *)pBVar50;
                        }
                        puVar43 = (ulong *)((long)puVar51 + (long)puVar46);
                        puVar41 = (ulong *)(pBVar36 + (long)((long)puVar46 + uVar26));
                        puVar45 = puVar43;
                        if (puVar43 < puVar2) {
                          uVar34 = *puVar43 ^ *puVar41;
                          uVar32 = 0;
                          if (uVar34 != 0) {
                            for (; (uVar34 >> uVar32 & 1) == 0; uVar32 = uVar32 + 1) {
                            }
                          }
                          pBVar54 = (BYTE *)(uVar32 >> 3 & 0x1fffffff);
                          if (*puVar41 == *puVar43) {
                            do {
                              puVar45 = puVar45 + 1;
                              puVar41 = puVar41 + 1;
                              if (puVar2 <= puVar45) goto LAB_0044271e;
                              uVar34 = *puVar45 ^ *puVar41;
                              uVar32 = 0;
                              if (uVar34 != 0) {
                                for (; (uVar34 >> uVar32 & 1) == 0; uVar32 = uVar32 + 1) {
                                }
                              }
                              pBVar54 = (BYTE *)((long)puVar45 +
                                                ((uVar32 >> 3 & 0x1fffffff) - (long)puVar43));
                            } while (*puVar41 == *puVar45);
                          }
                        }
                        else {
LAB_0044271e:
                          if ((puVar45 < local_e0) && ((uint)*puVar41 == (uint)*puVar45)) {
                            puVar45 = (ulong *)((long)puVar45 + 4);
                            puVar41 = (ulong *)((long)puVar41 + 4);
                          }
                          if ((puVar45 < puVar60) && ((short)*puVar41 == (short)*puVar45)) {
                            puVar45 = (ulong *)((long)puVar45 + 2);
                            puVar41 = (ulong *)((long)puVar41 + 2);
                          }
                          if (puVar45 < puVar56) {
                            puVar45 = (ulong *)((long)puVar45 +
                                               (ulong)((BYTE)*puVar41 == (BYTE)*puVar45));
                          }
                          pBVar54 = (BYTE *)((long)puVar45 - (long)puVar43);
                        }
                        pBVar54 = pBVar54 + (long)puVar46;
                        if (pBVar58 < pBVar54) {
                          iVar25 = uVar17 + (U32)pBVar54;
                          if (pBVar54 <= (BYTE *)(ulong)(iVar19 - uVar17)) {
                            iVar25 = iVar19;
                          }
                          pZVar4[(long)local_1b8].off = (int)local_f0 - uVar17;
                          pZVar4[(long)local_1b8].len = (U32)pBVar54;
                          local_1b8 = (BYTE *)(ulong)((int)local_1b8 + 1);
                          pBVar58 = pBVar54;
                          iVar19 = iVar25;
                          if ((pBVar54 < (BYTE *)0x1001) &&
                             ((ulong *)((long)puVar51 + (long)pBVar54) != puVar56))
                          goto LAB_004427e3;
LAB_00442867:
                          bVar61 = false;
                        }
                        else {
LAB_004427e3:
                          puVar23 = pUVar59 + (uVar17 & uVar9) * 2;
                          if (*(byte *)((long)puVar51 + (long)pBVar54) <=
                              pBVar36[(long)(pBVar54 + uVar26)]) {
                            *local_190 = uVar17;
                            local_1e8 = (ulong *)pBVar54;
                            local_190 = puVar23;
                            if (uVar55 < uVar17) goto LAB_0044283c;
                            local_190 = (uint *)&local_100;
                            goto LAB_00442867;
                          }
                          *local_198 = uVar17;
                          pBVar50 = pBVar54;
                          if (uVar55 < uVar17) {
                            puVar23 = puVar23 + 1;
                            local_198 = puVar23;
LAB_0044283c:
                            uVar26 = (ulong)*puVar23;
                            bVar61 = true;
                          }
                          else {
                            bVar61 = false;
                            local_198 = (uint *)&local_100;
                          }
                        }
                      } while (bVar61);
                      goto LAB_00442db5;
                    }
                  }
                  else if (UVar11 == 3) {
                    uVar32 = (ulong)(uint)(UVar10 != 0);
                    uVar17 = (ms->cParams).targetLength;
                    if (0xffe < uVar17) {
                      uVar17 = 0xfff;
                    }
                    pBVar36 = (ms->window).base;
                    uVar27 = iVar19 - (int)pBVar36;
                    local_68 = (U32 *)(ulong)((uint)*puVar51 * -0x61c8864f >>
                                             (-(char)(ms->cParams).hashLog & 0x1fU));
                    pUVar59 = ms->chainTable;
                    uVar9 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
                    uVar55 = uVar27 - uVar9;
                    if (uVar27 < uVar9) {
                      uVar55 = 0;
                    }
                    UVar11 = (ms->window).lowLimit;
                    local_a8._4_4_ = (undefined4)((ulong)local_a8 >> 0x20);
                    local_a8 = CONCAT44(local_a8._4_4_,UVar11 + (UVar11 == 0));
                    uVar34 = (ulong)((uVar9 & uVar27) * 2);
                    local_190 = pUVar59 + uVar34;
                    local_1a8 = pUVar59 + uVar34 + 1;
                    iVar20 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
                    UVar11 = (ms->window).dictLimit;
                    bVar61 = true;
                    local_70 = ms->hashTable;
                    local_b8 = (ulong *)(ulong)local_70[(long)local_68];
                    iVar19 = uVar27 + 9;
                    uVar34 = uVar32 + 3;
                    puVar46 = (ulong *)((long)puVar51 + 3);
                    local_f0 = (ulong *)((long)puVar51 + 0xb);
                    puVar43 = (ulong *)0x0;
                    local_1e8 = local_f0;
                    local_1b8 = (BYTE *)local_d0;
                    do {
                      if (uVar32 == 3) {
                        UVar12 = pZVar16->rep[0] - 1;
                      }
                      else {
                        UVar12 = pZVar16->rep[uVar32];
                      }
                      pBVar58 = (BYTE *)0x0;
                      if ((UVar12 - 1 < uVar27 - UVar11) &&
                         (((*(uint *)((long)puVar51 - (ulong)UVar12) ^ (uint)*puVar51) & 0xffffff)
                          == 0)) {
                        puVar45 = (ulong *)((long)puVar46 - (ulong)UVar12);
                        puVar41 = puVar46;
                        if (puVar46 < puVar2) {
                          uVar57 = *puVar46 ^ *puVar45;
                          uVar26 = 0;
                          if (uVar57 != 0) {
                            for (; (uVar57 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
                            }
                          }
                          uVar26 = uVar26 >> 3 & 0x1fffffff;
                          iVar25 = (int)uVar26;
                          puVar41 = local_f0;
                          if (*puVar45 == *puVar46) {
                            do {
                              puVar45 = puVar45 + 1;
                              if (puVar2 <= puVar41) goto LAB_00441c79;
                              uVar57 = *puVar45;
                              uVar48 = *puVar41;
                              uVar28 = 0;
                              if ((uVar48 ^ uVar57) != 0) {
                                for (; ((uVar48 ^ uVar57) >> uVar28 & 1) == 0; uVar28 = uVar28 + 1)
                                {
                                }
                              }
                              puVar30 = (ulong *)((uVar28 >> 3 & 0x1fffffff) + (long)puVar41);
                              puVar41 = puVar41 + 1;
                              if (uVar57 != uVar48) {
                                uVar26 = (long)puVar30 - (long)puVar46;
                                puVar41 = puVar30;
                              }
                              iVar25 = (int)uVar26;
                            } while (uVar57 == uVar48);
                          }
                        }
                        else {
LAB_00441c79:
                          if ((puVar41 < local_e0) && ((uint)*puVar45 == (uint)*puVar41)) {
                            puVar41 = (ulong *)((long)puVar41 + 4);
                            puVar45 = (ulong *)((long)puVar45 + 4);
                          }
                          if ((puVar41 < puVar60) && ((short)*puVar45 == (short)*puVar41)) {
                            puVar41 = (ulong *)((long)puVar41 + 2);
                            puVar45 = (ulong *)((long)puVar45 + 2);
                          }
                          if (puVar41 < puVar56) {
                            puVar41 = (ulong *)((long)puVar41 +
                                               (ulong)((BYTE)*puVar45 == (BYTE)*puVar41));
                          }
                          iVar25 = (int)puVar41 - (int)puVar46;
                        }
                        pBVar58 = (BYTE *)(ulong)(iVar25 + 3);
                      }
                      uVar22 = (uint)pBVar58;
                      bVar24 = true;
                      puVar41 = puVar43;
                      if (local_1b8 < pBVar58) {
                        pZVar4[(long)puVar43].off = (int)uVar32 - (uint)(UVar10 != 0);
                        puVar41 = (ulong *)(ulong)((int)puVar43 + 1);
                        pZVar4[(long)puVar43].len = uVar22;
                        bVar62 = (ulong *)((long)puVar51 + (long)pBVar58) != puVar56;
                        bVar24 = bVar62 && uVar22 <= uVar17;
                        local_1e8 = (ulong *)((ulong)local_1e8 & 0xffffffff);
                        local_1b8 = pBVar58;
                        if (!bVar62 || uVar22 > uVar17) {
                          local_1e8 = puVar41;
                        }
                      }
                      if (!bVar24) break;
                      uVar32 = uVar32 + 1;
                      bVar61 = uVar32 < uVar34;
                      puVar43 = puVar41;
                    } while (bVar61);
                    if (!bVar61) {
                      if (local_1b8 < (BYTE *)0x3) {
                        UVar11 = ZSTD_insertAndFindFirstIndexHash3(ms,(BYTE *)puVar51);
                        bVar61 = true;
                        if (((uint)local_a8 <= UVar11) && (uVar27 - UVar11 < 0x40000)) {
                          puVar43 = (ulong *)(pBVar36 + UVar11);
                          puVar46 = puVar51;
                          if (puVar51 < puVar2) {
                            uVar34 = *puVar51 ^ *puVar43;
                            uVar32 = 0;
                            if (uVar34 != 0) {
                              for (; (uVar34 >> uVar32 & 1) == 0; uVar32 = uVar32 + 1) {
                              }
                            }
                            pBVar58 = (BYTE *)(uVar32 >> 3 & 0x1fffffff);
                            if (*puVar43 == *puVar51) {
                              do {
                                puVar46 = puVar46 + 1;
                                puVar43 = puVar43 + 1;
                                if (puVar2 <= puVar46) goto LAB_00443106;
                                uVar34 = *puVar46 ^ *puVar43;
                                uVar32 = 0;
                                if (uVar34 != 0) {
                                  for (; (uVar34 >> uVar32 & 1) == 0; uVar32 = uVar32 + 1) {
                                  }
                                }
                                pBVar58 = (BYTE *)((long)puVar46 +
                                                  ((uVar32 >> 3 & 0x1fffffff) - (long)puVar51));
                              } while (*puVar43 == *puVar46);
                            }
                          }
                          else {
LAB_00443106:
                            if ((puVar46 < local_e0) && ((uint)*puVar43 == (uint)*puVar46)) {
                              puVar46 = (ulong *)((long)puVar46 + 4);
                              puVar43 = (ulong *)((long)puVar43 + 4);
                            }
                            if ((puVar46 < puVar60) && ((short)*puVar43 == (short)*puVar46)) {
                              puVar46 = (ulong *)((long)puVar46 + 2);
                              puVar43 = (ulong *)((long)puVar43 + 2);
                            }
                            if (puVar46 < puVar56) {
                              puVar46 = (ulong *)((long)puVar46 +
                                                 (ulong)((BYTE)*puVar43 == (BYTE)*puVar46));
                            }
                            pBVar58 = (BYTE *)((long)puVar46 - (long)puVar51);
                          }
                          if ((BYTE *)0x2 < pBVar58) {
                            pZVar4->off = (uVar27 - UVar11) + 2;
                            pZVar4->len = (U32)pBVar58;
                            local_1b8 = pBVar58;
                            if (((BYTE *)(ulong)uVar17 < pBVar58) ||
                               (puVar41 = (ulong *)0x1,
                               (ulong *)((long)puVar51 + (long)pBVar58) == puVar56)) {
                              ms->nextToUpdate = uVar27 + 1;
                              puVar41 = (ulong *)0x1;
                              bVar61 = false;
                              local_1e8._0_4_ = 1;
                            }
                          }
                        }
                        if (!bVar61) goto LAB_00442dd6;
                      }
                      local_70[(long)local_68] = uVar27;
                      local_178 = (ulong *)0x0;
                      pBVar58 = (BYTE *)0x0;
                      puVar46 = local_b8;
                      local_1e8 = puVar41;
                      do {
                        bVar61 = iVar20 == 0;
                        iVar20 = iVar20 + -1;
                        if (bVar61) break;
                        uVar17 = (uint)puVar46;
                        if (uVar17 < (uint)local_a8) break;
                        puVar43 = local_178;
                        if (pBVar58 < local_178) {
                          puVar43 = (ulong *)pBVar58;
                        }
                        puVar41 = (ulong *)((long)puVar51 + (long)puVar43);
                        puVar45 = (ulong *)(pBVar36 +
                                           (long)((long)puVar43 + ((ulong)puVar46 & 0xffffffff)));
                        puVar30 = puVar41;
                        if (puVar41 < puVar2) {
                          uVar34 = *puVar41 ^ *puVar45;
                          uVar32 = 0;
                          if (uVar34 != 0) {
                            for (; (uVar34 >> uVar32 & 1) == 0; uVar32 = uVar32 + 1) {
                            }
                          }
                          pBVar50 = (BYTE *)(uVar32 >> 3 & 0x1fffffff);
                          if (*puVar45 == *puVar41) {
                            do {
                              puVar30 = puVar30 + 1;
                              puVar45 = puVar45 + 1;
                              if (puVar2 <= puVar30) goto LAB_004432c1;
                              uVar34 = *puVar30 ^ *puVar45;
                              uVar32 = 0;
                              if (uVar34 != 0) {
                                for (; (uVar34 >> uVar32 & 1) == 0; uVar32 = uVar32 + 1) {
                                }
                              }
                              pBVar50 = (BYTE *)((long)puVar30 +
                                                ((uVar32 >> 3 & 0x1fffffff) - (long)puVar41));
                            } while (*puVar45 == *puVar30);
                          }
                        }
                        else {
LAB_004432c1:
                          if ((puVar30 < local_e0) && ((uint)*puVar45 == (uint)*puVar30)) {
                            puVar30 = (ulong *)((long)puVar30 + 4);
                            puVar45 = (ulong *)((long)puVar45 + 4);
                          }
                          if ((puVar30 < puVar60) && ((short)*puVar45 == (short)*puVar30)) {
                            puVar30 = (ulong *)((long)puVar30 + 2);
                            puVar45 = (ulong *)((long)puVar45 + 2);
                          }
                          if (puVar30 < puVar56) {
                            puVar30 = (ulong *)((long)puVar30 +
                                               (ulong)((BYTE)*puVar45 == (BYTE)*puVar30));
                          }
                          pBVar50 = (BYTE *)((long)puVar30 - (long)puVar41);
                        }
                        pBVar50 = pBVar50 + (long)puVar43;
                        if (local_1b8 < pBVar50) {
                          iVar25 = uVar17 + (U32)pBVar50;
                          if (pBVar50 <= (BYTE *)(ulong)(iVar19 - uVar17)) {
                            iVar25 = iVar19;
                          }
                          pZVar4[(long)local_1e8].off = (uVar27 + 2) - uVar17;
                          pZVar4[(long)local_1e8].len = (U32)pBVar50;
                          local_1e8 = (ulong *)(ulong)((uint)local_1e8 + 1);
                          iVar19 = iVar25;
                          local_1b8 = pBVar50;
                          if ((pBVar50 < (BYTE *)0x1001) &&
                             ((ulong *)((long)puVar51 + (long)pBVar50) != puVar56))
                          goto LAB_0044339c;
LAB_00443426:
                          bVar61 = false;
                        }
                        else {
LAB_0044339c:
                          puVar23 = pUVar59 + (uVar17 & uVar9) * 2;
                          if (*(byte *)((long)puVar51 + (long)pBVar50) <=
                              pBVar36[(long)(pBVar50 + ((ulong)puVar46 & 0xffffffff))]) {
                            *local_1a8 = uVar17;
                            local_1a8 = puVar23;
                            local_178 = (ulong *)pBVar50;
                            if (uVar55 < uVar17) goto LAB_004433f4;
                            local_1a8 = (uint *)&local_100;
                            goto LAB_00443426;
                          }
                          *local_190 = uVar17;
                          pBVar58 = pBVar50;
                          if (uVar55 < uVar17) {
                            puVar23 = puVar23 + 1;
                            local_190 = puVar23;
LAB_004433f4:
                            puVar46 = (ulong *)(ulong)*puVar23;
                            bVar61 = true;
                          }
                          else {
                            bVar61 = false;
                            local_190 = (uint *)&local_100;
                          }
                        }
                      } while (bVar61);
                      *local_1a8 = 0;
                      *local_190 = 0;
                      ms->nextToUpdate = iVar19 - 8;
                    }
                  }
                  else {
                    uVar32 = (ulong)(UVar10 != 0);
                    uVar17 = (ms->cParams).targetLength;
                    if (0xffe < uVar17) {
                      uVar17 = 0xfff;
                    }
                    pBVar36 = (ms->window).base;
                    uVar27 = iVar19 - (int)pBVar36;
                    local_f0 = (ulong *)(ulong)uVar27;
                    local_68 = (U32 *)(ulong)((uint)*puVar51 * -0x61c8864f >>
                                             (-(char)(ms->cParams).hashLog & 0x1fU));
                    pUVar59 = ms->chainTable;
                    uVar9 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
                    uVar55 = uVar27 - uVar9;
                    local_1b8 = (BYTE *)0x0;
                    if (uVar27 < uVar9) {
                      uVar55 = 0;
                    }
                    UVar11 = (ms->window).lowLimit;
                    uVar34 = (ulong)((uVar9 & uVar27) * 2);
                    local_198 = pUVar59 + uVar34;
                    local_190 = pUVar59 + uVar34 + 1;
                    iVar20 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
                    UVar12 = (ms->window).dictLimit;
                    local_a8 = -uVar32;
                    bVar61 = true;
                    local_70 = ms->hashTable;
                    uVar26 = (ulong)local_70[(long)local_68];
                    iVar19 = uVar27 + 9;
                    uVar34 = uVar32 + 3;
                    puVar46 = (ulong *)((long)puVar51 + 4);
                    local_b8 = (ulong *)((long)puVar51 + 0xc);
                    pBVar58 = (BYTE *)local_d0;
                    local_1e8 = local_b8;
                    do {
                      if (uVar32 == 3) {
                        uVar22 = pZVar16->rep[0] - 1;
                      }
                      else {
                        uVar22 = pZVar16->rep[uVar32];
                      }
                      pBVar50 = (BYTE *)0x0;
                      if ((uVar22 - 1 < uVar27 - UVar12) &&
                         ((uint)*puVar51 == *(uint *)((long)puVar51 - (ulong)uVar22))) {
                        puVar41 = (ulong *)((long)puVar46 - (ulong)uVar22);
                        puVar43 = puVar46;
                        if (puVar46 < puVar2) {
                          uVar48 = *puVar46 ^ *puVar41;
                          uVar57 = 0;
                          if (uVar48 != 0) {
                            for (; (uVar48 >> uVar57 & 1) == 0; uVar57 = uVar57 + 1) {
                            }
                          }
                          uVar57 = uVar57 >> 3 & 0x1fffffff;
                          iVar25 = (int)uVar57;
                          puVar43 = local_b8;
                          if (*puVar41 == *puVar46) {
                            do {
                              puVar41 = puVar41 + 1;
                              if (puVar2 <= puVar43) goto LAB_00442a86;
                              uVar48 = *puVar41;
                              uVar28 = *puVar43;
                              uVar5 = 0;
                              if ((uVar28 ^ uVar48) != 0) {
                                for (; ((uVar28 ^ uVar48) >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
                                }
                              }
                              puVar45 = (ulong *)((uVar5 >> 3 & 0x1fffffff) + (long)puVar43);
                              puVar43 = puVar43 + 1;
                              if (uVar48 != uVar28) {
                                uVar57 = (long)puVar45 - (long)puVar46;
                                puVar43 = puVar45;
                              }
                              iVar25 = (int)uVar57;
                            } while (uVar48 == uVar28);
                          }
                        }
                        else {
LAB_00442a86:
                          if ((puVar43 < local_e0) && ((uint)*puVar41 == (uint)*puVar43)) {
                            puVar43 = (ulong *)((long)puVar43 + 4);
                            puVar41 = (ulong *)((long)puVar41 + 4);
                          }
                          if ((puVar43 < puVar60) && ((short)*puVar41 == (short)*puVar43)) {
                            puVar43 = (ulong *)((long)puVar43 + 2);
                            puVar41 = (ulong *)((long)puVar41 + 2);
                          }
                          if (puVar43 < puVar56) {
                            puVar43 = (ulong *)((long)puVar43 +
                                               (ulong)((BYTE)*puVar41 == (BYTE)*puVar43));
                          }
                          iVar25 = (int)puVar43 - (int)puVar46;
                        }
                        pBVar50 = (BYTE *)(ulong)(iVar25 + 4);
                      }
                      uVar22 = (uint)pBVar50;
                      bVar24 = true;
                      if (pBVar58 < pBVar50) {
                        pZVar4[(long)local_1b8].off = (int)local_a8 + (int)uVar32;
                        uVar35 = (int)local_1b8 + 1;
                        pZVar4[(long)local_1b8].len = uVar22;
                        bVar62 = (ulong *)((long)puVar51 + (long)pBVar50) != puVar56;
                        bVar24 = bVar62 && uVar22 <= uVar17;
                        local_1b8 = (BYTE *)(ulong)uVar35;
                        local_1e8 = (ulong *)((ulong)local_1e8 & 0xffffffff);
                        pBVar58 = pBVar50;
                        if (!bVar62 || uVar22 > uVar17) {
                          local_1e8 = (ulong *)(ulong)uVar35;
                        }
                      }
                      if (!bVar24) break;
                      uVar32 = uVar32 + 1;
                      bVar61 = uVar32 < uVar34;
                    } while (bVar61);
                    if (!bVar61) {
                      local_70[(long)local_68] = uVar27;
                      local_f0 = (ulong *)(ulong)(uVar27 + 2);
                      local_1e8 = (ulong *)0x0;
                      pBVar50 = (BYTE *)0x0;
                      do {
                        bVar61 = iVar20 == 0;
                        iVar20 = iVar20 + -1;
                        if ((bVar61) || (uVar17 = (uint)uVar26, uVar17 < UVar11 + (UVar11 == 0)))
                        break;
                        puVar46 = local_1e8;
                        if (pBVar50 < local_1e8) {
                          puVar46 = (ulong *)pBVar50;
                        }
                        puVar43 = (ulong *)((long)puVar51 + (long)puVar46);
                        puVar41 = (ulong *)(pBVar36 + (long)((long)puVar46 + uVar26));
                        puVar45 = puVar43;
                        if (puVar43 < puVar2) {
                          uVar34 = *puVar43 ^ *puVar41;
                          uVar32 = 0;
                          if (uVar34 != 0) {
                            for (; (uVar34 >> uVar32 & 1) == 0; uVar32 = uVar32 + 1) {
                            }
                          }
                          pBVar54 = (BYTE *)(uVar32 >> 3 & 0x1fffffff);
                          if (*puVar41 == *puVar43) {
                            do {
                              puVar45 = puVar45 + 1;
                              puVar41 = puVar41 + 1;
                              if (puVar2 <= puVar45) goto LAB_00442c4e;
                              uVar34 = *puVar45 ^ *puVar41;
                              uVar32 = 0;
                              if (uVar34 != 0) {
                                for (; (uVar34 >> uVar32 & 1) == 0; uVar32 = uVar32 + 1) {
                                }
                              }
                              pBVar54 = (BYTE *)((long)puVar45 +
                                                ((uVar32 >> 3 & 0x1fffffff) - (long)puVar43));
                            } while (*puVar41 == *puVar45);
                          }
                        }
                        else {
LAB_00442c4e:
                          if ((puVar45 < local_e0) && ((uint)*puVar41 == (uint)*puVar45)) {
                            puVar45 = (ulong *)((long)puVar45 + 4);
                            puVar41 = (ulong *)((long)puVar41 + 4);
                          }
                          if ((puVar45 < puVar60) && ((short)*puVar41 == (short)*puVar45)) {
                            puVar45 = (ulong *)((long)puVar45 + 2);
                            puVar41 = (ulong *)((long)puVar41 + 2);
                          }
                          if (puVar45 < puVar56) {
                            puVar45 = (ulong *)((long)puVar45 +
                                               (ulong)((BYTE)*puVar41 == (BYTE)*puVar45));
                          }
                          pBVar54 = (BYTE *)((long)puVar45 - (long)puVar43);
                        }
                        pBVar54 = pBVar54 + (long)puVar46;
                        if (pBVar58 < pBVar54) {
                          iVar25 = uVar17 + (U32)pBVar54;
                          if (pBVar54 <= (BYTE *)(ulong)(iVar19 - uVar17)) {
                            iVar25 = iVar19;
                          }
                          pZVar4[(long)local_1b8].off = (int)local_f0 - uVar17;
                          pZVar4[(long)local_1b8].len = (U32)pBVar54;
                          local_1b8 = (BYTE *)(ulong)((int)local_1b8 + 1);
                          pBVar58 = pBVar54;
                          iVar19 = iVar25;
                          if ((pBVar54 < (BYTE *)0x1001) &&
                             ((ulong *)((long)puVar51 + (long)pBVar54) != puVar56))
                          goto LAB_00442d12;
LAB_00442d95:
                          bVar61 = false;
                          pBVar54 = pBVar50;
                        }
                        else {
LAB_00442d12:
                          puVar23 = pUVar59 + (uVar17 & uVar9) * 2;
                          if (*(byte *)((long)puVar51 + (long)pBVar54) <=
                              pBVar36[(long)(pBVar54 + uVar26)]) {
                            *local_190 = uVar17;
                            local_1e8 = (ulong *)pBVar54;
                            local_190 = puVar23;
                            if (uVar55 < uVar17) goto LAB_00442d6a;
                            local_190 = (uint *)&local_100;
                            goto LAB_00442d95;
                          }
                          *local_198 = uVar17;
                          if (uVar55 < uVar17) {
                            puVar23 = puVar23 + 1;
                            pBVar50 = pBVar54;
                            local_198 = puVar23;
LAB_00442d6a:
                            uVar26 = (ulong)*puVar23;
                            bVar61 = true;
                            pBVar54 = pBVar50;
                          }
                          else {
                            bVar61 = false;
                            local_198 = (uint *)&local_100;
                          }
                        }
                        pBVar50 = pBVar54;
                      } while (bVar61);
                      goto LAB_00442db5;
                    }
                  }
                }
LAB_00442dd6:
                if ((uint)local_1e8 == 0) {
                  uVar17 = 0x13;
                }
                else {
                  uVar55 = pZVar4[(uint)local_1e8 - 1].len;
                  pZVar42 = (ZSTD_optimal_t *)(ulong)uVar55;
                  bVar61 = 0xfff < uVar55 + iVar31;
                  uVar17 = 0;
                  if (bVar61 || (uint)local_118 < uVar55) {
                    UVar11 = 0;
                    if (pZVar16->mlen == 0) {
                      UVar11 = pZVar16->litlen;
                    }
                    local_d4 = pZVar4[(uint)local_1e8 - 1].off;
                    uVar17 = iVar31 - UVar11;
                    uVar14 = (ulong)(uVar55 + (int)local_90 + uVar17);
                    if (0x1000 < uVar17) {
                      uVar17 = 0;
                    }
                    puVar15 = (ulong *)(ulong)uVar17;
                    uVar17 = 7;
                    local_88 = (ZSTD_optimal_t *)((ulong)local_90 & 0xffffffff);
                  }
                  else {
                    pZVar42 = (ZSTD_optimal_t *)((ulong)local_150 & 0xffffffff);
                  }
                  local_150 = pZVar42;
                  if (!bVar61 && (uint)local_118 >= uVar55) {
                    local_108 = (ZSTD_optimal_t *)
                                CONCAT44(local_108._4_4_,(U32)local_108 + (int)local_c8);
                    uVar32 = 0;
                    do {
                      UVar11 = pZVar4[uVar32].off;
                      rVar63 = ZSTD_updateRep(pZVar44[(long)puVar15].rep,UVar11,(uint)(UVar10 != 0))
                      ;
                      uVar17 = (uint)local_c0;
                      if (uVar32 != 0) {
                        uVar17 = pZVar4[uVar32 - 1].len + 1;
                      }
                      uVar55 = pZVar4[uVar32].len;
                      if (uVar17 <= uVar55) {
                        uVar9 = 0x1f;
                        if (UVar11 + 1 != 0) {
                          for (; UVar11 + 1 >> uVar9 == 0; uVar9 = uVar9 - 1) {
                          }
                        }
                        do {
                          if ((ms->opt).priceType == zop_predef) {
                            uVar27 = uVar55 - 2;
                            iVar31 = 0x1f;
                            if (uVar27 != 0) {
                              for (; uVar27 >> iVar31 == 0; iVar31 = iVar31 + -1) {
                              }
                            }
                            iVar31 = (iVar31 + uVar9) * 0x100 +
                                     (uVar27 * 0x100 >> ((byte)iVar31 & 0x1f)) + 0x1000;
                          }
                          else {
                            uVar22 = uVar55 - 3;
                            uVar27 = (ms->opt).offCodeFreq[uVar9] + 1;
                            iVar31 = 0x1f;
                            if (uVar27 != 0) {
                              for (; uVar27 >> iVar31 == 0; iVar31 = iVar31 + -1) {
                              }
                            }
                            if (uVar22 < 0x80) {
                              uVar22 = (uint)(byte)(&ZSTD_MLcode_ML_Code)[uVar22];
                            }
                            else {
                              uVar35 = 0x1f;
                              if (uVar22 != 0) {
                                for (; uVar22 >> uVar35 == 0; uVar35 = uVar35 - 1) {
                                }
                              }
                              uVar22 = (uVar35 ^ 0xffffffe0) + 0x44;
                            }
                            uVar35 = (ms->opt).matchLengthFreq[uVar22] + 1;
                            iVar19 = 0x1f;
                            if (uVar35 != 0) {
                              for (; uVar35 >> iVar19 == 0; iVar19 = iVar19 + -1) {
                              }
                            }
                            iVar31 = (((ms->opt).offCodeSumBasePrice +
                                      (ms->opt).matchLengthSumBasePrice) -
                                     ((uVar27 * 0x100 >> ((byte)iVar31 & 0x1f)) +
                                     (uVar35 * 0x100 >> ((byte)iVar19 & 0x1f)))) +
                                     ((ML_bits[uVar22] + uVar9) - (iVar31 + iVar19)) * 0x100 + 0x33;
                          }
                          uVar27 = uVar55 + (int)puVar15;
                          uVar34 = (ulong)uVar27;
                          if (((uint)uVar14 < uVar27) ||
                             ((int)(iVar31 + (U32)local_108) < pZVar44[uVar34].price)) {
                            if ((uint)uVar14 < uVar27) {
                              uVar14 = uVar14 & 0xffffffff;
                              pZVar16 = local_110 + uVar14;
                              do {
                                uVar14 = uVar14 + 1;
                                pZVar16->price = 0x40000000;
                                pZVar16 = pZVar16 + 1;
                              } while (uVar14 < uVar34);
                            }
                            pZVar44[uVar34].mlen = uVar55;
                            pZVar44[uVar34].off = UVar11;
                            pZVar44[uVar34].litlen = (U32)local_90;
                            pZVar44[uVar34].price = iVar31 + (U32)local_108;
                            *(long *)pZVar44[uVar34].rep = rVar63.rep._0_8_;
                            pZVar44[uVar34].rep[2] = rVar63.rep[2];
                          }
                          uVar55 = uVar55 - 1;
                        } while (uVar17 <= uVar55);
                      }
                      uVar32 = uVar32 + 1;
                    } while (uVar32 != (uint)local_1e8 + ((uint)local_1e8 == 0));
                    uVar17 = 0;
                  }
                }
              }
            }
            if (uVar17 < 0x11) {
              if (uVar17 != 0) {
                if (uVar17 == 7) goto LAB_004434e0;
                goto LAB_0044374d;
              }
            }
            else if (uVar17 != 0x13) {
              if (uVar17 != 0x11) goto LAB_0044374d;
              break;
            }
            uVar17 = (int)puVar15 + 1;
            puVar15 = (ulong *)(ulong)uVar17;
          } while (uVar17 <= (uint)uVar14);
        }
        uVar32 = uVar14 & 0xffffffff;
        local_74 = pZVar44[uVar32].price;
        local_d4 = pZVar44[uVar32].off;
        local_150 = (ZSTD_optimal_t *)(ulong)pZVar44[uVar32].mlen;
        local_88 = (ZSTD_optimal_t *)(ulong)pZVar44[uVar32].litlen;
        local_48 = pZVar44[uVar32].rep[2];
        local_50 = *(undefined8 *)pZVar44[uVar32].rep;
        uVar55 = pZVar44[uVar32].litlen + pZVar44[uVar32].mlen;
        uVar17 = (uint)uVar14 - uVar55;
        if ((uint)uVar14 < uVar55) {
          uVar17 = 0;
        }
        puVar15 = (ulong *)(ulong)uVar17;
        goto LAB_004434e0;
      }
LAB_0044374d:
    } while (puVar37 < local_e8);
  }
  return (long)puVar56 - (long)local_80;
}

Assistant:

size_t ZSTD_compressBlock_btultra2(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        const void* src, size_t srcSize)
{
    U32 const current = (U32)((const BYTE*)src - ms->window.base);
    DEBUGLOG(5, "ZSTD_compressBlock_btultra2 (srcSize=%zu)", srcSize);

    /* 2-pass strategy:
     * this strategy makes a first pass over first block to collect statistics
     * and seed next round's statistics with it.
     * After 1st pass, function forgets everything, and starts a new block.
     * Consequently, this can only work if no data has been previously loaded in tables,
     * aka, no dictionary, no prefix, no ldm preprocessing.
     * The compression ratio gain is generally small (~0.5% on first block),
     * the cost is 2x cpu time on first block. */
    assert(srcSize <= ZSTD_BLOCKSIZE_MAX);
    if ( (ms->opt.litLengthSum==0)   /* first block */
      && (seqStore->sequences == seqStore->sequencesStart)  /* no ldm */
      && (ms->window.dictLimit == ms->window.lowLimit)   /* no dictionary */
      && (current == ms->window.dictLimit)   /* start of frame, nothing already loaded nor skipped */
      && (srcSize > ZSTD_PREDEF_THRESHOLD)
      ) {
        ZSTD_initStats_ultra(ms, seqStore, rep, src, srcSize);
    }

    return ZSTD_compressBlock_opt_generic(ms, seqStore, rep, src, srcSize, 2 /*optLevel*/, ZSTD_noDict);
}